

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_h<embree::avx::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [28];
  undefined1 (*pauVar11) [28];
  undefined4 uVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  Primitive PVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [28];
  undefined1 auVar118 [12];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  undefined1 auVar123 [28];
  uint uVar124;
  int iVar125;
  ulong uVar126;
  RTCIntersectArguments *pRVar127;
  uint uVar128;
  long lVar129;
  ulong uVar130;
  long lVar131;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar132 [8];
  bool bVar133;
  float fVar134;
  float fVar155;
  vint4 bi_1;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar151;
  float fVar152;
  float fVar156;
  float fVar157;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar153;
  float fVar154;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar158;
  float fVar173;
  vint4 bi;
  undefined1 auVar159 [16];
  float fVar175;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar179;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar172;
  float fVar174;
  float fVar176;
  float fVar178;
  float fVar180;
  float fVar182;
  float fVar184;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar164 [24];
  float fVar177;
  float fVar181;
  undefined1 auVar171 [64];
  float fVar183;
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  vint4 bi_2;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar194;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar195;
  float fVar207;
  float fVar208;
  vint4 ai_1;
  undefined1 auVar196 [16];
  float fVar209;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar211;
  float fVar213;
  float fVar215;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar210;
  float fVar212;
  float fVar214;
  float fVar216;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  float fVar217;
  float fVar228;
  float fVar230;
  vint4 ai_2;
  undefined1 auVar219 [16];
  float fVar232;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar218;
  undefined1 auVar223 [16];
  undefined1 auVar222 [16];
  float fVar229;
  float fVar231;
  float fVar233;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar234;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar235;
  float fVar240;
  float fVar241;
  undefined1 auVar236 [16];
  float fVar242;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar243;
  float fVar251;
  float fVar252;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar253;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar254;
  float fVar255;
  undefined1 auVar250 [32];
  vint4 ai;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  float fVar267;
  undefined1 auVar262 [32];
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar263 [64];
  float fVar268;
  float fVar269;
  float fVar275;
  float fVar276;
  float fVar278;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar273 [32];
  float fVar277;
  undefined1 auVar274 [32];
  undefined1 auVar284 [16];
  float fVar292;
  float fVar293;
  float fVar294;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  float fVar291;
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  float fVar295;
  float fVar300;
  float fVar302;
  undefined1 auVar296 [16];
  float fVar303;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  float fVar301;
  undefined1 auVar299 [32];
  float fVar304;
  float fVar306;
  float fVar307;
  undefined1 auVar305 [16];
  float fVar308;
  undefined1 auVar309 [16];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  float fVar315;
  float fVar316;
  float fVar323;
  float fVar325;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  float fVar324;
  float fVar326;
  float fVar328;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar327;
  undefined1 auVar322 [64];
  float fVar329;
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  float fVar335;
  float fVar340;
  float fVar341;
  undefined1 auVar336 [16];
  float fVar342;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar343 [16];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  int local_7cc;
  Primitive *local_7c8;
  uint local_7c0;
  undefined4 uStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [48];
  ulong local_770;
  Precalculations *local_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [8];
  undefined1 auStack_698 [24];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_650 [8];
  undefined8 uStack_648;
  undefined8 local_640;
  undefined4 local_638;
  float local_634;
  uint local_630;
  undefined4 local_62c;
  undefined4 local_628;
  uint local_624;
  uint local_620;
  ulong local_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_590 [8];
  undefined8 uStack_588;
  undefined1 local_580 [8];
  undefined8 uStack_578;
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 auStack_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  uint local_240;
  uint local_23c;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 local_1e0 [32];
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  
  local_768 = pre;
  PVar14 = prim[1];
  uVar130 = (ulong)(byte)PVar14;
  lVar20 = uVar130 * 0x25;
  fVar137 = *(float *)(prim + lVar20 + 0x12);
  auVar343 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar20 + 6));
  auVar159._0_4_ = fVar137 * auVar343._0_4_;
  auVar159._4_4_ = fVar137 * auVar343._4_4_;
  auVar159._8_4_ = fVar137 * auVar343._8_4_;
  auVar159._12_4_ = fVar137 * auVar343._12_4_;
  auVar256._0_4_ = fVar137 * (ray->dir).field_0.m128[0];
  auVar256._4_4_ = fVar137 * (ray->dir).field_0.m128[1];
  auVar256._8_4_ = fVar137 * (ray->dir).field_0.m128[2];
  auVar256._12_4_ = fVar137 * (ray->dir).field_0.m128[3];
  auVar343 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 4 + 6)));
  auVar343 = vcvtdq2ps_avx(auVar343);
  auVar190 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 5 + 6)));
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 6 + 6)));
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar198 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0xf + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + 6)));
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar130 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0x1a + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0x1b + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar130 * 0x1c + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vshufps_avx(auVar256,auVar256,0);
  auVar30 = vshufps_avx(auVar256,auVar256,0x55);
  auVar31 = vshufps_avx(auVar256,auVar256,0xaa);
  fVar137 = auVar31._0_4_;
  fVar154 = auVar31._4_4_;
  fVar173 = auVar31._8_4_;
  fVar175 = auVar31._12_4_;
  fVar217 = auVar30._0_4_;
  fVar228 = auVar30._4_4_;
  fVar230 = auVar30._8_4_;
  fVar232 = auVar30._12_4_;
  fVar195 = auVar29._0_4_;
  fVar207 = auVar29._4_4_;
  fVar208 = auVar29._8_4_;
  fVar209 = auVar29._12_4_;
  auVar309._0_4_ = fVar195 * auVar343._0_4_ + fVar217 * auVar190._0_4_ + fVar137 * auVar223._0_4_;
  auVar309._4_4_ = fVar207 * auVar343._4_4_ + fVar228 * auVar190._4_4_ + fVar154 * auVar223._4_4_;
  auVar309._8_4_ = fVar208 * auVar343._8_4_ + fVar230 * auVar190._8_4_ + fVar173 * auVar223._8_4_;
  auVar309._12_4_ =
       fVar209 * auVar343._12_4_ + fVar232 * auVar190._12_4_ + fVar175 * auVar223._12_4_;
  auVar317._0_4_ = fVar195 * auVar198._0_4_ + fVar217 * auVar24._0_4_ + auVar25._0_4_ * fVar137;
  auVar317._4_4_ = fVar207 * auVar198._4_4_ + fVar228 * auVar24._4_4_ + auVar25._4_4_ * fVar154;
  auVar317._8_4_ = fVar208 * auVar198._8_4_ + fVar230 * auVar24._8_4_ + auVar25._8_4_ * fVar173;
  auVar317._12_4_ = fVar209 * auVar198._12_4_ + fVar232 * auVar24._12_4_ + auVar25._12_4_ * fVar175;
  auVar257._0_4_ = fVar195 * auVar26._0_4_ + fVar217 * auVar27._0_4_ + auVar28._0_4_ * fVar137;
  auVar257._4_4_ = fVar207 * auVar26._4_4_ + fVar228 * auVar27._4_4_ + auVar28._4_4_ * fVar154;
  auVar257._8_4_ = fVar208 * auVar26._8_4_ + fVar230 * auVar27._8_4_ + auVar28._8_4_ * fVar173;
  auVar257._12_4_ = fVar209 * auVar26._12_4_ + fVar232 * auVar27._12_4_ + auVar28._12_4_ * fVar175;
  auVar29 = vshufps_avx(auVar159,auVar159,0);
  auVar30 = vshufps_avx(auVar159,auVar159,0x55);
  auVar31 = vshufps_avx(auVar159,auVar159,0xaa);
  fVar137 = auVar31._0_4_;
  fVar154 = auVar31._4_4_;
  fVar173 = auVar31._8_4_;
  fVar175 = auVar31._12_4_;
  fVar217 = auVar30._0_4_;
  fVar228 = auVar30._4_4_;
  fVar230 = auVar30._8_4_;
  fVar232 = auVar30._12_4_;
  fVar195 = auVar29._0_4_;
  fVar207 = auVar29._4_4_;
  fVar208 = auVar29._8_4_;
  fVar209 = auVar29._12_4_;
  auVar160._0_4_ = fVar195 * auVar343._0_4_ + fVar217 * auVar190._0_4_ + fVar137 * auVar223._0_4_;
  auVar160._4_4_ = fVar207 * auVar343._4_4_ + fVar228 * auVar190._4_4_ + fVar154 * auVar223._4_4_;
  auVar160._8_4_ = fVar208 * auVar343._8_4_ + fVar230 * auVar190._8_4_ + fVar173 * auVar223._8_4_;
  auVar160._12_4_ =
       fVar209 * auVar343._12_4_ + fVar232 * auVar190._12_4_ + fVar175 * auVar223._12_4_;
  auVar138._0_4_ = fVar195 * auVar198._0_4_ + auVar25._0_4_ * fVar137 + fVar217 * auVar24._0_4_;
  auVar138._4_4_ = fVar207 * auVar198._4_4_ + auVar25._4_4_ * fVar154 + fVar228 * auVar24._4_4_;
  auVar138._8_4_ = fVar208 * auVar198._8_4_ + auVar25._8_4_ * fVar173 + fVar230 * auVar24._8_4_;
  auVar138._12_4_ = fVar209 * auVar198._12_4_ + auVar25._12_4_ * fVar175 + fVar232 * auVar24._12_4_;
  auVar270._8_4_ = 0x7fffffff;
  auVar270._0_8_ = 0x7fffffff7fffffff;
  auVar270._12_4_ = 0x7fffffff;
  auVar343 = vandps_avx(auVar309,auVar270);
  auVar219._8_4_ = 0x219392ef;
  auVar219._0_8_ = 0x219392ef219392ef;
  auVar219._12_4_ = 0x219392ef;
  auVar343 = vcmpps_avx(auVar343,auVar219,1);
  auVar190 = vblendvps_avx(auVar309,auVar219,auVar343);
  auVar343 = vandps_avx(auVar317,auVar270);
  auVar343 = vcmpps_avx(auVar343,auVar219,1);
  auVar223 = vblendvps_avx(auVar317,auVar219,auVar343);
  auVar343 = vandps_avx(auVar270,auVar257);
  auVar343 = vcmpps_avx(auVar343,auVar219,1);
  auVar343 = vblendvps_avx(auVar257,auVar219,auVar343);
  auVar185._0_4_ = fVar195 * auVar26._0_4_ + fVar217 * auVar27._0_4_ + auVar28._0_4_ * fVar137;
  auVar185._4_4_ = fVar207 * auVar26._4_4_ + fVar228 * auVar27._4_4_ + auVar28._4_4_ * fVar154;
  auVar185._8_4_ = fVar208 * auVar26._8_4_ + fVar230 * auVar27._8_4_ + auVar28._8_4_ * fVar173;
  auVar185._12_4_ = fVar209 * auVar26._12_4_ + fVar232 * auVar27._12_4_ + auVar28._12_4_ * fVar175;
  auVar198 = vrcpps_avx(auVar190);
  fVar195 = auVar198._0_4_;
  auVar196._0_4_ = fVar195 * auVar190._0_4_;
  fVar207 = auVar198._4_4_;
  auVar196._4_4_ = fVar207 * auVar190._4_4_;
  fVar208 = auVar198._8_4_;
  auVar196._8_4_ = fVar208 * auVar190._8_4_;
  fVar209 = auVar198._12_4_;
  auVar196._12_4_ = fVar209 * auVar190._12_4_;
  auVar244._8_4_ = 0x3f800000;
  auVar244._0_8_ = 0x3f8000003f800000;
  auVar244._12_4_ = 0x3f800000;
  auVar190 = vsubps_avx(auVar244,auVar196);
  fVar195 = fVar195 + fVar195 * auVar190._0_4_;
  fVar207 = fVar207 + fVar207 * auVar190._4_4_;
  fVar208 = fVar208 + fVar208 * auVar190._8_4_;
  fVar209 = fVar209 + fVar209 * auVar190._12_4_;
  auVar190 = vrcpps_avx(auVar223);
  fVar217 = auVar190._0_4_;
  auVar236._0_4_ = fVar217 * auVar223._0_4_;
  fVar228 = auVar190._4_4_;
  auVar236._4_4_ = fVar228 * auVar223._4_4_;
  fVar230 = auVar190._8_4_;
  auVar236._8_4_ = fVar230 * auVar223._8_4_;
  fVar232 = auVar190._12_4_;
  auVar236._12_4_ = fVar232 * auVar223._12_4_;
  auVar190 = vsubps_avx(auVar244,auVar236);
  fVar217 = fVar217 + fVar217 * auVar190._0_4_;
  fVar228 = fVar228 + fVar228 * auVar190._4_4_;
  fVar230 = fVar230 + fVar230 * auVar190._8_4_;
  fVar232 = fVar232 + fVar232 * auVar190._12_4_;
  auVar190 = vrcpps_avx(auVar343);
  fVar235 = auVar190._0_4_;
  auVar258._0_4_ = fVar235 * auVar343._0_4_;
  fVar240 = auVar190._4_4_;
  auVar258._4_4_ = fVar240 * auVar343._4_4_;
  fVar241 = auVar190._8_4_;
  auVar258._8_4_ = fVar241 * auVar343._8_4_;
  fVar242 = auVar190._12_4_;
  auVar258._12_4_ = fVar242 * auVar343._12_4_;
  auVar343 = vsubps_avx(auVar244,auVar258);
  fVar235 = fVar235 + fVar235 * auVar343._0_4_;
  fVar240 = fVar240 + fVar240 * auVar343._4_4_;
  fVar241 = fVar241 + fVar241 * auVar343._8_4_;
  fVar242 = fVar242 + fVar242 * auVar343._12_4_;
  auVar343 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar20 + 0x16)) *
                           *(float *)(prim + lVar20 + 0x1a)));
  auVar223 = vshufps_avx(auVar343,auVar343,0);
  auVar343._8_8_ = 0;
  auVar343._0_8_ = *(ulong *)(prim + uVar130 * 7 + 6);
  auVar343 = vpmovsxwd_avx(auVar343);
  auVar343 = vcvtdq2ps_avx(auVar343);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + uVar130 * 0xb + 6);
  auVar190 = vpmovsxwd_avx(auVar190);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar198 = vsubps_avx(auVar190,auVar343);
  fVar137 = auVar223._0_4_;
  fVar154 = auVar223._4_4_;
  fVar173 = auVar223._8_4_;
  fVar175 = auVar223._12_4_;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar130 * 9 + 6);
  auVar190 = vpmovsxwd_avx(auVar223);
  auVar259._0_4_ = auVar198._0_4_ * fVar137 + auVar343._0_4_;
  auVar259._4_4_ = auVar198._4_4_ * fVar154 + auVar343._4_4_;
  auVar259._8_4_ = auVar198._8_4_ * fVar173 + auVar343._8_4_;
  auVar259._12_4_ = auVar198._12_4_ * fVar175 + auVar343._12_4_;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + uVar130 * 0xd + 6);
  auVar223 = vpmovsxwd_avx(auVar198);
  auVar343 = vcvtdq2ps_avx(auVar190);
  auVar190 = vcvtdq2ps_avx(auVar223);
  auVar190 = vsubps_avx(auVar190,auVar343);
  auVar271._0_4_ = auVar190._0_4_ * fVar137 + auVar343._0_4_;
  auVar271._4_4_ = auVar190._4_4_ * fVar154 + auVar343._4_4_;
  auVar271._8_4_ = auVar190._8_4_ * fVar173 + auVar343._8_4_;
  auVar271._12_4_ = auVar190._12_4_ * fVar175 + auVar343._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar130 * 0x12 + 6);
  auVar343 = vpmovsxwd_avx(auVar24);
  uVar126 = (ulong)(uint)((int)(uVar130 * 5) << 2);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar130 * 2 + uVar126 + 6);
  auVar190 = vpmovsxwd_avx(auVar25);
  auVar343 = vcvtdq2ps_avx(auVar343);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar190 = vsubps_avx(auVar190,auVar343);
  auVar284._0_4_ = auVar190._0_4_ * fVar137 + auVar343._0_4_;
  auVar284._4_4_ = auVar190._4_4_ * fVar154 + auVar343._4_4_;
  auVar284._8_4_ = auVar190._8_4_ * fVar173 + auVar343._8_4_;
  auVar284._12_4_ = auVar190._12_4_ * fVar175 + auVar343._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar126 + 6);
  auVar343 = vpmovsxwd_avx(auVar26);
  auVar343 = vcvtdq2ps_avx(auVar343);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar130 * 0x18 + 6);
  auVar190 = vpmovsxwd_avx(auVar27);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar223 = vsubps_avx(auVar190,auVar343);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar130 * 0x1d + 6);
  auVar190 = vpmovsxwd_avx(auVar28);
  auVar296._0_4_ = auVar223._0_4_ * fVar137 + auVar343._0_4_;
  auVar296._4_4_ = auVar223._4_4_ * fVar154 + auVar343._4_4_;
  auVar296._8_4_ = auVar223._8_4_ * fVar173 + auVar343._8_4_;
  auVar296._12_4_ = auVar223._12_4_ * fVar175 + auVar343._12_4_;
  auVar343 = vcvtdq2ps_avx(auVar190);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar130 + (ulong)(byte)PVar14 * 0x20 + 6);
  auVar190 = vpmovsxwd_avx(auVar29);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar190 = vsubps_avx(auVar190,auVar343);
  auVar305._0_4_ = auVar190._0_4_ * fVar137 + auVar343._0_4_;
  auVar305._4_4_ = auVar190._4_4_ * fVar154 + auVar343._4_4_;
  auVar305._8_4_ = auVar190._8_4_ * fVar173 + auVar343._8_4_;
  auVar305._12_4_ = auVar190._12_4_ * fVar175 + auVar343._12_4_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar14 * 0x20 - uVar130) + 6);
  auVar343 = vpmovsxwd_avx(auVar30);
  auVar343 = vcvtdq2ps_avx(auVar343);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar130 * 0x23 + 6);
  auVar190 = vpmovsxwd_avx(auVar31);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar190 = vsubps_avx(auVar190,auVar343);
  auVar245._0_4_ = auVar343._0_4_ + auVar190._0_4_ * fVar137;
  auVar245._4_4_ = auVar343._4_4_ + auVar190._4_4_ * fVar154;
  auVar245._8_4_ = auVar343._8_4_ + auVar190._8_4_ * fVar173;
  auVar245._12_4_ = auVar343._12_4_ + auVar190._12_4_ * fVar175;
  auVar343 = vsubps_avx(auVar259,auVar160);
  auVar260._0_4_ = fVar195 * auVar343._0_4_;
  auVar260._4_4_ = fVar207 * auVar343._4_4_;
  auVar260._8_4_ = fVar208 * auVar343._8_4_;
  auVar260._12_4_ = fVar209 * auVar343._12_4_;
  auVar343 = vsubps_avx(auVar271,auVar160);
  auVar161._0_4_ = fVar195 * auVar343._0_4_;
  auVar161._4_4_ = fVar207 * auVar343._4_4_;
  auVar161._8_4_ = fVar208 * auVar343._8_4_;
  auVar161._12_4_ = fVar209 * auVar343._12_4_;
  auVar343 = vsubps_avx(auVar284,auVar138);
  auVar197._0_4_ = fVar217 * auVar343._0_4_;
  auVar197._4_4_ = fVar228 * auVar343._4_4_;
  auVar197._8_4_ = fVar230 * auVar343._8_4_;
  auVar197._12_4_ = fVar232 * auVar343._12_4_;
  auVar343 = vsubps_avx(auVar296,auVar138);
  auVar139._0_4_ = fVar217 * auVar343._0_4_;
  auVar139._4_4_ = fVar228 * auVar343._4_4_;
  auVar139._8_4_ = fVar230 * auVar343._8_4_;
  auVar139._12_4_ = fVar232 * auVar343._12_4_;
  auVar343 = vsubps_avx(auVar305,auVar185);
  auVar220._0_4_ = fVar235 * auVar343._0_4_;
  auVar220._4_4_ = fVar240 * auVar343._4_4_;
  auVar220._8_4_ = fVar241 * auVar343._8_4_;
  auVar220._12_4_ = fVar242 * auVar343._12_4_;
  auVar343 = vsubps_avx(auVar245,auVar185);
  auVar186._0_4_ = fVar235 * auVar343._0_4_;
  auVar186._4_4_ = fVar240 * auVar343._4_4_;
  auVar186._8_4_ = fVar241 * auVar343._8_4_;
  auVar186._12_4_ = fVar242 * auVar343._12_4_;
  auVar343 = vpminsd_avx(auVar260,auVar161);
  auVar190 = vpminsd_avx(auVar197,auVar139);
  auVar343 = vmaxps_avx(auVar343,auVar190);
  auVar190 = vpminsd_avx(auVar220,auVar186);
  uVar12 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar272._4_4_ = uVar12;
  auVar272._0_4_ = uVar12;
  auVar272._8_4_ = uVar12;
  auVar272._12_4_ = uVar12;
  auVar190 = vmaxps_avx(auVar190,auVar272);
  auVar343 = vmaxps_avx(auVar343,auVar190);
  local_2b0._0_4_ = auVar343._0_4_ * 0.99999964;
  local_2b0._4_4_ = auVar343._4_4_ * 0.99999964;
  local_2b0._8_4_ = auVar343._8_4_ * 0.99999964;
  local_2b0._12_4_ = auVar343._12_4_ * 0.99999964;
  auVar343 = vpmaxsd_avx(auVar260,auVar161);
  auVar190 = vpmaxsd_avx(auVar197,auVar139);
  auVar343 = vminps_avx(auVar343,auVar190);
  auVar190 = vpmaxsd_avx(auVar220,auVar186);
  fVar137 = ray->tfar;
  auVar187._4_4_ = fVar137;
  auVar187._0_4_ = fVar137;
  auVar187._8_4_ = fVar137;
  auVar187._12_4_ = fVar137;
  auVar190 = vminps_avx(auVar190,auVar187);
  auVar343 = vminps_avx(auVar343,auVar190);
  auVar140._0_4_ = auVar343._0_4_ * 1.0000004;
  auVar140._4_4_ = auVar343._4_4_ * 1.0000004;
  auVar140._8_4_ = auVar343._8_4_ * 1.0000004;
  auVar140._12_4_ = auVar343._12_4_ * 1.0000004;
  auVar343 = vpshufd_avx(ZEXT116((byte)PVar14),0);
  auVar190 = vpcmpgtd_avx(auVar343,_DAT_01f7fcf0);
  auVar343 = vcmpps_avx(local_2b0,auVar140,2);
  auVar343 = vandps_avx(auVar343,auVar190);
  uVar124 = vmovmskps_avx(auVar343);
  if (uVar124 != 0) {
    uVar124 = uVar124 & 0xff;
    local_4a0 = mm_lookupmask_ps._16_8_;
    uStack_498 = mm_lookupmask_ps._24_8_;
    uStack_490 = mm_lookupmask_ps._16_8_;
    uStack_488 = mm_lookupmask_ps._24_8_;
    local_7c8 = prim;
    do {
      lVar20 = 0;
      if (uVar124 != 0) {
        for (; (uVar124 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
      local_770 = (ulong)*(uint *)(local_7c8 + 2);
      pGVar15 = (context->scene->geometries).items[*(uint *)(local_7c8 + 2)].ptr;
      local_608 = (ulong)*(uint *)(local_7c8 + lVar20 * 4 + 6);
      uVar130 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                                (ulong)*(uint *)(local_7c8 + lVar20 * 4 + 6) *
                                pGVar15[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar137 = (pGVar15->time_range).lower;
      fVar137 = pGVar15->fnumTimeSegments *
                (((ray->dir).field_0.m128[3] - fVar137) / ((pGVar15->time_range).upper - fVar137));
      auVar343 = vroundss_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),9);
      auVar343 = vminss_avx(auVar343,ZEXT416((uint)(pGVar15->fnumTimeSegments + -1.0)));
      auVar343 = vmaxss_avx(ZEXT816(0) << 0x20,auVar343);
      fVar137 = fVar137 - auVar343._0_4_;
      _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar129 = (long)(int)auVar343._0_4_ * 0x38;
      lVar131 = *(long *)(_Var16 + 0x10 + lVar129);
      lVar17 = *(long *)(_Var16 + 0x38 + lVar129);
      lVar18 = *(long *)(_Var16 + 0x48 + lVar129);
      auVar343 = vshufps_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),0);
      pfVar1 = (float *)(lVar17 + lVar18 * uVar130);
      fVar154 = auVar343._0_4_;
      fVar173 = auVar343._4_4_;
      fVar175 = auVar343._8_4_;
      fVar195 = auVar343._12_4_;
      lVar20 = uVar130 + 1;
      pfVar2 = (float *)(lVar17 + lVar18 * lVar20);
      p_Var19 = pGVar15[4].occlusionFilterN;
      auVar343 = vshufps_avx(ZEXT416((uint)(1.0 - fVar137)),ZEXT416((uint)(1.0 - fVar137)),0);
      pfVar3 = (float *)(*(long *)(_Var16 + lVar129) + lVar131 * uVar130);
      fVar137 = auVar343._0_4_;
      fVar207 = auVar343._4_4_;
      fVar208 = auVar343._8_4_;
      fVar209 = auVar343._12_4_;
      pfVar4 = (float *)(*(long *)(_Var16 + lVar129) + lVar131 * lVar20);
      pfVar5 = (float *)(*(long *)(p_Var19 + lVar129 + 0x38) +
                        uVar130 * *(long *)(p_Var19 + lVar129 + 0x48));
      pfVar6 = (float *)(*(long *)(p_Var19 + lVar129 + 0x38) +
                        *(long *)(p_Var19 + lVar129 + 0x48) * lVar20);
      pfVar7 = (float *)(*(long *)(p_Var19 + lVar129) +
                        *(long *)(p_Var19 + lVar129 + 0x10) * uVar130);
      pfVar8 = (float *)(*(long *)(p_Var19 + lVar129) + *(long *)(p_Var19 + lVar129 + 0x10) * lVar20
                        );
      uVar128 = (uint)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar20 = (long)(int)uVar128 * 0x44;
      fVar217 = fVar137 * *pfVar3 + fVar154 * *pfVar1;
      fVar228 = fVar207 * pfVar3[1] + fVar173 * pfVar1[1];
      local_650 = (undefined1  [8])CONCAT44(fVar228,fVar217);
      uStack_648._0_4_ = fVar208 * pfVar3[2] + fVar175 * pfVar1[2];
      uStack_648._4_4_ = fVar209 * pfVar3[3] + fVar195 * pfVar1[3];
      local_570._0_4_ = fVar137 * *pfVar4 + fVar154 * *pfVar2;
      local_570._4_4_ = fVar207 * pfVar4[1] + fVar173 * pfVar2[1];
      fStack_568 = fVar208 * pfVar4[2] + fVar175 * pfVar2[2];
      fStack_564 = fVar209 * pfVar4[3] + fVar195 * pfVar2[3];
      local_580 = (undefined1  [8])
                  CONCAT44(fVar228 + (fVar207 * pfVar7[1] + fVar173 * pfVar5[1]) * 0.33333334,
                           fVar217 + (fVar137 * *pfVar7 + fVar154 * *pfVar5) * 0.33333334);
      uStack_578._0_4_ =
           (float)uStack_648 + (fVar208 * pfVar7[2] + fVar175 * pfVar5[2]) * 0.33333334;
      uStack_578._4_4_ = uStack_648._4_4_ + (fVar209 * pfVar7[3] + fVar195 * pfVar5[3]) * 0.33333334
      ;
      auVar141._0_4_ = (fVar137 * *pfVar8 + fVar154 * *pfVar6) * 0.33333334;
      auVar141._4_4_ = (fVar207 * pfVar8[1] + fVar173 * pfVar6[1]) * 0.33333334;
      auVar141._8_4_ = (fVar208 * pfVar8[2] + fVar175 * pfVar6[2]) * 0.33333334;
      auVar141._12_4_ = (fVar209 * pfVar8[3] + fVar195 * pfVar6[3]) * 0.33333334;
      _local_590 = vsubps_avx(_local_570,auVar141);
      aVar13 = (ray->org).field_0;
      auVar223 = vsubps_avx(_local_650,(undefined1  [16])aVar13);
      auVar26 = _local_650;
      auVar343 = vshufps_avx(auVar223,auVar223,0);
      auVar190 = vshufps_avx(auVar223,auVar223,0x55);
      auVar223 = vshufps_avx(auVar223,auVar223,0xaa);
      fVar137 = (local_768->ray_space).vx.field_0.m128[0];
      fVar154 = (local_768->ray_space).vx.field_0.m128[1];
      fVar173 = (local_768->ray_space).vx.field_0.m128[2];
      fVar175 = (local_768->ray_space).vx.field_0.m128[3];
      fVar195 = (local_768->ray_space).vy.field_0.m128[0];
      fVar207 = (local_768->ray_space).vy.field_0.m128[1];
      fVar208 = (local_768->ray_space).vy.field_0.m128[2];
      fVar209 = (local_768->ray_space).vy.field_0.m128[3];
      fVar217 = (local_768->ray_space).vz.field_0.m128[0];
      fVar228 = (local_768->ray_space).vz.field_0.m128[1];
      fVar230 = (local_768->ray_space).vz.field_0.m128[2];
      fVar232 = (local_768->ray_space).vz.field_0.m128[3];
      auVar336._0_4_ =
           auVar343._0_4_ * fVar137 + auVar223._0_4_ * fVar217 + auVar190._0_4_ * fVar195;
      auVar336._4_4_ =
           auVar343._4_4_ * fVar154 + auVar223._4_4_ * fVar228 + auVar190._4_4_ * fVar207;
      auVar336._8_4_ =
           auVar343._8_4_ * fVar173 + auVar223._8_4_ * fVar230 + auVar190._8_4_ * fVar208;
      auVar336._12_4_ =
           auVar343._12_4_ * fVar175 + auVar223._12_4_ * fVar232 + auVar190._12_4_ * fVar209;
      auVar343 = vblendps_avx(auVar336,_local_650,8);
      auVar198 = vsubps_avx(_local_580,(undefined1  [16])aVar13);
      auVar190 = vshufps_avx(auVar198,auVar198,0);
      auVar223 = vshufps_avx(auVar198,auVar198,0x55);
      auVar198 = vshufps_avx(auVar198,auVar198,0xaa);
      auVar318._0_4_ =
           auVar190._0_4_ * fVar137 + auVar223._0_4_ * fVar195 + fVar217 * auVar198._0_4_;
      auVar318._4_4_ =
           auVar190._4_4_ * fVar154 + auVar223._4_4_ * fVar207 + fVar228 * auVar198._4_4_;
      auVar318._8_4_ =
           auVar190._8_4_ * fVar173 + auVar223._8_4_ * fVar208 + fVar230 * auVar198._8_4_;
      auVar318._12_4_ =
           auVar190._12_4_ * fVar175 + auVar223._12_4_ * fVar209 + fVar232 * auVar198._12_4_;
      auVar190 = vblendps_avx(auVar318,_local_580,8);
      auVar24 = vsubps_avx(_local_590,(undefined1  [16])aVar13);
      auVar223 = vshufps_avx(auVar24,auVar24,0);
      auVar198 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar221._0_4_ = auVar223._0_4_ * fVar137 + auVar198._0_4_ * fVar195 + fVar217 * auVar24._0_4_
      ;
      auVar221._4_4_ = auVar223._4_4_ * fVar154 + auVar198._4_4_ * fVar207 + fVar228 * auVar24._4_4_
      ;
      auVar221._8_4_ = auVar223._8_4_ * fVar173 + auVar198._8_4_ * fVar208 + fVar230 * auVar24._8_4_
      ;
      auVar221._12_4_ =
           auVar223._12_4_ * fVar175 + auVar198._12_4_ * fVar209 + fVar232 * auVar24._12_4_;
      auVar223 = vblendps_avx(auVar221,_local_590,8);
      local_480._0_16_ = (undefined1  [16])aVar13;
      auVar25 = vsubps_avx(_local_570,(undefined1  [16])aVar13);
      auVar198 = vshufps_avx(auVar25,auVar25,0xaa);
      auVar24 = vshufps_avx(auVar25,auVar25,0);
      auVar25 = vshufps_avx(auVar25,auVar25,0x55);
      auVar162._0_4_ = auVar24._0_4_ * fVar137 + auVar198._0_4_ * fVar217 + auVar25._0_4_ * fVar195;
      auVar162._4_4_ = auVar24._4_4_ * fVar154 + auVar198._4_4_ * fVar228 + auVar25._4_4_ * fVar207;
      auVar162._8_4_ = auVar24._8_4_ * fVar173 + auVar198._8_4_ * fVar230 + auVar25._8_4_ * fVar208;
      auVar162._12_4_ =
           auVar24._12_4_ * fVar175 + auVar198._12_4_ * fVar232 + auVar25._12_4_ * fVar209;
      auVar198 = vblendps_avx(auVar162,_local_570,8);
      auVar222._8_4_ = 0x7fffffff;
      auVar222._0_8_ = 0x7fffffff7fffffff;
      auVar222._12_4_ = 0x7fffffff;
      auVar343 = vandps_avx(auVar343,auVar222);
      auVar190 = vandps_avx(auVar190,auVar222);
      auVar24 = vmaxps_avx(auVar343,auVar190);
      auVar343 = vandps_avx(auVar223,auVar222);
      auVar190 = vandps_avx(auVar198,auVar222);
      auVar343 = vmaxps_avx(auVar343,auVar190);
      auVar343 = vmaxps_avx(auVar24,auVar343);
      auVar190 = vmovshdup_avx(auVar343);
      auVar190 = vmaxss_avx(auVar190,auVar343);
      auVar343 = vshufpd_avx(auVar343,auVar343,1);
      auVar343 = vmaxss_avx(auVar343,auVar190);
      fVar210 = *(float *)(bezier_basis0 + lVar20 + 0x908);
      fVar264 = *(float *)(bezier_basis0 + lVar20 + 0x90c);
      fVar277 = *(float *)(bezier_basis0 + lVar20 + 0x910);
      fVar278 = *(float *)(bezier_basis0 + lVar20 + 0x914);
      fVar212 = *(float *)(bezier_basis0 + lVar20 + 0x918);
      fVar265 = *(float *)(bezier_basis0 + lVar20 + 0x91c);
      fVar280 = *(float *)(bezier_basis0 + lVar20 + 0x920);
      auVar190 = vshufps_avx(auVar221,auVar221,0);
      local_740._16_16_ = auVar190;
      local_740._0_16_ = auVar190;
      fVar230 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar20 + 0xd8c);
      fVar232 = *(float *)(bezier_basis0 + lVar20 + 0xd90);
      fVar241 = *(float *)(bezier_basis0 + lVar20 + 0xd94);
      fVar242 = *(float *)(bezier_basis0 + lVar20 + 0xd98);
      fVar291 = *(float *)(bezier_basis0 + lVar20 + 0xd9c);
      fVar292 = *(float *)(bezier_basis0 + lVar20 + 0xda0);
      fVar293 = *(float *)(bezier_basis0 + lVar20 + 0xda4);
      auVar117 = *(undefined1 (*) [28])(bezier_basis0 + lVar20 + 0xd8c);
      local_7a0._0_16_ = auVar162;
      auVar223 = vshufps_avx(auVar162,auVar162,0);
      register0x00001210 = auVar223;
      _local_400 = auVar223;
      fVar137 = auVar223._0_4_;
      fVar195 = auVar223._4_4_;
      fVar217 = auVar223._8_4_;
      fVar235 = auVar223._12_4_;
      fVar158 = auVar190._0_4_;
      fVar176 = auVar190._4_4_;
      fVar180 = auVar190._8_4_;
      fVar184 = auVar190._12_4_;
      auVar190 = vshufps_avx(auVar221,auVar221,0x55);
      register0x00001410 = auVar190;
      _local_700 = auVar190;
      auVar223 = vshufps_avx(auVar162,auVar162,0x55);
      register0x00001350 = auVar223;
      _local_760 = auVar223;
      fVar154 = auVar223._0_4_;
      fVar207 = auVar223._4_4_;
      fVar228 = auVar223._8_4_;
      fVar240 = auVar223._12_4_;
      fVar268 = auVar190._0_4_;
      fVar275 = auVar190._4_4_;
      fVar276 = auVar190._8_4_;
      fVar279 = auVar190._12_4_;
      auVar25 = _local_590;
      auVar190 = vshufps_avx(_local_590,_local_590,0xff);
      register0x00001310 = auVar190;
      _local_80 = auVar190;
      auVar223 = vshufps_avx(_local_570,_local_570,0xff);
      register0x000013d0 = auVar223;
      _local_e0 = auVar223;
      fVar173 = auVar223._0_4_;
      fVar175 = auVar223._4_4_;
      fVar208 = auVar223._8_4_;
      fVar209 = auVar223._12_4_;
      fVar218 = auVar190._0_4_;
      fVar229 = auVar190._4_4_;
      fVar231 = auVar190._8_4_;
      fVar233 = auVar190._12_4_;
      auVar190 = vshufps_avx(auVar318,auVar318,0);
      register0x00001550 = auVar190;
      _local_420 = auVar190;
      local_460 = *(float *)(bezier_basis0 + lVar20 + 0x484);
      fStack_45c = *(float *)(bezier_basis0 + lVar20 + 0x488);
      fStack_458 = *(float *)(bezier_basis0 + lVar20 + 0x48c);
      fStack_454 = *(float *)(bezier_basis0 + lVar20 + 0x490);
      fStack_450 = *(float *)(bezier_basis0 + lVar20 + 0x494);
      fStack_44c = *(float *)(bezier_basis0 + lVar20 + 0x498);
      fStack_448 = *(float *)(bezier_basis0 + lVar20 + 0x49c);
      fVar315 = auVar190._0_4_;
      fVar323 = auVar190._4_4_;
      fVar325 = auVar190._8_4_;
      fVar327 = auVar190._12_4_;
      auVar190 = vshufps_avx(auVar318,auVar318,0x55);
      register0x000014d0 = auVar190;
      _local_720 = auVar190;
      fVar304 = auVar190._0_4_;
      fVar306 = auVar190._4_4_;
      fVar307 = auVar190._8_4_;
      fVar308 = auVar190._12_4_;
      auVar27 = _local_580;
      auVar190 = vshufps_avx(_local_580,_local_580,0xff);
      register0x00001590 = auVar190;
      _local_100 = auVar190;
      fStack_444 = (float)*(undefined4 *)(bezier_basis0 + lVar20 + 0x4a0);
      fVar303 = auVar190._0_4_;
      fVar316 = auVar190._4_4_;
      fVar324 = auVar190._8_4_;
      fVar326 = auVar190._12_4_;
      fVar194 = *(float *)(bezier_basis0 + lVar20 + 0x924) + 0.0 + 0.0;
      auVar190 = vshufps_avx(auVar336,auVar336,0);
      register0x00001390 = auVar190;
      _local_c0 = auVar190;
      pauVar9 = (undefined1 (*) [16])(bezier_basis0 + lVar20);
      fVar294 = *(float *)*pauVar9;
      fVar183 = *(float *)(bezier_basis0 + lVar20 + 4);
      fVar269 = *(float *)(bezier_basis0 + lVar20 + 8);
      auVar118 = *(undefined1 (*) [12])*pauVar9;
      fVar281 = *(float *)(bezier_basis0 + lVar20 + 0xc);
      fStack_310 = *(float *)(bezier_basis0 + lVar20 + 0x10);
      fStack_30c = *(float *)(bezier_basis0 + lVar20 + 0x14);
      fStack_308 = *(float *)(bezier_basis0 + lVar20 + 0x18);
      fVar243 = auVar190._0_4_;
      fVar251 = auVar190._4_4_;
      fVar252 = auVar190._8_4_;
      fVar253 = auVar190._12_4_;
      auVar285._0_4_ =
           fVar243 * fVar294 + fVar315 * local_460 + fVar158 * fVar210 + fVar230 * fVar137;
      auVar285._4_4_ =
           fVar251 * fVar183 + fVar323 * fStack_45c + fVar176 * fVar264 + fVar232 * fVar195;
      auVar285._8_4_ =
           fVar252 * fVar269 + fVar325 * fStack_458 + fVar180 * fVar277 + fVar241 * fVar217;
      auVar285._12_4_ =
           fVar253 * fVar281 + fVar327 * fStack_454 + fVar184 * fVar278 + fVar242 * fVar235;
      auVar285._16_4_ =
           fVar243 * fStack_310 + fVar315 * fStack_450 + fVar158 * fVar212 + fVar291 * fVar137;
      auVar285._20_4_ =
           fVar251 * fStack_30c + fVar323 * fStack_44c + fVar176 * fVar265 + fVar292 * fVar195;
      auVar285._24_4_ =
           fVar252 * fStack_308 + fVar325 * fStack_448 + fVar180 * fVar280 + fVar293 * fVar217;
      auVar285._28_4_ = fVar253 + fVar184 + fVar235 + 0.0;
      auVar190 = vshufps_avx(auVar336,auVar336,0x55);
      register0x000015d0 = auVar190;
      _local_a0 = auVar190;
      fVar335 = auVar190._0_4_;
      fVar340 = auVar190._4_4_;
      fVar341 = auVar190._8_4_;
      fVar342 = auVar190._12_4_;
      auVar310._0_4_ =
           fVar335 * fVar294 + fVar304 * local_460 + fVar268 * fVar210 + fVar230 * fVar154;
      auVar310._4_4_ =
           fVar340 * fVar183 + fVar306 * fStack_45c + fVar275 * fVar264 + fVar232 * fVar207;
      auVar310._8_4_ =
           fVar341 * fVar269 + fVar307 * fStack_458 + fVar276 * fVar277 + fVar241 * fVar228;
      auVar310._12_4_ =
           fVar342 * fVar281 + fVar308 * fStack_454 + fVar279 * fVar278 + fVar242 * fVar240;
      auVar310._16_4_ =
           fVar335 * fStack_310 + fVar304 * fStack_450 + fVar268 * fVar212 + fVar291 * fVar154;
      auVar310._20_4_ =
           fVar340 * fStack_30c + fVar306 * fStack_44c + fVar275 * fVar265 + fVar292 * fVar207;
      auVar310._24_4_ =
           fVar341 * fStack_308 + fVar307 * fStack_448 + fVar276 * fVar280 + fVar293 * fVar228;
      auVar310._28_4_ = 0;
      auVar190 = vpermilps_avx(_local_650,0xff);
      register0x00001490 = auVar190;
      _local_120 = auVar190;
      _local_320 = *pauVar9;
      auVar28 = _local_320;
      uStack_304 = *(undefined4 *)(bezier_basis0 + lVar20 + 0x1c);
      fVar295 = auVar190._0_4_;
      fVar300 = auVar190._4_4_;
      fVar302 = auVar190._8_4_;
      fVar134 = fVar295 * fVar294 + fVar303 * local_460 + fVar218 * fVar210 + fVar230 * fVar173;
      fVar151 = fVar300 * fVar183 + fVar316 * fStack_45c + fVar229 * fVar264 + fVar232 * fVar175;
      fStack_7b8 = fVar302 * fVar269 + fVar324 * fStack_458 + fVar231 * fVar277 + fVar241 * fVar208;
      fStack_7b4 = auVar190._12_4_ * fVar281 +
                   fVar326 * fStack_454 + fVar233 * fVar278 + fVar242 * fVar209;
      fStack_7b0 = fVar295 * fStack_310 +
                   fVar303 * fStack_450 + fVar218 * fVar212 + fVar291 * fVar173;
      fStack_7ac = fVar300 * fStack_30c +
                   fVar316 * fStack_44c + fVar229 * fVar265 + fVar292 * fVar175;
      fStack_7a8 = fVar302 * fStack_308 +
                   fVar324 * fStack_448 + fVar231 * fVar280 + fVar293 * fVar208;
      fStack_7a4 = fVar194 + 0.0;
      auVar170 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x908);
      auVar171 = ZEXT3264(auVar170);
      fVar214 = *(float *)(bezier_basis1 + lVar20 + 0xd8c);
      fVar266 = *(float *)(bezier_basis1 + lVar20 + 0xd90);
      fVar282 = *(float *)(bezier_basis1 + lVar20 + 0xd94);
      fVar283 = *(float *)(bezier_basis1 + lVar20 + 0xd98);
      fVar216 = *(float *)(bezier_basis1 + lVar20 + 0xd9c);
      fVar301 = *(float *)(bezier_basis1 + lVar20 + 0xda0);
      fVar135 = *(float *)(bezier_basis1 + lVar20 + 0xda4);
      fVar174 = auVar170._0_4_;
      fVar178 = auVar170._4_4_;
      fVar182 = auVar170._8_4_;
      fVar255 = auVar170._12_4_;
      fVar177 = auVar170._16_4_;
      fVar179 = auVar170._20_4_;
      fVar181 = auVar170._24_4_;
      fVar152 = *(float *)(bezier_basis1 + lVar20 + 0x484);
      fVar155 = *(float *)(bezier_basis1 + lVar20 + 0x488);
      fVar156 = *(float *)(bezier_basis1 + lVar20 + 0x48c);
      fVar157 = *(float *)(bezier_basis1 + lVar20 + 0x490);
      fVar136 = *(float *)(bezier_basis1 + lVar20 + 0x494);
      fVar153 = *(float *)(bezier_basis1 + lVar20 + 0x498);
      fVar234 = *(float *)(bezier_basis1 + lVar20 + 0x49c);
      fVar232 = fVar327 + fVar194 + 0.0;
      fVar194 = *(float *)(bezier_basis1 + lVar20);
      fVar254 = *(float *)(bezier_basis1 + lVar20 + 4);
      fVar172 = *(float *)(bezier_basis1 + lVar20 + 8);
      fVar211 = *(float *)(bezier_basis1 + lVar20 + 0xc);
      fVar213 = *(float *)(bezier_basis1 + lVar20 + 0x10);
      fVar215 = *(float *)(bezier_basis1 + lVar20 + 0x14);
      fVar267 = *(float *)(bezier_basis1 + lVar20 + 0x18);
      local_380._0_4_ =
           fVar243 * fVar194 + fVar315 * fVar152 + fVar174 * fVar158 + fVar214 * fVar137;
      local_380._4_4_ =
           fVar251 * fVar254 + fVar323 * fVar155 + fVar178 * fVar176 + fVar266 * fVar195;
      fStack_378 = fVar252 * fVar172 + fVar325 * fVar156 + fVar182 * fVar180 + fVar282 * fVar217;
      fStack_374 = fVar253 * fVar211 + fVar327 * fVar157 + fVar255 * fVar184 + fVar283 * fVar235;
      fStack_370 = fVar243 * fVar213 + fVar315 * fVar136 + fVar177 * fVar158 + fVar216 * fVar137;
      fStack_36c = fVar251 * fVar215 + fVar323 * fVar153 + fVar179 * fVar176 + fVar301 * fVar195;
      fStack_368 = fVar252 * fVar267 + fVar325 * fVar234 + fVar181 * fVar180 + fVar135 * fVar217;
      register0x0000135c = fVar326 + fVar232;
      auVar200._0_4_ = fVar335 * fVar194 + fVar304 * fVar152 + fVar268 * fVar174 + fVar154 * fVar214
      ;
      auVar200._4_4_ = fVar340 * fVar254 + fVar306 * fVar155 + fVar275 * fVar178 + fVar207 * fVar266
      ;
      auVar200._8_4_ = fVar341 * fVar172 + fVar307 * fVar156 + fVar276 * fVar182 + fVar228 * fVar282
      ;
      auVar200._12_4_ =
           fVar342 * fVar211 + fVar308 * fVar157 + fVar279 * fVar255 + fVar240 * fVar283;
      auVar200._16_4_ =
           fVar335 * fVar213 + fVar304 * fVar136 + fVar268 * fVar177 + fVar154 * fVar216;
      auVar200._20_4_ =
           fVar340 * fVar215 + fVar306 * fVar153 + fVar275 * fVar179 + fVar207 * fVar301;
      auVar200._24_4_ =
           fVar341 * fVar267 + fVar307 * fVar234 + fVar276 * fVar181 + fVar228 * fVar135;
      auVar200._28_4_ = fVar232 + fVar327 + fVar253 + 0.0;
      auVar273._0_4_ = fVar303 * fVar152 + fVar218 * fVar174 + fVar173 * fVar214 + fVar295 * fVar194
      ;
      auVar273._4_4_ = fVar316 * fVar155 + fVar229 * fVar178 + fVar175 * fVar266 + fVar300 * fVar254
      ;
      auVar273._8_4_ = fVar324 * fVar156 + fVar231 * fVar182 + fVar208 * fVar282 + fVar302 * fVar172
      ;
      auVar273._12_4_ =
           fVar326 * fVar157 + fVar233 * fVar255 + fVar209 * fVar283 + auVar190._12_4_ * fVar211;
      auVar273._16_4_ =
           fVar303 * fVar136 + fVar218 * fVar177 + fVar173 * fVar216 + fVar295 * fVar213;
      auVar273._20_4_ =
           fVar316 * fVar153 + fVar229 * fVar179 + fVar175 * fVar301 + fVar300 * fVar215;
      auVar273._24_4_ =
           fVar324 * fVar234 + fVar231 * fVar181 + fVar208 * fVar135 + fVar302 * fVar267;
      auVar273._28_4_ = fVar327 + fVar209 + fVar253 + fVar232;
      auVar32 = vsubps_avx(_local_380,auVar285);
      _local_440 = vsubps_avx(auVar200,auVar310);
      fVar173 = auVar32._0_4_;
      fVar208 = auVar32._4_4_;
      auVar23._4_4_ = auVar310._4_4_ * fVar208;
      auVar23._0_4_ = auVar310._0_4_ * fVar173;
      fVar230 = auVar32._8_4_;
      auVar23._8_4_ = auVar310._8_4_ * fVar230;
      fVar241 = auVar32._12_4_;
      auVar23._12_4_ = auVar310._12_4_ * fVar241;
      fVar291 = auVar32._16_4_;
      auVar23._16_4_ = auVar310._16_4_ * fVar291;
      fVar293 = auVar32._20_4_;
      auVar23._20_4_ = auVar310._20_4_ * fVar293;
      fVar183 = auVar32._24_4_;
      auVar23._24_4_ = auVar310._24_4_ * fVar183;
      auVar23._28_4_ = fVar232;
      fVar175 = local_440._0_4_;
      fVar209 = local_440._4_4_;
      auVar33._4_4_ = auVar285._4_4_ * fVar209;
      auVar33._0_4_ = auVar285._0_4_ * fVar175;
      fVar232 = local_440._8_4_;
      auVar33._8_4_ = auVar285._8_4_ * fVar232;
      fVar242 = local_440._12_4_;
      auVar33._12_4_ = auVar285._12_4_ * fVar242;
      fVar292 = local_440._16_4_;
      auVar33._16_4_ = auVar285._16_4_ * fVar292;
      fVar294 = local_440._20_4_;
      auVar33._20_4_ = auVar285._20_4_ * fVar294;
      fVar269 = local_440._24_4_;
      auVar33._24_4_ = auVar285._24_4_ * fVar269;
      auVar33._28_4_ = auVar200._28_4_;
      auVar33 = vsubps_avx(auVar23,auVar33);
      auVar22._4_4_ = fVar151;
      auVar22._0_4_ = fVar134;
      auVar22._8_4_ = fStack_7b8;
      auVar22._12_4_ = fStack_7b4;
      auVar22._16_4_ = fStack_7b0;
      auVar22._20_4_ = fStack_7ac;
      auVar22._24_4_ = fStack_7a8;
      auVar22._28_4_ = fStack_7a4;
      auVar23 = vmaxps_avx(auVar22,auVar273);
      auVar37._4_4_ = auVar23._4_4_ * auVar23._4_4_ * (fVar208 * fVar208 + fVar209 * fVar209);
      auVar37._0_4_ = auVar23._0_4_ * auVar23._0_4_ * (fVar173 * fVar173 + fVar175 * fVar175);
      auVar37._8_4_ = auVar23._8_4_ * auVar23._8_4_ * (fVar230 * fVar230 + fVar232 * fVar232);
      auVar37._12_4_ = auVar23._12_4_ * auVar23._12_4_ * (fVar241 * fVar241 + fVar242 * fVar242);
      auVar37._16_4_ = auVar23._16_4_ * auVar23._16_4_ * (fVar291 * fVar291 + fVar292 * fVar292);
      auVar37._20_4_ = auVar23._20_4_ * auVar23._20_4_ * (fVar293 * fVar293 + fVar294 * fVar294);
      auVar37._24_4_ = auVar23._24_4_ * auVar23._24_4_ * (fVar183 * fVar183 + fVar269 * fVar269);
      auVar37._28_4_ = fVar233 + auVar200._28_4_;
      auVar21._4_4_ = auVar33._4_4_ * auVar33._4_4_;
      auVar21._0_4_ = auVar33._0_4_ * auVar33._0_4_;
      auVar21._8_4_ = auVar33._8_4_ * auVar33._8_4_;
      auVar21._12_4_ = auVar33._12_4_ * auVar33._12_4_;
      auVar21._16_4_ = auVar33._16_4_ * auVar33._16_4_;
      auVar21._20_4_ = auVar33._20_4_ * auVar33._20_4_;
      auVar21._24_4_ = auVar33._24_4_ * auVar33._24_4_;
      auVar21._28_4_ = auVar33._28_4_;
      auVar23 = vcmpps_avx(auVar21,auVar37,2);
      auVar190 = ZEXT416((uint)(float)(int)uVar128);
      local_3e0._0_16_ = auVar190;
      auVar190 = vshufps_avx(auVar190,auVar190,0);
      auVar201._16_16_ = auVar190;
      auVar201._0_16_ = auVar190;
      auVar33 = vcmpps_avx(_DAT_01faff40,auVar201,1);
      auVar190 = vpermilps_avx(auVar336,0xaa);
      register0x00001490 = auVar190;
      _local_680 = auVar190;
      auVar223 = vpermilps_avx(auVar318,0xaa);
      register0x00001550 = auVar223;
      _local_2e0 = auVar223;
      auVar198 = vpermilps_avx(auVar221,0xaa);
      register0x00001590 = auVar198;
      _local_300 = auVar198;
      auVar24 = vpermilps_avx(auVar162,0xaa);
      register0x00001310 = auVar24;
      _local_5e0 = auVar24;
      auVar37 = auVar33 & auVar23;
      auVar343 = ZEXT416((uint)(auVar343._0_4_ * 4.7683716e-07));
      fVar173 = fVar268;
      fVar175 = fVar275;
      fVar208 = fVar276;
      fVar209 = fVar304;
      fVar230 = fVar306;
      fVar232 = fVar307;
      if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar37 >> 0x7f,0) == '\0') &&
            (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar37 >> 0xbf,0) == '\0') &&
          (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar37[0x1f])
      {
        bVar133 = false;
        auVar322 = ZEXT3264(local_740);
        auVar263 = ZEXT3264(_local_760);
        auVar206 = ZEXT1664(auVar343);
        _local_650 = auVar26;
        _local_590 = auVar25;
        _local_580 = auVar27;
      }
      else {
        local_340 = vandps_avx(auVar23,auVar33);
        fVar295 = auVar190._0_4_;
        fVar300 = auVar190._4_4_;
        fVar302 = auVar190._8_4_;
        fVar303 = auVar190._12_4_;
        fVar316 = auVar223._0_4_;
        fVar324 = auVar223._4_4_;
        fVar326 = auVar223._8_4_;
        fVar328 = auVar223._12_4_;
        fVar329 = auVar198._0_4_;
        fVar332 = auVar198._4_4_;
        fVar333 = auVar198._8_4_;
        fVar334 = auVar198._12_4_;
        fVar218 = auVar24._0_4_;
        fVar229 = auVar24._4_4_;
        fVar231 = auVar24._8_4_;
        fVar233 = auVar24._12_4_;
        fVar241 = auVar33._28_4_ + auVar170._28_4_ + register0x0000135c;
        local_360._0_4_ =
             fVar295 * fVar194 + fVar316 * fVar152 + fVar329 * fVar174 + fVar218 * fVar214;
        local_360._4_4_ =
             fVar300 * fVar254 + fVar324 * fVar155 + fVar332 * fVar178 + fVar229 * fVar266;
        fStack_358 = fVar302 * fVar172 + fVar326 * fVar156 + fVar333 * fVar182 + fVar231 * fVar282;
        fStack_354 = fVar303 * fVar211 + fVar328 * fVar157 + fVar334 * fVar255 + fVar233 * fVar283;
        fStack_350 = fVar295 * fVar213 + fVar316 * fVar136 + fVar329 * fVar177 + fVar218 * fVar216;
        fStack_34c = fVar300 * fVar215 + fVar324 * fVar153 + fVar332 * fVar179 + fVar229 * fVar301;
        fStack_348 = fVar302 * fVar267 + fVar326 * fVar234 + fVar333 * fVar181 + fVar231 * fVar135;
        fStack_344 = local_340._28_4_ + fVar241;
        local_320._0_4_ = auVar118._0_4_;
        local_320._4_4_ = auVar118._4_4_;
        fStack_318 = auVar118._8_4_;
        local_600._0_4_ = auVar117._0_4_;
        local_600._4_4_ = auVar117._4_4_;
        fStack_5f8 = auVar117._8_4_;
        fStack_5f4 = auVar117._12_4_;
        fStack_5f0 = auVar117._16_4_;
        fStack_5ec = auVar117._20_4_;
        fStack_5e8 = auVar117._24_4_;
        local_540 = fVar295 * (float)local_320._0_4_ +
                    fVar316 * local_460 + fVar329 * fVar210 + fVar218 * (float)local_600._0_4_;
        fStack_53c = fVar300 * (float)local_320._4_4_ +
                     fVar324 * fStack_45c + fVar332 * fVar264 + fVar229 * (float)local_600._4_4_;
        fStack_538 = fVar302 * fStack_318 +
                     fVar326 * fStack_458 + fVar333 * fVar277 + fVar231 * fStack_5f8;
        fStack_534 = fVar303 * fVar281 +
                     fVar328 * fStack_454 + fVar334 * fVar278 + fVar233 * fStack_5f4;
        fStack_530 = fVar295 * fStack_310 +
                     fVar316 * fStack_450 + fVar329 * fVar212 + fVar218 * fStack_5f0;
        fStack_52c = fVar300 * fStack_30c +
                     fVar324 * fStack_44c + fVar332 * fVar265 + fVar229 * fStack_5ec;
        fStack_528 = fVar302 * fStack_308 +
                     fVar326 * fStack_448 + fVar333 * fVar280 + fVar231 * fStack_5e8;
        fStack_524 = fStack_344 + fVar241 + local_340._28_4_ + auVar33._28_4_;
        fVar241 = *(float *)(bezier_basis0 + lVar20 + 0x1210);
        fVar242 = *(float *)(bezier_basis0 + lVar20 + 0x1214);
        fVar291 = *(float *)(bezier_basis0 + lVar20 + 0x1218);
        fVar292 = *(float *)(bezier_basis0 + lVar20 + 0x121c);
        fVar293 = *(float *)(bezier_basis0 + lVar20 + 0x1220);
        fVar294 = *(float *)(bezier_basis0 + lVar20 + 0x1224);
        fVar183 = *(float *)(bezier_basis0 + lVar20 + 0x1228);
        fVar269 = *(float *)(bezier_basis0 + lVar20 + 0x1694);
        fVar210 = *(float *)(bezier_basis0 + lVar20 + 0x1698);
        fVar264 = *(float *)(bezier_basis0 + lVar20 + 0x169c);
        fVar277 = *(float *)(bezier_basis0 + lVar20 + 0x16a0);
        fVar278 = *(float *)(bezier_basis0 + lVar20 + 0x16a4);
        fVar212 = *(float *)(bezier_basis0 + lVar20 + 0x16a8);
        fVar265 = *(float *)(bezier_basis0 + lVar20 + 0x16ac);
        fVar280 = *(float *)(bezier_basis0 + lVar20 + 0x1b18);
        fVar281 = *(float *)(bezier_basis0 + lVar20 + 0x1b1c);
        fVar214 = *(float *)(bezier_basis0 + lVar20 + 0x1b20);
        fVar266 = *(float *)(bezier_basis0 + lVar20 + 0x1b24);
        fVar282 = *(float *)(bezier_basis0 + lVar20 + 0x1b28);
        fVar283 = *(float *)(bezier_basis0 + lVar20 + 0x1b2c);
        fVar216 = *(float *)(bezier_basis0 + lVar20 + 0x1b30);
        fVar301 = *(float *)(bezier_basis0 + lVar20 + 0x1f9c);
        fVar135 = *(float *)(bezier_basis0 + lVar20 + 0x1fa0);
        fVar152 = *(float *)(bezier_basis0 + lVar20 + 0x1fa4);
        fVar155 = *(float *)(bezier_basis0 + lVar20 + 0x1fa8);
        fVar156 = *(float *)(bezier_basis0 + lVar20 + 0x1fac);
        fVar157 = *(float *)(bezier_basis0 + lVar20 + 0x1fb0);
        fVar136 = *(float *)(bezier_basis0 + lVar20 + 0x1fb4);
        local_7a0._0_16_ = auVar343;
        fVar153 = *(float *)(bezier_basis0 + lVar20 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar20 + 0x1fb8);
        fVar234 = *(float *)(bezier_basis0 + lVar20 + 0x16b0) + fVar153;
        local_600._4_4_ =
             fVar251 * fVar242 + fVar210 * fVar323 + fVar176 * fVar281 + fVar195 * fVar135;
        local_600._0_4_ =
             fVar243 * fVar241 + fVar269 * fVar315 + fVar158 * fVar280 + fVar137 * fVar301;
        fStack_5f8 = fVar252 * fVar291 + fVar264 * fVar325 + fVar180 * fVar214 + fVar217 * fVar152;
        fStack_5f4 = fVar253 * fVar292 + fVar277 * fVar327 + fVar184 * fVar266 + fVar235 * fVar155;
        fStack_5f0 = fVar243 * fVar293 + fVar278 * fVar315 + fVar158 * fVar282 + fVar137 * fVar156;
        fStack_5ec = fVar251 * fVar294 + fVar212 * fVar323 + fVar176 * fVar283 + fVar195 * fVar157;
        fStack_5e8 = fVar252 * fVar183 + fVar265 * fVar325 + fVar180 * fVar216 + fVar217 * fVar136;
        fStack_5e4 = *(float *)(bezier_basis0 + lVar20 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar20 + 0x1fb8) +
                     *(float *)(bezier_basis1 + lVar20 + 0x4a0) + 0.0;
        auVar165._0_4_ =
             fVar335 * fVar241 + fVar304 * fVar269 + fVar268 * fVar280 + fVar154 * fVar301;
        auVar165._4_4_ =
             fVar340 * fVar242 + fVar306 * fVar210 + fVar275 * fVar281 + fVar207 * fVar135;
        auVar165._8_4_ =
             fVar341 * fVar291 + fVar307 * fVar264 + fVar276 * fVar214 + fVar228 * fVar152;
        auVar165._12_4_ =
             fVar342 * fVar292 + fVar308 * fVar277 + fVar279 * fVar266 + fVar240 * fVar155;
        auVar165._16_4_ =
             fVar335 * fVar293 + fVar304 * fVar278 + fVar268 * fVar282 + fVar154 * fVar156;
        auVar165._20_4_ =
             fVar340 * fVar294 + fVar306 * fVar212 + fVar275 * fVar283 + fVar207 * fVar157;
        auVar165._24_4_ =
             fVar341 * fVar183 + fVar307 * fVar265 + fVar276 * fVar216 + fVar228 * fVar136;
        auVar165._28_4_ =
             fVar153 + *(float *)(bezier_basis1 + lVar20 + 0x4a0) + 0.0 +
                       *(float *)(bezier_basis1 + lVar20 + 0x1c) + 0.0;
        auVar246._0_4_ =
             fVar295 * fVar241 + fVar316 * fVar269 + fVar329 * fVar280 + fVar218 * fVar301;
        auVar246._4_4_ =
             fVar300 * fVar242 + fVar324 * fVar210 + fVar332 * fVar281 + fVar229 * fVar135;
        auVar246._8_4_ =
             fVar302 * fVar291 + fVar326 * fVar264 + fVar333 * fVar214 + fVar231 * fVar152;
        auVar246._12_4_ =
             fVar303 * fVar292 + fVar328 * fVar277 + fVar334 * fVar266 + fVar233 * fVar155;
        auVar246._16_4_ =
             fVar295 * fVar293 + fVar316 * fVar278 + fVar329 * fVar282 + fVar218 * fVar156;
        auVar246._20_4_ =
             fVar300 * fVar294 + fVar324 * fVar212 + fVar332 * fVar283 + fVar229 * fVar157;
        auVar246._24_4_ =
             fVar302 * fVar183 + fVar326 * fVar265 + fVar333 * fVar216 + fVar231 * fVar136;
        auVar246._28_4_ = *(float *)(bezier_basis0 + lVar20 + 0x122c) + fVar234;
        fVar241 = *(float *)(bezier_basis1 + lVar20 + 0x1b18);
        fVar242 = *(float *)(bezier_basis1 + lVar20 + 0x1b1c);
        fVar291 = *(float *)(bezier_basis1 + lVar20 + 0x1b20);
        fVar292 = *(float *)(bezier_basis1 + lVar20 + 0x1b24);
        fVar293 = *(float *)(bezier_basis1 + lVar20 + 0x1b28);
        fVar294 = *(float *)(bezier_basis1 + lVar20 + 0x1b2c);
        fVar183 = *(float *)(bezier_basis1 + lVar20 + 0x1b30);
        fVar269 = *(float *)(bezier_basis1 + lVar20 + 0x1f9c);
        fVar210 = *(float *)(bezier_basis1 + lVar20 + 0x1fa0);
        fVar264 = *(float *)(bezier_basis1 + lVar20 + 0x1fa4);
        fVar277 = *(float *)(bezier_basis1 + lVar20 + 0x1fa8);
        fVar278 = *(float *)(bezier_basis1 + lVar20 + 0x1fac);
        fVar212 = *(float *)(bezier_basis1 + lVar20 + 0x1fb0);
        fVar265 = *(float *)(bezier_basis1 + lVar20 + 0x1fb4);
        fVar280 = *(float *)(bezier_basis1 + lVar20 + 0x1694);
        fVar281 = *(float *)(bezier_basis1 + lVar20 + 0x1698);
        fVar214 = *(float *)(bezier_basis1 + lVar20 + 0x169c);
        fVar266 = *(float *)(bezier_basis1 + lVar20 + 0x16a0);
        fVar282 = *(float *)(bezier_basis1 + lVar20 + 0x16a4);
        fVar283 = *(float *)(bezier_basis1 + lVar20 + 0x16a8);
        fVar216 = *(float *)(bezier_basis1 + lVar20 + 0x16ac);
        fVar301 = *(float *)(bezier_basis1 + lVar20 + 0x1210);
        fVar135 = *(float *)(bezier_basis1 + lVar20 + 0x1214);
        fVar152 = *(float *)(bezier_basis1 + lVar20 + 0x1218);
        fVar155 = *(float *)(bezier_basis1 + lVar20 + 0x121c);
        fVar156 = *(float *)(bezier_basis1 + lVar20 + 0x1220);
        fVar157 = *(float *)(bezier_basis1 + lVar20 + 0x1224);
        fVar136 = *(float *)(bezier_basis1 + lVar20 + 0x1228);
        auVar261._0_4_ =
             fVar243 * fVar301 + fVar280 * fVar315 + fVar158 * fVar241 + fVar137 * fVar269;
        auVar261._4_4_ =
             fVar251 * fVar135 + fVar281 * fVar323 + fVar176 * fVar242 + fVar195 * fVar210;
        auVar261._8_4_ =
             fVar252 * fVar152 + fVar214 * fVar325 + fVar180 * fVar291 + fVar217 * fVar264;
        auVar261._12_4_ =
             fVar253 * fVar155 + fVar266 * fVar327 + fVar184 * fVar292 + fVar235 * fVar277;
        auVar261._16_4_ =
             fVar243 * fVar156 + fVar282 * fVar315 + fVar158 * fVar293 + fVar137 * fVar278;
        auVar261._20_4_ =
             fVar251 * fVar157 + fVar283 * fVar323 + fVar176 * fVar294 + fVar195 * fVar212;
        auVar261._24_4_ =
             fVar252 * fVar136 + fVar216 * fVar325 + fVar180 * fVar183 + fVar217 * fVar265;
        auVar261._28_4_ = fVar235 + fVar235 + fVar234 + 0.0;
        auVar286._0_4_ =
             fVar335 * fVar301 + fVar304 * fVar280 + fVar268 * fVar241 + fVar154 * fVar269;
        auVar286._4_4_ =
             fVar340 * fVar135 + fVar306 * fVar281 + fVar275 * fVar242 + fVar207 * fVar210;
        auVar286._8_4_ =
             fVar341 * fVar152 + fVar307 * fVar214 + fVar276 * fVar291 + fVar228 * fVar264;
        auVar286._12_4_ =
             fVar342 * fVar155 + fVar308 * fVar266 + fVar279 * fVar292 + fVar240 * fVar277;
        auVar286._16_4_ =
             fVar335 * fVar156 + fVar304 * fVar282 + fVar268 * fVar293 + fVar154 * fVar278;
        auVar286._20_4_ =
             fVar340 * fVar157 + fVar306 * fVar283 + fVar275 * fVar294 + fVar207 * fVar212;
        auVar286._24_4_ =
             fVar341 * fVar136 + fVar307 * fVar216 + fVar276 * fVar183 + fVar228 * fVar265;
        auVar286._28_4_ = fVar235 + fVar235 + fVar235 + 0.0;
        auVar192._0_4_ =
             fVar295 * fVar301 + fVar316 * fVar280 + fVar329 * fVar241 + fVar269 * fVar218;
        auVar192._4_4_ =
             fVar300 * fVar135 + fVar324 * fVar281 + fVar332 * fVar242 + fVar210 * fVar229;
        auVar192._8_4_ =
             fVar302 * fVar152 + fVar326 * fVar214 + fVar333 * fVar291 + fVar264 * fVar231;
        auVar192._12_4_ =
             fVar303 * fVar155 + fVar328 * fVar266 + fVar334 * fVar292 + fVar277 * fVar233;
        auVar192._16_4_ =
             fVar295 * fVar156 + fVar316 * fVar282 + fVar329 * fVar293 + fVar278 * fVar218;
        auVar192._20_4_ =
             fVar300 * fVar157 + fVar324 * fVar283 + fVar332 * fVar294 + fVar212 * fVar229;
        auVar192._24_4_ =
             fVar302 * fVar136 + fVar326 * fVar216 + fVar333 * fVar183 + fVar265 * fVar231;
        auVar192._28_4_ =
             *(float *)(bezier_basis1 + lVar20 + 0x122c) +
             *(float *)(bezier_basis1 + lVar20 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar20 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar20 + 0x1fb8);
        auVar224._8_4_ = 0x7fffffff;
        auVar224._0_8_ = 0x7fffffff7fffffff;
        auVar224._12_4_ = 0x7fffffff;
        auVar224._16_4_ = 0x7fffffff;
        auVar224._20_4_ = 0x7fffffff;
        auVar224._24_4_ = 0x7fffffff;
        auVar224._28_4_ = 0x7fffffff;
        auVar170 = vandps_avx(_local_600,auVar224);
        auVar23 = vandps_avx(auVar165,auVar224);
        auVar23 = vmaxps_avx(auVar170,auVar23);
        auVar170 = vandps_avx(auVar246,auVar224);
        auVar170 = vmaxps_avx(auVar23,auVar170);
        auVar190 = vpermilps_avx(auVar343,0);
        auVar247._16_16_ = auVar190;
        auVar247._0_16_ = auVar190;
        auVar170 = vcmpps_avx(auVar170,auVar247,1);
        auVar33 = vblendvps_avx(_local_600,auVar32,auVar170);
        auVar37 = vblendvps_avx(auVar165,_local_440,auVar170);
        auVar170 = vandps_avx(auVar261,auVar224);
        auVar23 = vandps_avx(auVar286,auVar224);
        auVar21 = vmaxps_avx(auVar170,auVar23);
        auVar170 = vandps_avx(auVar192,auVar224);
        auVar170 = vmaxps_avx(auVar21,auVar170);
        auVar21 = vcmpps_avx(auVar170,auVar247,1);
        auVar170 = vblendvps_avx(auVar261,auVar32,auVar21);
        auVar32 = vblendvps_avx(auVar286,_local_440,auVar21);
        fVar135 = auVar33._0_4_;
        fVar152 = auVar33._4_4_;
        fVar155 = auVar33._8_4_;
        fVar156 = auVar33._12_4_;
        fVar157 = auVar33._16_4_;
        fVar136 = auVar33._20_4_;
        fVar153 = auVar33._24_4_;
        fVar234 = auVar170._0_4_;
        fVar194 = auVar170._4_4_;
        fVar254 = auVar170._8_4_;
        fVar172 = auVar170._12_4_;
        fVar211 = auVar170._16_4_;
        fVar213 = auVar170._20_4_;
        fVar215 = auVar170._24_4_;
        fVar267 = -auVar170._28_4_;
        fVar137 = auVar37._0_4_;
        fVar217 = auVar37._4_4_;
        fVar242 = auVar37._8_4_;
        fVar294 = auVar37._12_4_;
        fVar264 = auVar37._16_4_;
        fVar265 = auVar37._20_4_;
        fVar266 = auVar37._24_4_;
        auVar144._0_4_ = fVar137 * fVar137 + fVar135 * fVar135;
        auVar144._4_4_ = fVar217 * fVar217 + fVar152 * fVar152;
        auVar144._8_4_ = fVar242 * fVar242 + fVar155 * fVar155;
        auVar144._12_4_ = fVar294 * fVar294 + fVar156 * fVar156;
        auVar144._16_4_ = fVar264 * fVar264 + fVar157 * fVar157;
        auVar144._20_4_ = fVar265 * fVar265 + fVar136 * fVar136;
        auVar144._24_4_ = fVar266 * fVar266 + fVar153 * fVar153;
        auVar144._28_4_ = auVar286._28_4_ + auVar33._28_4_;
        auVar33 = vrsqrtps_avx(auVar144);
        fVar154 = auVar33._0_4_;
        fVar195 = auVar33._4_4_;
        auVar34._4_4_ = fVar195 * 1.5;
        auVar34._0_4_ = fVar154 * 1.5;
        fVar207 = auVar33._8_4_;
        auVar34._8_4_ = fVar207 * 1.5;
        fVar228 = auVar33._12_4_;
        auVar34._12_4_ = fVar228 * 1.5;
        fVar235 = auVar33._16_4_;
        auVar34._16_4_ = fVar235 * 1.5;
        fVar241 = auVar33._20_4_;
        auVar34._20_4_ = fVar241 * 1.5;
        fVar291 = auVar33._24_4_;
        fVar301 = auVar23._28_4_;
        auVar34._24_4_ = fVar291 * 1.5;
        auVar34._28_4_ = fVar301;
        auVar35._4_4_ = fVar195 * fVar195 * fVar195 * auVar144._4_4_ * 0.5;
        auVar35._0_4_ = fVar154 * fVar154 * fVar154 * auVar144._0_4_ * 0.5;
        auVar35._8_4_ = fVar207 * fVar207 * fVar207 * auVar144._8_4_ * 0.5;
        auVar35._12_4_ = fVar228 * fVar228 * fVar228 * auVar144._12_4_ * 0.5;
        auVar35._16_4_ = fVar235 * fVar235 * fVar235 * auVar144._16_4_ * 0.5;
        auVar35._20_4_ = fVar241 * fVar241 * fVar241 * auVar144._20_4_ * 0.5;
        auVar35._24_4_ = fVar291 * fVar291 * fVar291 * auVar144._24_4_ * 0.5;
        auVar35._28_4_ = auVar144._28_4_;
        auVar23 = vsubps_avx(auVar34,auVar35);
        fVar154 = auVar23._0_4_;
        fVar228 = auVar23._4_4_;
        fVar291 = auVar23._8_4_;
        fVar183 = auVar23._12_4_;
        fVar277 = auVar23._16_4_;
        fVar280 = auVar23._20_4_;
        fVar282 = auVar23._24_4_;
        fVar195 = auVar32._0_4_;
        fVar235 = auVar32._4_4_;
        fVar292 = auVar32._8_4_;
        fVar269 = auVar32._12_4_;
        fVar278 = auVar32._16_4_;
        fVar281 = auVar32._20_4_;
        fVar283 = auVar32._24_4_;
        auVar145._0_4_ = fVar195 * fVar195 + fVar234 * fVar234;
        auVar145._4_4_ = fVar235 * fVar235 + fVar194 * fVar194;
        auVar145._8_4_ = fVar292 * fVar292 + fVar254 * fVar254;
        auVar145._12_4_ = fVar269 * fVar269 + fVar172 * fVar172;
        auVar145._16_4_ = fVar278 * fVar278 + fVar211 * fVar211;
        auVar145._20_4_ = fVar281 * fVar281 + fVar213 * fVar213;
        auVar145._24_4_ = fVar283 * fVar283 + fVar215 * fVar215;
        auVar145._28_4_ = auVar170._28_4_ + auVar23._28_4_;
        auVar170 = vrsqrtps_avx(auVar145);
        fVar207 = auVar170._0_4_;
        fVar241 = auVar170._4_4_;
        auVar36._4_4_ = fVar241 * 1.5;
        auVar36._0_4_ = fVar207 * 1.5;
        fVar293 = auVar170._8_4_;
        auVar36._8_4_ = fVar293 * 1.5;
        fVar210 = auVar170._12_4_;
        auVar36._12_4_ = fVar210 * 1.5;
        fVar212 = auVar170._16_4_;
        auVar36._16_4_ = fVar212 * 1.5;
        fVar214 = auVar170._20_4_;
        auVar36._20_4_ = fVar214 * 1.5;
        fVar216 = auVar170._24_4_;
        auVar36._24_4_ = fVar216 * 1.5;
        auVar36._28_4_ = fVar301;
        auVar170._4_4_ = fVar241 * fVar241 * fVar241 * auVar145._4_4_ * 0.5;
        auVar170._0_4_ = fVar207 * fVar207 * fVar207 * auVar145._0_4_ * 0.5;
        auVar170._8_4_ = fVar293 * fVar293 * fVar293 * auVar145._8_4_ * 0.5;
        auVar170._12_4_ = fVar210 * fVar210 * fVar210 * auVar145._12_4_ * 0.5;
        auVar170._16_4_ = fVar212 * fVar212 * fVar212 * auVar145._16_4_ * 0.5;
        auVar170._20_4_ = fVar214 * fVar214 * fVar214 * auVar145._20_4_ * 0.5;
        auVar170._24_4_ = fVar216 * fVar216 * fVar216 * auVar145._24_4_ * 0.5;
        auVar170._28_4_ = auVar145._28_4_;
        auVar170 = vsubps_avx(auVar36,auVar170);
        fVar207 = auVar170._0_4_;
        fVar241 = auVar170._4_4_;
        fVar293 = auVar170._8_4_;
        fVar210 = auVar170._12_4_;
        fVar212 = auVar170._16_4_;
        fVar214 = auVar170._20_4_;
        fVar216 = auVar170._24_4_;
        fVar137 = fVar134 * fVar137 * fVar154;
        fVar217 = fVar151 * fVar217 * fVar228;
        auVar38._4_4_ = fVar217;
        auVar38._0_4_ = fVar137;
        fVar242 = fStack_7b8 * fVar242 * fVar291;
        auVar38._8_4_ = fVar242;
        fVar294 = fStack_7b4 * fVar294 * fVar183;
        auVar38._12_4_ = fVar294;
        fVar264 = fStack_7b0 * fVar264 * fVar277;
        auVar38._16_4_ = fVar264;
        fVar265 = fStack_7ac * fVar265 * fVar280;
        auVar38._20_4_ = fVar265;
        fVar266 = fStack_7a8 * fVar266 * fVar282;
        auVar38._24_4_ = fVar266;
        auVar38._28_4_ = fVar267;
        local_600._4_4_ = auVar285._4_4_ + fVar217;
        local_600._0_4_ = auVar285._0_4_ + fVar137;
        fStack_5f8 = auVar285._8_4_ + fVar242;
        fStack_5f4 = auVar285._12_4_ + fVar294;
        fStack_5f0 = auVar285._16_4_ + fVar264;
        fStack_5ec = auVar285._20_4_ + fVar265;
        fStack_5e8 = auVar285._24_4_ + fVar266;
        fStack_5e4 = auVar285._28_4_ + fVar267;
        fVar137 = fVar134 * fVar154 * -fVar135;
        fVar217 = fVar151 * fVar228 * -fVar152;
        auVar39._4_4_ = fVar217;
        auVar39._0_4_ = fVar137;
        fVar242 = fStack_7b8 * fVar291 * -fVar155;
        auVar39._8_4_ = fVar242;
        fVar294 = fStack_7b4 * fVar183 * -fVar156;
        auVar39._12_4_ = fVar294;
        fVar264 = fStack_7b0 * fVar277 * -fVar157;
        auVar39._16_4_ = fVar264;
        fVar265 = fStack_7ac * fVar280 * -fVar136;
        auVar39._20_4_ = fVar265;
        fVar266 = fStack_7a8 * fVar282 * -fVar153;
        auVar39._24_4_ = fVar266;
        auVar39._28_4_ = fVar301;
        local_560._4_4_ = fVar217 + auVar310._4_4_;
        local_560._0_4_ = fVar137 + auVar310._0_4_;
        fStack_558 = fVar242 + auVar310._8_4_;
        fStack_554 = fVar294 + auVar310._12_4_;
        fStack_550 = fVar264 + auVar310._16_4_;
        fStack_54c = fVar265 + auVar310._20_4_;
        fStack_548 = fVar266 + auVar310._24_4_;
        fStack_544 = fVar301 + 0.0;
        fVar137 = fVar134 * fVar154 * 0.0;
        fVar154 = fVar151 * fVar228 * 0.0;
        auVar40._4_4_ = fVar154;
        auVar40._0_4_ = fVar137;
        fVar217 = fStack_7b8 * fVar291 * 0.0;
        auVar40._8_4_ = fVar217;
        fVar228 = fStack_7b4 * fVar183 * 0.0;
        auVar40._12_4_ = fVar228;
        fVar242 = fStack_7b0 * fVar277 * 0.0;
        auVar40._16_4_ = fVar242;
        fVar291 = fStack_7ac * fVar280 * 0.0;
        auVar40._20_4_ = fVar291;
        fVar294 = fStack_7a8 * fVar282 * 0.0;
        auVar40._24_4_ = fVar294;
        auVar40._28_4_ = fVar240;
        auVar114._4_4_ = fStack_53c;
        auVar114._0_4_ = local_540;
        auVar114._8_4_ = fStack_538;
        auVar114._12_4_ = fStack_534;
        auVar114._16_4_ = fStack_530;
        auVar114._20_4_ = fStack_52c;
        auVar114._24_4_ = fStack_528;
        auVar114._28_4_ = fStack_524;
        auVar248._0_4_ = local_540 + fVar137;
        auVar248._4_4_ = fStack_53c + fVar154;
        auVar248._8_4_ = fStack_538 + fVar217;
        auVar248._12_4_ = fStack_534 + fVar228;
        auVar248._16_4_ = fStack_530 + fVar242;
        auVar248._20_4_ = fStack_52c + fVar291;
        auVar248._24_4_ = fStack_528 + fVar294;
        auVar248._28_4_ = fStack_524 + fVar240;
        fVar137 = auVar273._0_4_ * fVar195 * fVar207;
        fVar154 = auVar273._4_4_ * fVar235 * fVar241;
        auVar41._4_4_ = fVar154;
        auVar41._0_4_ = fVar137;
        fVar195 = auVar273._8_4_ * fVar292 * fVar293;
        auVar41._8_4_ = fVar195;
        fVar217 = auVar273._12_4_ * fVar269 * fVar210;
        auVar41._12_4_ = fVar217;
        fVar228 = auVar273._16_4_ * fVar278 * fVar212;
        auVar41._16_4_ = fVar228;
        fVar235 = auVar273._20_4_ * fVar281 * fVar214;
        auVar41._20_4_ = fVar235;
        fVar240 = auVar273._24_4_ * fVar283 * fVar216;
        auVar41._24_4_ = fVar240;
        auVar41._28_4_ = auVar32._28_4_;
        auVar37 = vsubps_avx(auVar285,auVar38);
        auVar287._0_4_ = (float)local_380._0_4_ + fVar137;
        auVar287._4_4_ = (float)local_380._4_4_ + fVar154;
        auVar287._8_4_ = fStack_378 + fVar195;
        auVar287._12_4_ = fStack_374 + fVar217;
        auVar287._16_4_ = fStack_370 + fVar228;
        auVar287._20_4_ = fStack_36c + fVar235;
        auVar287._24_4_ = fStack_368 + fVar240;
        auVar287._28_4_ = register0x0000135c + auVar32._28_4_;
        fVar137 = auVar273._0_4_ * fVar207 * -fVar234;
        fVar154 = auVar273._4_4_ * fVar241 * -fVar194;
        auVar32._4_4_ = fVar154;
        auVar32._0_4_ = fVar137;
        fVar195 = auVar273._8_4_ * fVar293 * -fVar254;
        auVar32._8_4_ = fVar195;
        fVar217 = auVar273._12_4_ * fVar210 * -fVar172;
        auVar32._12_4_ = fVar217;
        fVar228 = auVar273._16_4_ * fVar212 * -fVar211;
        auVar32._16_4_ = fVar228;
        fVar235 = auVar273._20_4_ * fVar214 * -fVar213;
        auVar32._20_4_ = fVar235;
        fVar240 = auVar273._24_4_ * fVar216 * -fVar215;
        auVar32._24_4_ = fVar240;
        auVar32._28_4_ = fVar328;
        auVar21 = vsubps_avx(auVar310,auVar39);
        auVar297._0_4_ = fVar137 + auVar200._0_4_;
        auVar297._4_4_ = fVar154 + auVar200._4_4_;
        auVar297._8_4_ = fVar195 + auVar200._8_4_;
        auVar297._12_4_ = fVar217 + auVar200._12_4_;
        auVar297._16_4_ = fVar228 + auVar200._16_4_;
        auVar297._20_4_ = fVar235 + auVar200._20_4_;
        auVar297._24_4_ = fVar240 + auVar200._24_4_;
        auVar297._28_4_ = fVar328 + auVar200._28_4_;
        fVar137 = auVar273._0_4_ * fVar207 * 0.0;
        fVar154 = auVar273._4_4_ * fVar241 * 0.0;
        auVar42._4_4_ = fVar154;
        auVar42._0_4_ = fVar137;
        fVar195 = auVar273._8_4_ * fVar293 * 0.0;
        auVar42._8_4_ = fVar195;
        fVar207 = auVar273._12_4_ * fVar210 * 0.0;
        auVar42._12_4_ = fVar207;
        fVar217 = auVar273._16_4_ * fVar212 * 0.0;
        auVar42._16_4_ = fVar217;
        fVar228 = auVar273._20_4_ * fVar214 * 0.0;
        auVar42._20_4_ = fVar228;
        fVar235 = auVar273._24_4_ * fVar216 * 0.0;
        auVar42._24_4_ = fVar235;
        auVar42._28_4_ = 0x3f000000;
        auVar22 = vsubps_avx(auVar114,auVar40);
        auVar330._0_4_ = fVar137 + (float)local_360._0_4_;
        auVar330._4_4_ = fVar154 + (float)local_360._4_4_;
        auVar330._8_4_ = fVar195 + fStack_358;
        auVar330._12_4_ = fVar207 + fStack_354;
        auVar330._16_4_ = fVar217 + fStack_350;
        auVar330._20_4_ = fVar228 + fStack_34c;
        auVar330._24_4_ = fVar235 + fStack_348;
        auVar330._28_4_ = fStack_344 + 0.5;
        auVar170 = vsubps_avx(_local_380,auVar41);
        auVar23 = vsubps_avx(auVar200,auVar32);
        auVar201 = vsubps_avx(_local_360,auVar42);
        auVar33 = vsubps_avx(auVar297,auVar21);
        auVar32 = vsubps_avx(auVar330,auVar22);
        auVar43._4_4_ = auVar22._4_4_ * auVar33._4_4_;
        auVar43._0_4_ = auVar22._0_4_ * auVar33._0_4_;
        auVar43._8_4_ = auVar22._8_4_ * auVar33._8_4_;
        auVar43._12_4_ = auVar22._12_4_ * auVar33._12_4_;
        auVar43._16_4_ = auVar22._16_4_ * auVar33._16_4_;
        auVar43._20_4_ = auVar22._20_4_ * auVar33._20_4_;
        auVar43._24_4_ = auVar22._24_4_ * auVar33._24_4_;
        auVar43._28_4_ = fVar308;
        auVar44._4_4_ = auVar21._4_4_ * auVar32._4_4_;
        auVar44._0_4_ = auVar21._0_4_ * auVar32._0_4_;
        auVar44._8_4_ = auVar21._8_4_ * auVar32._8_4_;
        auVar44._12_4_ = auVar21._12_4_ * auVar32._12_4_;
        auVar44._16_4_ = auVar21._16_4_ * auVar32._16_4_;
        auVar44._20_4_ = auVar21._20_4_ * auVar32._20_4_;
        auVar44._24_4_ = auVar21._24_4_ * auVar32._24_4_;
        auVar44._28_4_ = fStack_344;
        auVar310 = vsubps_avx(auVar44,auVar43);
        auVar45._4_4_ = auVar37._4_4_ * auVar32._4_4_;
        auVar45._0_4_ = auVar37._0_4_ * auVar32._0_4_;
        auVar45._8_4_ = auVar37._8_4_ * auVar32._8_4_;
        auVar45._12_4_ = auVar37._12_4_ * auVar32._12_4_;
        auVar45._16_4_ = auVar37._16_4_ * auVar32._16_4_;
        auVar45._20_4_ = auVar37._20_4_ * auVar32._20_4_;
        auVar45._24_4_ = auVar37._24_4_ * auVar32._24_4_;
        auVar45._28_4_ = auVar32._28_4_;
        auVar34 = vsubps_avx(auVar287,auVar37);
        auVar46._4_4_ = auVar22._4_4_ * auVar34._4_4_;
        auVar46._0_4_ = auVar22._0_4_ * auVar34._0_4_;
        auVar46._8_4_ = auVar22._8_4_ * auVar34._8_4_;
        auVar46._12_4_ = auVar22._12_4_ * auVar34._12_4_;
        auVar46._16_4_ = auVar22._16_4_ * auVar34._16_4_;
        auVar46._20_4_ = auVar22._20_4_ * auVar34._20_4_;
        auVar46._24_4_ = auVar22._24_4_ * auVar34._24_4_;
        auVar46._28_4_ = auVar200._28_4_;
        auVar200 = vsubps_avx(auVar46,auVar45);
        auVar47._4_4_ = auVar34._4_4_ * auVar21._4_4_;
        auVar47._0_4_ = auVar34._0_4_ * auVar21._0_4_;
        auVar47._8_4_ = auVar34._8_4_ * auVar21._8_4_;
        auVar47._12_4_ = auVar34._12_4_ * auVar21._12_4_;
        auVar47._16_4_ = auVar34._16_4_ * auVar21._16_4_;
        auVar47._20_4_ = auVar34._20_4_ * auVar21._20_4_;
        auVar47._24_4_ = auVar34._24_4_ * auVar21._24_4_;
        auVar47._28_4_ = auVar32._28_4_;
        auVar48._4_4_ = auVar37._4_4_ * auVar33._4_4_;
        auVar48._0_4_ = auVar37._0_4_ * auVar33._0_4_;
        auVar48._8_4_ = auVar37._8_4_ * auVar33._8_4_;
        auVar48._12_4_ = auVar37._12_4_ * auVar33._12_4_;
        auVar48._16_4_ = auVar37._16_4_ * auVar33._16_4_;
        auVar48._20_4_ = auVar37._20_4_ * auVar33._20_4_;
        auVar48._24_4_ = auVar37._24_4_ * auVar33._24_4_;
        auVar48._28_4_ = auVar33._28_4_;
        auVar33 = vsubps_avx(auVar48,auVar47);
        auVar146._0_4_ = auVar310._0_4_ * 0.0 + auVar33._0_4_ + auVar200._0_4_ * 0.0;
        auVar146._4_4_ = auVar310._4_4_ * 0.0 + auVar33._4_4_ + auVar200._4_4_ * 0.0;
        auVar146._8_4_ = auVar310._8_4_ * 0.0 + auVar33._8_4_ + auVar200._8_4_ * 0.0;
        auVar146._12_4_ = auVar310._12_4_ * 0.0 + auVar33._12_4_ + auVar200._12_4_ * 0.0;
        auVar146._16_4_ = auVar310._16_4_ * 0.0 + auVar33._16_4_ + auVar200._16_4_ * 0.0;
        auVar146._20_4_ = auVar310._20_4_ * 0.0 + auVar33._20_4_ + auVar200._20_4_ * 0.0;
        auVar146._24_4_ = auVar310._24_4_ * 0.0 + auVar33._24_4_ + auVar200._24_4_ * 0.0;
        auVar146._28_4_ = auVar33._28_4_ + auVar33._28_4_ + auVar200._28_4_;
        auVar200 = vcmpps_avx(auVar146,ZEXT432(0) << 0x20,2);
        _local_520 = vblendvps_avx(auVar170,_local_600,auVar200);
        _local_5c0 = vblendvps_avx(auVar23,_local_560,auVar200);
        auVar170 = vblendvps_avx(auVar201,auVar248,auVar200);
        auVar23 = vblendvps_avx(auVar37,auVar287,auVar200);
        auVar33 = vblendvps_avx(auVar21,auVar297,auVar200);
        auVar32 = vblendvps_avx(auVar22,auVar330,auVar200);
        auVar37 = vblendvps_avx(auVar287,auVar37,auVar200);
        auVar21 = vblendvps_avx(auVar297,auVar21,auVar200);
        _local_500 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
        _auStack_4f0 = auVar285._16_16_;
        auVar22 = vblendvps_avx(auVar330,auVar22,auVar200);
        auVar37 = vsubps_avx(auVar37,_local_520);
        auVar285 = vsubps_avx(auVar21,_local_5c0);
        auVar22 = vsubps_avx(auVar22,auVar170);
        auVar310 = vsubps_avx(_local_5c0,auVar33);
        fVar137 = auVar285._0_4_;
        fVar136 = auVar170._0_4_;
        fVar228 = auVar285._4_4_;
        fVar153 = auVar170._4_4_;
        auVar49._4_4_ = fVar153 * fVar228;
        auVar49._0_4_ = fVar136 * fVar137;
        fVar291 = auVar285._8_4_;
        fVar234 = auVar170._8_4_;
        auVar49._8_4_ = fVar234 * fVar291;
        fVar269 = auVar285._12_4_;
        fVar194 = auVar170._12_4_;
        auVar49._12_4_ = fVar194 * fVar269;
        fVar212 = auVar285._16_4_;
        fVar254 = auVar170._16_4_;
        auVar49._16_4_ = fVar254 * fVar212;
        fVar266 = auVar285._20_4_;
        fVar172 = auVar170._20_4_;
        auVar49._20_4_ = fVar172 * fVar266;
        fVar135 = auVar285._24_4_;
        fVar211 = auVar170._24_4_;
        auVar49._24_4_ = fVar211 * fVar135;
        auVar49._28_4_ = auVar21._28_4_;
        fVar154 = local_5c0._0_4_;
        fVar180 = auVar22._0_4_;
        fVar235 = local_5c0._4_4_;
        fVar182 = auVar22._4_4_;
        auVar50._4_4_ = fVar182 * fVar235;
        auVar50._0_4_ = fVar180 * fVar154;
        fVar292 = local_5c0._8_4_;
        fVar184 = auVar22._8_4_;
        auVar50._8_4_ = fVar184 * fVar292;
        fVar210 = local_5c0._12_4_;
        fVar255 = auVar22._12_4_;
        auVar50._12_4_ = fVar255 * fVar210;
        fVar265 = local_5c0._16_4_;
        fVar177 = auVar22._16_4_;
        auVar50._16_4_ = fVar177 * fVar265;
        fVar282 = local_5c0._20_4_;
        fVar179 = auVar22._20_4_;
        auVar50._20_4_ = fVar179 * fVar282;
        fVar152 = local_5c0._24_4_;
        fVar181 = auVar22._24_4_;
        uVar12 = auVar201._28_4_;
        auVar50._24_4_ = fVar181 * fVar152;
        auVar50._28_4_ = uVar12;
        auVar21 = vsubps_avx(auVar50,auVar49);
        fVar195 = local_520._0_4_;
        fVar240 = local_520._4_4_;
        auVar51._4_4_ = fVar182 * fVar240;
        auVar51._0_4_ = fVar180 * fVar195;
        fVar293 = local_520._8_4_;
        auVar51._8_4_ = fVar184 * fVar293;
        fVar264 = local_520._12_4_;
        auVar51._12_4_ = fVar255 * fVar264;
        fVar280 = local_520._16_4_;
        auVar51._16_4_ = fVar177 * fVar280;
        fVar283 = local_520._20_4_;
        auVar51._20_4_ = fVar179 * fVar283;
        fVar155 = local_520._24_4_;
        auVar51._24_4_ = fVar181 * fVar155;
        auVar51._28_4_ = uVar12;
        fVar207 = auVar37._0_4_;
        fVar241 = auVar37._4_4_;
        auVar52._4_4_ = fVar153 * fVar241;
        auVar52._0_4_ = fVar136 * fVar207;
        fVar294 = auVar37._8_4_;
        auVar52._8_4_ = fVar234 * fVar294;
        fVar277 = auVar37._12_4_;
        auVar52._12_4_ = fVar194 * fVar277;
        fVar281 = auVar37._16_4_;
        auVar52._16_4_ = fVar254 * fVar281;
        fVar216 = auVar37._20_4_;
        auVar52._20_4_ = fVar172 * fVar216;
        fVar156 = auVar37._24_4_;
        auVar52._24_4_ = fVar211 * fVar156;
        auVar52._28_4_ = auVar330._28_4_;
        auVar201 = vsubps_avx(auVar52,auVar51);
        auVar53._4_4_ = fVar235 * fVar241;
        auVar53._0_4_ = fVar154 * fVar207;
        auVar53._8_4_ = fVar292 * fVar294;
        auVar53._12_4_ = fVar210 * fVar277;
        auVar53._16_4_ = fVar265 * fVar281;
        auVar53._20_4_ = fVar282 * fVar216;
        auVar53._24_4_ = fVar152 * fVar156;
        auVar53._28_4_ = uVar12;
        auVar337._0_4_ = fVar195 * fVar137;
        auVar337._4_4_ = fVar240 * fVar228;
        auVar337._8_4_ = fVar293 * fVar291;
        auVar337._12_4_ = fVar264 * fVar269;
        auVar337._16_4_ = fVar280 * fVar212;
        auVar337._20_4_ = fVar283 * fVar266;
        auVar337._24_4_ = fVar155 * fVar135;
        auVar337._28_4_ = 0;
        auVar34 = vsubps_avx(auVar337,auVar53);
        auVar35 = vsubps_avx(auVar170,auVar32);
        fVar217 = auVar34._28_4_ + auVar201._28_4_;
        auVar166._0_4_ = auVar34._0_4_ + auVar201._0_4_ * 0.0 + auVar21._0_4_ * 0.0;
        auVar166._4_4_ = auVar34._4_4_ + auVar201._4_4_ * 0.0 + auVar21._4_4_ * 0.0;
        auVar166._8_4_ = auVar34._8_4_ + auVar201._8_4_ * 0.0 + auVar21._8_4_ * 0.0;
        auVar166._12_4_ = auVar34._12_4_ + auVar201._12_4_ * 0.0 + auVar21._12_4_ * 0.0;
        auVar166._16_4_ = auVar34._16_4_ + auVar201._16_4_ * 0.0 + auVar21._16_4_ * 0.0;
        auVar166._20_4_ = auVar34._20_4_ + auVar201._20_4_ * 0.0 + auVar21._20_4_ * 0.0;
        auVar166._24_4_ = auVar34._24_4_ + auVar201._24_4_ * 0.0 + auVar21._24_4_ * 0.0;
        auVar166._28_4_ = fVar217 + auVar21._28_4_;
        auVar171 = ZEXT3264(auVar166);
        fVar213 = auVar310._0_4_;
        fVar215 = auVar310._4_4_;
        auVar54._4_4_ = fVar215 * auVar32._4_4_;
        auVar54._0_4_ = fVar213 * auVar32._0_4_;
        fVar267 = auVar310._8_4_;
        auVar54._8_4_ = fVar267 * auVar32._8_4_;
        fVar158 = auVar310._12_4_;
        auVar54._12_4_ = fVar158 * auVar32._12_4_;
        fVar174 = auVar310._16_4_;
        auVar54._16_4_ = fVar174 * auVar32._16_4_;
        fVar176 = auVar310._20_4_;
        auVar54._20_4_ = fVar176 * auVar32._20_4_;
        fVar178 = auVar310._24_4_;
        auVar54._24_4_ = fVar178 * auVar32._24_4_;
        auVar54._28_4_ = fVar217;
        fVar217 = auVar35._0_4_;
        fVar242 = auVar35._4_4_;
        auVar55._4_4_ = auVar33._4_4_ * fVar242;
        auVar55._0_4_ = auVar33._0_4_ * fVar217;
        fVar183 = auVar35._8_4_;
        auVar55._8_4_ = auVar33._8_4_ * fVar183;
        fVar278 = auVar35._12_4_;
        auVar55._12_4_ = auVar33._12_4_ * fVar278;
        fVar214 = auVar35._16_4_;
        auVar55._16_4_ = auVar33._16_4_ * fVar214;
        fVar301 = auVar35._20_4_;
        auVar55._20_4_ = auVar33._20_4_ * fVar301;
        fVar157 = auVar35._24_4_;
        auVar55._24_4_ = auVar33._24_4_ * fVar157;
        auVar55._28_4_ = auVar34._28_4_;
        auVar201 = vsubps_avx(auVar55,auVar54);
        auVar310 = vsubps_avx(_local_520,auVar23);
        fVar218 = auVar310._0_4_;
        fVar229 = auVar310._4_4_;
        auVar56._4_4_ = fVar229 * auVar32._4_4_;
        auVar56._0_4_ = fVar218 * auVar32._0_4_;
        fVar231 = auVar310._8_4_;
        auVar56._8_4_ = fVar231 * auVar32._8_4_;
        fVar233 = auVar310._12_4_;
        auVar56._12_4_ = fVar233 * auVar32._12_4_;
        fVar243 = auVar310._16_4_;
        auVar56._16_4_ = fVar243 * auVar32._16_4_;
        fVar251 = auVar310._20_4_;
        auVar56._20_4_ = fVar251 * auVar32._20_4_;
        fVar252 = auVar310._24_4_;
        auVar56._24_4_ = fVar252 * auVar32._24_4_;
        auVar56._28_4_ = auVar32._28_4_;
        auVar57._4_4_ = auVar23._4_4_ * fVar242;
        auVar57._0_4_ = auVar23._0_4_ * fVar217;
        auVar57._8_4_ = auVar23._8_4_ * fVar183;
        auVar57._12_4_ = auVar23._12_4_ * fVar278;
        auVar57._16_4_ = auVar23._16_4_ * fVar214;
        auVar57._20_4_ = auVar23._20_4_ * fVar301;
        auVar57._24_4_ = auVar23._24_4_ * fVar157;
        auVar57._28_4_ = auVar21._28_4_;
        auVar21 = vsubps_avx(auVar56,auVar57);
        auVar58._4_4_ = auVar33._4_4_ * fVar229;
        auVar58._0_4_ = auVar33._0_4_ * fVar218;
        auVar58._8_4_ = auVar33._8_4_ * fVar231;
        auVar58._12_4_ = auVar33._12_4_ * fVar233;
        auVar58._16_4_ = auVar33._16_4_ * fVar243;
        auVar58._20_4_ = auVar33._20_4_ * fVar251;
        auVar58._24_4_ = auVar33._24_4_ * fVar252;
        auVar58._28_4_ = auVar32._28_4_;
        auVar59._4_4_ = auVar23._4_4_ * fVar215;
        auVar59._0_4_ = auVar23._0_4_ * fVar213;
        auVar59._8_4_ = auVar23._8_4_ * fVar267;
        auVar59._12_4_ = auVar23._12_4_ * fVar158;
        auVar59._16_4_ = auVar23._16_4_ * fVar174;
        auVar59._20_4_ = auVar23._20_4_ * fVar176;
        auVar59._24_4_ = auVar23._24_4_ * fVar178;
        auVar59._28_4_ = auVar23._28_4_;
        auVar23 = vsubps_avx(auVar59,auVar58);
        auVar225._0_4_ = auVar201._0_4_ * 0.0 + auVar23._0_4_ + auVar21._0_4_ * 0.0;
        auVar225._4_4_ = auVar201._4_4_ * 0.0 + auVar23._4_4_ + auVar21._4_4_ * 0.0;
        auVar225._8_4_ = auVar201._8_4_ * 0.0 + auVar23._8_4_ + auVar21._8_4_ * 0.0;
        auVar225._12_4_ = auVar201._12_4_ * 0.0 + auVar23._12_4_ + auVar21._12_4_ * 0.0;
        auVar225._16_4_ = auVar201._16_4_ * 0.0 + auVar23._16_4_ + auVar21._16_4_ * 0.0;
        auVar225._20_4_ = auVar201._20_4_ * 0.0 + auVar23._20_4_ + auVar21._20_4_ * 0.0;
        auVar225._24_4_ = auVar201._24_4_ * 0.0 + auVar23._24_4_ + auVar21._24_4_ * 0.0;
        auVar225._28_4_ = auVar23._28_4_ + auVar23._28_4_ + auVar21._28_4_;
        auVar23 = vmaxps_avx(auVar166,auVar225);
        auVar23 = vcmpps_avx(auVar23,ZEXT832(0) << 0x20,2);
        auVar190 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
        auVar190 = vpand_avx(auVar190,_local_500);
        auVar223 = vpmovsxwd_avx(auVar190);
        auVar198 = vpunpckhwd_avx(auVar190,auVar190);
        auVar202._16_16_ = auVar198;
        auVar202._0_16_ = auVar223;
        if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar202 >> 0x7f,0) == '\0') &&
              (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar198 >> 0x3f,0) == '\0') &&
            (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar198[0xf]) {
LAB_00f75f15:
          auVar263 = ZEXT3264(CONCAT824(uStack_488,
                                        CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
          auVar331._4_4_ = fVar151;
          auVar331._0_4_ = fVar134;
          auVar331._8_4_ = fStack_7b8;
          auVar331._12_4_ = fStack_7b4;
          auVar331._16_4_ = fStack_7b0;
          auVar331._20_4_ = fStack_7ac;
          auVar331._24_4_ = fStack_7a8;
          auVar331._28_4_ = fStack_7a4;
        }
        else {
          auVar60._4_4_ = fVar242 * fVar228;
          auVar60._0_4_ = fVar217 * fVar137;
          auVar60._8_4_ = fVar183 * fVar291;
          auVar60._12_4_ = fVar278 * fVar269;
          auVar60._16_4_ = fVar214 * fVar212;
          auVar60._20_4_ = fVar301 * fVar266;
          auVar60._24_4_ = fVar157 * fVar135;
          auVar60._28_4_ = auVar198._12_4_;
          auVar311._0_4_ = fVar213 * fVar180;
          auVar311._4_4_ = fVar215 * fVar182;
          auVar311._8_4_ = fVar267 * fVar184;
          auVar311._12_4_ = fVar158 * fVar255;
          auVar311._16_4_ = fVar174 * fVar177;
          auVar311._20_4_ = fVar176 * fVar179;
          auVar311._24_4_ = fVar178 * fVar181;
          auVar311._28_4_ = 0;
          auVar33 = vsubps_avx(auVar311,auVar60);
          auVar61._4_4_ = fVar229 * fVar182;
          auVar61._0_4_ = fVar218 * fVar180;
          auVar61._8_4_ = fVar231 * fVar184;
          auVar61._12_4_ = fVar233 * fVar255;
          auVar61._16_4_ = fVar243 * fVar177;
          auVar61._20_4_ = fVar251 * fVar179;
          auVar61._24_4_ = fVar252 * fVar181;
          auVar61._28_4_ = auVar22._28_4_;
          auVar62._4_4_ = fVar242 * fVar241;
          auVar62._0_4_ = fVar217 * fVar207;
          auVar62._8_4_ = fVar183 * fVar294;
          auVar62._12_4_ = fVar278 * fVar277;
          auVar62._16_4_ = fVar214 * fVar281;
          auVar62._20_4_ = fVar301 * fVar216;
          auVar62._24_4_ = fVar157 * fVar156;
          auVar62._28_4_ = auVar35._28_4_;
          auVar32 = vsubps_avx(auVar62,auVar61);
          auVar63._4_4_ = fVar215 * fVar241;
          auVar63._0_4_ = fVar213 * fVar207;
          auVar63._8_4_ = fVar267 * fVar294;
          auVar63._12_4_ = fVar158 * fVar277;
          auVar63._16_4_ = fVar174 * fVar281;
          auVar63._20_4_ = fVar176 * fVar216;
          auVar63._24_4_ = fVar178 * fVar156;
          auVar63._28_4_ = auVar166._28_4_;
          auVar64._4_4_ = fVar229 * fVar228;
          auVar64._0_4_ = fVar218 * fVar137;
          auVar64._8_4_ = fVar231 * fVar291;
          auVar64._12_4_ = fVar233 * fVar269;
          auVar64._16_4_ = fVar243 * fVar212;
          auVar64._20_4_ = fVar251 * fVar266;
          auVar64._24_4_ = fVar252 * fVar135;
          auVar64._28_4_ = auVar285._28_4_;
          auVar21 = vsubps_avx(auVar64,auVar63);
          auVar262._0_4_ = auVar33._0_4_ * 0.0 + auVar21._0_4_ + auVar32._0_4_ * 0.0;
          auVar262._4_4_ = auVar33._4_4_ * 0.0 + auVar21._4_4_ + auVar32._4_4_ * 0.0;
          auVar262._8_4_ = auVar33._8_4_ * 0.0 + auVar21._8_4_ + auVar32._8_4_ * 0.0;
          auVar262._12_4_ = auVar33._12_4_ * 0.0 + auVar21._12_4_ + auVar32._12_4_ * 0.0;
          auVar262._16_4_ = auVar33._16_4_ * 0.0 + auVar21._16_4_ + auVar32._16_4_ * 0.0;
          auVar262._20_4_ = auVar33._20_4_ * 0.0 + auVar21._20_4_ + auVar32._20_4_ * 0.0;
          auVar262._24_4_ = auVar33._24_4_ * 0.0 + auVar21._24_4_ + auVar32._24_4_ * 0.0;
          auVar262._28_4_ = auVar285._28_4_ + auVar21._28_4_ + auVar166._28_4_;
          auVar23 = vrcpps_avx(auVar262);
          fVar207 = auVar23._0_4_;
          fVar217 = auVar23._4_4_;
          auVar65._4_4_ = auVar262._4_4_ * fVar217;
          auVar65._0_4_ = auVar262._0_4_ * fVar207;
          fVar228 = auVar23._8_4_;
          auVar65._8_4_ = auVar262._8_4_ * fVar228;
          fVar241 = auVar23._12_4_;
          auVar65._12_4_ = auVar262._12_4_ * fVar241;
          fVar242 = auVar23._16_4_;
          auVar65._16_4_ = auVar262._16_4_ * fVar242;
          fVar291 = auVar23._20_4_;
          auVar65._20_4_ = auVar262._20_4_ * fVar291;
          fVar294 = auVar23._24_4_;
          auVar65._24_4_ = auVar262._24_4_ * fVar294;
          auVar65._28_4_ = auVar35._28_4_;
          auVar312._8_4_ = 0x3f800000;
          auVar312._0_8_ = 0x3f8000003f800000;
          auVar312._12_4_ = 0x3f800000;
          auVar312._16_4_ = 0x3f800000;
          auVar312._20_4_ = 0x3f800000;
          auVar312._24_4_ = 0x3f800000;
          auVar312._28_4_ = 0x3f800000;
          auVar22 = vsubps_avx(auVar312,auVar65);
          fVar207 = auVar22._0_4_ * fVar207 + fVar207;
          fVar217 = auVar22._4_4_ * fVar217 + fVar217;
          fVar228 = auVar22._8_4_ * fVar228 + fVar228;
          fVar241 = auVar22._12_4_ * fVar241 + fVar241;
          fVar242 = auVar22._16_4_ * fVar242 + fVar242;
          fVar291 = auVar22._20_4_ * fVar291 + fVar291;
          fVar294 = auVar22._24_4_ * fVar294 + fVar294;
          fVar183 = auVar22._28_4_ + auVar23._28_4_;
          auVar171 = ZEXT3264(CONCAT428(fVar183,CONCAT424(fVar294,CONCAT420(fVar291,CONCAT416(
                                                  fVar242,CONCAT412(fVar241,CONCAT48(fVar228,
                                                  CONCAT44(fVar217,fVar207))))))));
          auVar66._4_4_ =
               (auVar33._4_4_ * fVar240 + auVar32._4_4_ * fVar235 + auVar21._4_4_ * fVar153) *
               fVar217;
          auVar66._0_4_ =
               (auVar33._0_4_ * fVar195 + auVar32._0_4_ * fVar154 + auVar21._0_4_ * fVar136) *
               fVar207;
          auVar66._8_4_ =
               (auVar33._8_4_ * fVar293 + auVar32._8_4_ * fVar292 + auVar21._8_4_ * fVar234) *
               fVar228;
          auVar66._12_4_ =
               (auVar33._12_4_ * fVar264 + auVar32._12_4_ * fVar210 + auVar21._12_4_ * fVar194) *
               fVar241;
          auVar66._16_4_ =
               (auVar33._16_4_ * fVar280 + auVar32._16_4_ * fVar265 + auVar21._16_4_ * fVar254) *
               fVar242;
          auVar66._20_4_ =
               (auVar33._20_4_ * fVar283 + auVar32._20_4_ * fVar282 + auVar21._20_4_ * fVar172) *
               fVar291;
          auVar66._24_4_ =
               (auVar33._24_4_ * fVar155 + auVar32._24_4_ * fVar152 + auVar21._24_4_ * fVar211) *
               fVar294;
          auVar66._28_4_ = local_520._28_4_ + auVar37._28_4_ + auVar170._28_4_;
          auVar223 = vpermilps_avx((undefined1  [16])aVar13,0xff);
          auVar203._16_16_ = auVar223;
          auVar203._0_16_ = auVar223;
          auVar170 = vcmpps_avx(auVar203,auVar66,2);
          fVar137 = ray->tfar;
          auVar237._4_4_ = fVar137;
          auVar237._0_4_ = fVar137;
          auVar237._8_4_ = fVar137;
          auVar237._12_4_ = fVar137;
          auVar237._16_4_ = fVar137;
          auVar237._20_4_ = fVar137;
          auVar237._24_4_ = fVar137;
          auVar237._28_4_ = fVar137;
          auVar23 = vcmpps_avx(auVar66,auVar237,2);
          auVar170 = vandps_avx(auVar23,auVar170);
          auVar223 = vpackssdw_avx(auVar170._0_16_,auVar170._16_16_);
          auVar190 = vpand_avx(auVar190,auVar223);
          auVar223 = vpmovsxwd_avx(auVar190);
          auVar198 = vpshufd_avx(auVar190,0xee);
          auVar198 = vpmovsxwd_avx(auVar198);
          auVar204._16_16_ = auVar198;
          auVar204._0_16_ = auVar223;
          if ((((((((auVar204 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar204 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar204 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar204 >> 0x7f,0) == '\0') &&
                (auVar204 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar198 >> 0x3f,0) == '\0') &&
              (auVar204 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar198[0xf]) goto LAB_00f75f15;
          auVar170 = vcmpps_avx(ZEXT832(0) << 0x20,auVar262,4);
          auVar223 = vpackssdw_avx(auVar170._0_16_,auVar170._16_16_);
          auVar190 = vpand_avx(auVar190,auVar223);
          auVar223 = vpmovsxwd_avx(auVar190);
          auVar190 = vpunpckhwd_avx(auVar190,auVar190);
          auVar249._16_16_ = auVar190;
          auVar249._0_16_ = auVar223;
          auVar263 = ZEXT3264(CONCAT824(uStack_488,
                                        CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
          auVar331._4_4_ = fVar151;
          auVar331._0_4_ = fVar134;
          auVar331._8_4_ = fStack_7b8;
          auVar331._12_4_ = fStack_7b4;
          auVar331._16_4_ = fStack_7b0;
          auVar331._20_4_ = fStack_7ac;
          auVar331._24_4_ = fStack_7a8;
          auVar331._28_4_ = fStack_7a4;
          if ((((((((auVar249 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar249 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar249 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar249 >> 0x7f,0) != '\0') ||
                (auVar249 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar190 >> 0x3f,0) != '\0') ||
              (auVar249 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar190[0xf] < '\0') {
            auVar205._0_4_ = auVar166._0_4_ * fVar207;
            auVar205._4_4_ = auVar166._4_4_ * fVar217;
            auVar205._8_4_ = auVar166._8_4_ * fVar228;
            auVar205._12_4_ = auVar166._12_4_ * fVar241;
            auVar205._16_4_ = auVar166._16_4_ * fVar242;
            auVar205._20_4_ = auVar166._20_4_ * fVar291;
            auVar205._24_4_ = auVar166._24_4_ * fVar294;
            auVar205._28_4_ = 0;
            auVar67._4_4_ = auVar225._4_4_ * fVar217;
            auVar67._0_4_ = auVar225._0_4_ * fVar207;
            auVar67._8_4_ = auVar225._8_4_ * fVar228;
            auVar67._12_4_ = auVar225._12_4_ * fVar241;
            auVar67._16_4_ = auVar225._16_4_ * fVar242;
            auVar67._20_4_ = auVar225._20_4_ * fVar291;
            auVar67._24_4_ = auVar225._24_4_ * fVar294;
            auVar67._28_4_ = fVar183;
            auVar238._8_4_ = 0x3f800000;
            auVar238._0_8_ = 0x3f8000003f800000;
            auVar238._12_4_ = 0x3f800000;
            auVar238._16_4_ = 0x3f800000;
            auVar238._20_4_ = 0x3f800000;
            auVar238._24_4_ = 0x3f800000;
            auVar238._28_4_ = 0x3f800000;
            auVar170 = vsubps_avx(auVar238,auVar205);
            local_4c0 = vblendvps_avx(auVar170,auVar205,auVar200);
            auVar170 = vsubps_avx(auVar238,auVar67);
            _local_3a0 = vblendvps_avx(auVar170,auVar67,auVar200);
            auVar171 = ZEXT3264(_local_3a0);
            auVar263 = ZEXT3264(auVar249);
            local_4e0 = auVar66;
          }
        }
        auVar206 = ZEXT1664(auVar343);
        auVar322 = ZEXT3264(local_740);
        auVar170 = auVar263._0_32_;
        if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar170 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar170 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar170 >> 0x7f,0) != '\0') ||
              (auVar263 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar170 >> 0xbf,0) != '\0') ||
            (auVar263 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar263[0x1f] < '\0') {
          auVar23 = vsubps_avx(auVar273,auVar331);
          fVar154 = auVar331._0_4_ + local_4c0._0_4_ * auVar23._0_4_;
          fVar195 = auVar331._4_4_ + local_4c0._4_4_ * auVar23._4_4_;
          fVar207 = auVar331._8_4_ + local_4c0._8_4_ * auVar23._8_4_;
          fVar217 = auVar331._12_4_ + local_4c0._12_4_ * auVar23._12_4_;
          fVar228 = auVar331._16_4_ + local_4c0._16_4_ * auVar23._16_4_;
          fVar235 = auVar331._20_4_ + local_4c0._20_4_ * auVar23._20_4_;
          fVar240 = auVar331._24_4_ + local_4c0._24_4_ * auVar23._24_4_;
          fVar241 = auVar331._28_4_ + auVar23._28_4_;
          fVar137 = local_768->depth_scale;
          auVar171 = ZEXT3264(CONCAT428(fVar137,CONCAT424(fVar137,CONCAT420(fVar137,CONCAT416(
                                                  fVar137,CONCAT412(fVar137,CONCAT48(fVar137,
                                                  CONCAT44(fVar137,fVar137))))))));
          auVar68._4_4_ = (fVar195 + fVar195) * fVar137;
          auVar68._0_4_ = (fVar154 + fVar154) * fVar137;
          auVar68._8_4_ = (fVar207 + fVar207) * fVar137;
          auVar68._12_4_ = (fVar217 + fVar217) * fVar137;
          auVar68._16_4_ = (fVar228 + fVar228) * fVar137;
          auVar68._20_4_ = (fVar235 + fVar235) * fVar137;
          auVar68._24_4_ = (fVar240 + fVar240) * fVar137;
          auVar68._28_4_ = fVar241 + fVar241;
          auVar23 = vcmpps_avx(local_4e0,auVar68,6);
          auVar33 = auVar170 & auVar23;
          if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar33 >> 0x7f,0) != '\0') ||
                (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar33 >> 0xbf,0) != '\0') ||
              (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar33[0x1f] < '\0') {
            local_1e0 = vandps_avx(auVar23,auVar170);
            local_3a0._0_4_ = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
            local_3a0._4_4_ = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
            fStack_398 = fStack_398 + fStack_398 + -1.0;
            fStack_394 = fStack_394 + fStack_394 + -1.0;
            fStack_390 = fStack_390 + fStack_390 + -1.0;
            fStack_38c = fStack_38c + fStack_38c + -1.0;
            fStack_388 = fStack_388 + fStack_388 + -1.0;
            fStack_384 = fStack_384 + fStack_384 + -1.0;
            local_2a0 = local_4c0;
            local_280._4_4_ = local_3a0._4_4_;
            local_280._0_4_ = local_3a0._0_4_;
            fStack_278 = fStack_398;
            fStack_274 = fStack_394;
            fStack_270 = fStack_390;
            fStack_26c = fStack_38c;
            fStack_268 = fStack_388;
            fStack_264 = fStack_384;
            local_260 = local_4e0;
            local_240 = 0;
            local_23c = uVar128;
            local_230 = local_650;
            uStack_228 = uStack_648;
            local_220 = local_580;
            uStack_218 = uStack_578;
            local_210 = local_590;
            uStack_208 = uStack_588;
            auVar171 = ZEXT1664(_local_570);
            local_200 = _local_570;
            if ((pGVar15->mask & ray->mask) != 0) {
              auVar263 = ZEXT3264(_local_760);
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar133 = true, _local_650 = auVar26, _local_590 = auVar25, _local_580 = auVar27,
                 pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar188._0_4_ = 1.0 / (float)(int)uVar128;
                auVar188._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar343 = vshufps_avx(auVar188,auVar188,0);
                local_1c0[0] = auVar343._0_4_ * (local_4c0._0_4_ + 0.0);
                local_1c0[1] = auVar343._4_4_ * (local_4c0._4_4_ + 1.0);
                local_1c0[2] = auVar343._8_4_ * (local_4c0._8_4_ + 2.0);
                local_1c0[3] = auVar343._12_4_ * (local_4c0._12_4_ + 3.0);
                fStack_1b0 = auVar343._0_4_ * (local_4c0._16_4_ + 4.0);
                fStack_1ac = auVar343._4_4_ * (local_4c0._20_4_ + 5.0);
                fStack_1a8 = auVar343._8_4_ * (local_4c0._24_4_ + 6.0);
                fStack_1a4 = local_4c0._28_4_ + 7.0;
                auVar171 = ZEXT3264(_local_3a0);
                local_1a0 = _local_3a0;
                local_180 = local_4e0;
                uStack_7bc = (undefined4)((ulong)context->args >> 0x20);
                local_7c0 = vmovmskps_avx(local_1e0);
                uVar126 = CONCAT44(uStack_7bc,local_7c0);
                uVar130 = 0;
                if (uVar126 != 0) {
                  for (; (uVar126 >> uVar130 & 1) == 0; uVar130 = uVar130 + 1) {
                  }
                }
                if (local_7c0 == 0) {
                  bVar133 = false;
                  _local_650 = auVar26;
                  _local_590 = auVar25;
                  _local_580 = auVar27;
                }
                else {
                  stack0xfffffffffffff964 = auVar273._4_28_;
                  local_6a0._0_4_ = ray->tfar;
                  _local_650 = auVar26;
                  _local_590 = auVar25;
                  _local_580 = auVar27;
                  _local_320 = auVar28;
                  do {
                    local_634 = local_1c0[uVar130];
                    local_630 = *(uint *)(local_1a0 + uVar130 * 4);
                    auVar171 = ZEXT464(local_630);
                    ray->tfar = *(float *)(local_180 + uVar130 * 4);
                    local_6d0.context = context->user;
                    fVar154 = 1.0 - local_634;
                    fVar137 = local_634 * fVar154 + local_634 * fVar154;
                    auVar343 = ZEXT416((uint)(local_634 * local_634 * 3.0));
                    auVar343 = vshufps_avx(auVar343,auVar343,0);
                    auVar190 = ZEXT416((uint)((fVar137 - local_634 * local_634) * 3.0));
                    auVar190 = vshufps_avx(auVar190,auVar190,0);
                    auVar223 = ZEXT416((uint)((fVar154 * fVar154 - fVar137) * 3.0));
                    auVar223 = vshufps_avx(auVar223,auVar223,0);
                    auVar198 = ZEXT416((uint)(fVar154 * fVar154 * -3.0));
                    auVar198 = vshufps_avx(auVar198,auVar198,0);
                    auVar189._0_4_ =
                         auVar198._0_4_ * (float)local_650._0_4_ +
                         auVar223._0_4_ * (float)local_580._0_4_ +
                         auVar343._0_4_ * (float)local_570._0_4_ +
                         auVar190._0_4_ * (float)local_590._0_4_;
                    auVar189._4_4_ =
                         auVar198._4_4_ * (float)local_650._4_4_ +
                         auVar223._4_4_ * (float)local_580._4_4_ +
                         auVar343._4_4_ * (float)local_570._4_4_ +
                         auVar190._4_4_ * (float)local_590._4_4_;
                    auVar189._8_4_ =
                         auVar198._8_4_ * (float)uStack_648 +
                         auVar223._8_4_ * (float)uStack_578 +
                         auVar343._8_4_ * fStack_568 + auVar190._8_4_ * (float)uStack_588;
                    auVar189._12_4_ =
                         auVar198._12_4_ * uStack_648._4_4_ +
                         auVar223._12_4_ * uStack_578._4_4_ +
                         auVar343._12_4_ * fStack_564 + auVar190._12_4_ * uStack_588._4_4_;
                    local_640 = vmovlps_avx(auVar189);
                    local_638 = vextractps_avx(auVar189,2);
                    local_62c = (int)local_608;
                    local_628 = (int)local_770;
                    local_624 = (local_6d0.context)->instID[0];
                    local_620 = (local_6d0.context)->instPrimID[0];
                    local_7cc = -1;
                    local_6d0.valid = &local_7cc;
                    local_6d0.geometryUserPtr = pGVar15->userPtr;
                    local_6d0.ray = (RTCRayN *)ray;
                    local_6d0.hit = (RTCHitN *)&local_640;
                    local_6d0.N = 1;
                    if (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f75087:
                      p_Var19 = context->args->filter;
                      if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var19)(&local_6d0);
                        auVar171._8_56_ = extraout_var_02;
                        auVar171._0_8_ = extraout_XMM1_Qa_00;
                        if (*local_6d0.valid == 0) goto LAB_00f750c9;
                      }
                      bVar133 = true;
                      auVar322 = ZEXT3264(local_740);
                      auVar263 = ZEXT3264(_local_760);
                      auVar206 = ZEXT1664(local_7a0._0_16_);
                      fVar268 = (float)local_700._0_4_;
                      fVar275 = (float)local_700._4_4_;
                      fVar276 = fStack_6f8;
                      fVar279 = fStack_6f4;
                      fVar173 = fStack_6f0;
                      fVar175 = fStack_6ec;
                      fVar208 = fStack_6e8;
                      fVar304 = (float)local_720._0_4_;
                      fVar306 = (float)local_720._4_4_;
                      fVar307 = fStack_718;
                      fVar308 = fStack_714;
                      fVar209 = fStack_710;
                      fVar230 = fStack_70c;
                      fVar232 = fStack_708;
                      break;
                    }
                    (*pGVar15->occlusionFilterN)(&local_6d0);
                    auVar171._8_56_ = extraout_var_01;
                    auVar171._0_8_ = extraout_XMM1_Qa;
                    if (*local_6d0.valid != 0) goto LAB_00f75087;
LAB_00f750c9:
                    ray->tfar = (float)local_6a0._0_4_;
                    uVar126 = CONCAT44(uStack_7bc,local_7c0) ^ 1L << (uVar130 & 0x3f);
                    uVar130 = 0;
                    if (uVar126 != 0) {
                      for (; (uVar126 >> uVar130 & 1) == 0; uVar130 = uVar130 + 1) {
                      }
                    }
                    bVar133 = false;
                    local_7c0 = (uint)uVar126;
                    uStack_7bc = (undefined4)(uVar126 >> 0x20);
                    auVar322 = ZEXT3264(local_740);
                    auVar263 = ZEXT3264(_local_760);
                    auVar206 = ZEXT1664(local_7a0._0_16_);
                    fVar268 = (float)local_700._0_4_;
                    fVar275 = (float)local_700._4_4_;
                    fVar276 = fStack_6f8;
                    fVar279 = fStack_6f4;
                    fVar173 = fStack_6f0;
                    fVar175 = fStack_6ec;
                    fVar208 = fStack_6e8;
                    fVar304 = (float)local_720._0_4_;
                    fVar306 = (float)local_720._4_4_;
                    fVar307 = fStack_718;
                    fVar308 = fStack_714;
                    fVar209 = fStack_710;
                    fVar230 = fStack_70c;
                    fVar232 = fStack_708;
                  } while (uVar126 != 0);
                }
              }
              goto LAB_00f74d69;
            }
          }
        }
        bVar133 = false;
        auVar263 = ZEXT3264(_local_760);
        _local_650 = auVar26;
        _local_590 = auVar25;
        _local_580 = auVar27;
      }
LAB_00f74d69:
      if (8 < (int)uVar128) {
        _local_320 = vpshufd_avx(ZEXT416(uVar128),0);
        auVar343 = vshufps_avx(auVar206._0_16_,auVar206._0_16_,0);
        local_340._16_16_ = auVar343;
        local_340._0_16_ = auVar343;
        auVar343 = vpermilps_avx(local_480._0_16_,0xff);
        register0x00001210 = auVar343;
        _local_360 = auVar343;
        auVar143._0_4_ = 1.0 / (float)local_3e0._0_4_;
        auVar143._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar343 = vshufps_avx(auVar143,auVar143,0);
        register0x00001210 = auVar343;
        _local_380 = auVar343;
        auVar150 = ZEXT3264(_local_380);
        lVar131 = 8;
        do {
          pauVar10 = (undefined1 (*) [28])(bezier_basis0 + lVar131 * 4 + lVar20);
          fVar137 = *(float *)*pauVar10;
          fVar154 = *(float *)(*pauVar10 + 4);
          fVar195 = *(float *)(*pauVar10 + 8);
          fVar207 = *(float *)(*pauVar10 + 0xc);
          fVar217 = *(float *)(*pauVar10 + 0x10);
          fVar228 = *(float *)(*pauVar10 + 0x14);
          fVar235 = *(float *)(*pauVar10 + 0x18);
          auVar120 = *pauVar10;
          pauVar11 = (undefined1 (*) [28])(lVar20 + 0x21aa768 + lVar131 * 4);
          fVar240 = *(float *)*pauVar11;
          fVar241 = *(float *)(*pauVar11 + 4);
          fVar242 = *(float *)(*pauVar11 + 8);
          fVar291 = *(float *)(*pauVar11 + 0xc);
          fVar292 = *(float *)(*pauVar11 + 0x10);
          fVar293 = *(float *)(*pauVar11 + 0x14);
          fVar294 = *(float *)(*pauVar11 + 0x18);
          auVar119 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar20 + 0x21aabec + lVar131 * 4);
          fVar183 = *(float *)*pauVar11;
          fVar269 = *(float *)(*pauVar11 + 4);
          fVar210 = *(float *)(*pauVar11 + 8);
          fVar264 = *(float *)(*pauVar11 + 0xc);
          fVar277 = *(float *)(*pauVar11 + 0x10);
          fVar278 = *(float *)(*pauVar11 + 0x14);
          fVar212 = *(float *)(*pauVar11 + 0x18);
          auVar117 = *pauVar11;
          pfVar1 = (float *)(lVar20 + 0x21ab070 + lVar131 * 4);
          fVar265 = *pfVar1;
          fVar280 = pfVar1[1];
          fVar281 = pfVar1[2];
          fVar214 = pfVar1[3];
          fVar266 = pfVar1[4];
          fVar282 = pfVar1[5];
          fVar283 = pfVar1[6];
          fVar211 = auVar322._0_4_;
          fVar213 = auVar322._4_4_;
          fVar215 = auVar322._8_4_;
          fVar267 = auVar322._12_4_;
          fVar134 = auVar322._16_4_;
          fVar151 = auVar322._20_4_;
          fVar158 = auVar322._24_4_;
          fVar216 = auVar206._28_4_;
          fStack_7a4 = fVar216 + fVar216 + auVar150._28_4_;
          auVar288._0_4_ =
               (float)local_c0._0_4_ * fVar137 +
               (float)local_420._0_4_ * fVar240 +
               fVar211 * fVar183 + (float)local_400._0_4_ * fVar265;
          auVar288._4_4_ =
               (float)local_c0._4_4_ * fVar154 +
               (float)local_420._4_4_ * fVar241 +
               fVar213 * fVar269 + (float)local_400._4_4_ * fVar280;
          auVar288._8_4_ =
               fStack_b8 * fVar195 + fStack_418 * fVar242 + fVar215 * fVar210 + fStack_3f8 * fVar281
          ;
          auVar288._12_4_ =
               fStack_b4 * fVar207 + fStack_414 * fVar291 + fVar267 * fVar264 + fStack_3f4 * fVar214
          ;
          auVar288._16_4_ =
               fStack_b0 * fVar217 + fStack_410 * fVar292 + fVar134 * fVar277 + fStack_3f0 * fVar266
          ;
          auVar288._20_4_ =
               fStack_ac * fVar228 + fStack_40c * fVar293 + fVar151 * fVar278 + fStack_3ec * fVar282
          ;
          auVar288._24_4_ =
               fStack_a8 * fVar235 + fStack_408 * fVar294 + fVar158 * fVar212 + fStack_3e8 * fVar283
          ;
          auVar288._28_4_ = fVar216 + pfVar1[7] + fStack_7a4;
          local_7a0._0_4_ =
               (float)local_a0._0_4_ * fVar137 +
               fVar304 * fVar240 + fVar268 * fVar183 + auVar263._0_4_ * fVar265;
          local_7a0._4_4_ =
               (float)local_a0._4_4_ * fVar154 +
               fVar306 * fVar241 + fVar275 * fVar269 + auVar263._4_4_ * fVar280;
          local_7a0._8_4_ =
               fStack_98 * fVar195 +
               fVar307 * fVar242 + fVar276 * fVar210 + auVar263._8_4_ * fVar281;
          local_7a0._12_4_ =
               fStack_94 * fVar207 +
               fVar308 * fVar291 + fVar279 * fVar264 + auVar263._12_4_ * fVar214;
          local_7a0._16_4_ =
               fStack_90 * fVar217 +
               fVar209 * fVar292 + fVar173 * fVar277 + auVar263._16_4_ * fVar266;
          local_7a0._20_4_ =
               fStack_8c * fVar228 +
               fVar230 * fVar293 + fVar175 * fVar278 + auVar263._20_4_ * fVar282;
          local_7a0._24_4_ =
               fStack_88 * fVar235 +
               fVar232 * fVar294 + fVar208 * fVar212 + auVar263._24_4_ * fVar283;
          local_7a0._28_4_ = fStack_7a4 + fVar216 + fVar216 + auVar171._28_4_;
          auVar206 = ZEXT3264(local_7a0._0_32_);
          fVar136 = fVar137 * (float)local_120._0_4_ +
                    fVar240 * (float)local_100._0_4_ +
                    (float)local_80._0_4_ * fVar183 + fVar265 * (float)local_e0._0_4_;
          fVar153 = fVar154 * (float)local_120._4_4_ +
                    fVar241 * (float)local_100._4_4_ +
                    (float)local_80._4_4_ * fVar269 + fVar280 * (float)local_e0._4_4_;
          fStack_7b8 = fVar195 * fStack_118 +
                       fVar242 * fStack_f8 + fStack_78 * fVar210 + fVar281 * fStack_d8;
          fStack_7b4 = fVar207 * fStack_114 +
                       fVar291 * fStack_f4 + fStack_74 * fVar264 + fVar214 * fStack_d4;
          fStack_7b0 = fVar217 * fStack_110 +
                       fVar292 * fStack_f0 + fStack_70 * fVar277 + fVar266 * fStack_d0;
          fStack_7ac = fVar228 * fStack_10c +
                       fVar293 * fStack_ec + fStack_6c * fVar278 + fVar282 * fStack_cc;
          fStack_7a8 = fVar235 * fStack_108 +
                       fVar294 * fStack_e8 + fStack_68 * fVar212 + fVar283 * fStack_c8;
          fStack_7a4 = fStack_7a4 + fVar216 + fVar216 + pfVar1[7];
          pauVar11 = (undefined1 (*) [28])(bezier_basis1 + lVar131 * 4 + lVar20);
          fVar137 = *(float *)*pauVar11;
          fVar154 = *(float *)(*pauVar11 + 4);
          fVar195 = *(float *)(*pauVar11 + 8);
          fVar207 = *(float *)(*pauVar11 + 0xc);
          fVar217 = *(float *)(*pauVar11 + 0x10);
          fVar228 = *(float *)(*pauVar11 + 0x14);
          fVar235 = *(float *)(*pauVar11 + 0x18);
          auVar123 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar20 + 0x21acb88 + lVar131 * 4);
          fVar240 = *(float *)*pauVar11;
          fVar241 = *(float *)(*pauVar11 + 4);
          fVar242 = *(float *)(*pauVar11 + 8);
          fVar291 = *(float *)(*pauVar11 + 0xc);
          fVar292 = *(float *)(*pauVar11 + 0x10);
          fVar293 = *(float *)(*pauVar11 + 0x14);
          fVar294 = *(float *)(*pauVar11 + 0x18);
          auVar122 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar20 + 0x21ad00c + lVar131 * 4);
          fVar183 = *(float *)*pauVar11;
          fVar269 = *(float *)(*pauVar11 + 4);
          fVar210 = *(float *)(*pauVar11 + 8);
          fVar264 = *(float *)(*pauVar11 + 0xc);
          fVar277 = *(float *)(*pauVar11 + 0x10);
          fVar278 = *(float *)(*pauVar11 + 0x14);
          fVar212 = *(float *)(*pauVar11 + 0x18);
          auVar121 = *pauVar11;
          pfVar1 = (float *)(lVar20 + 0x21ad490 + lVar131 * 4);
          fVar216 = *pfVar1;
          fVar301 = pfVar1[1];
          fVar135 = pfVar1[2];
          fVar152 = pfVar1[3];
          fVar155 = pfVar1[4];
          fVar156 = pfVar1[5];
          fVar157 = pfVar1[6];
          fVar172 = auVar263._28_4_;
          fVar254 = fVar172 + pfVar1[7];
          fVar234 = fVar172 + fVar172 + fStack_3e4;
          fVar194 = fVar172 + fVar172 + *(float *)pauVar10[1];
          auVar338._0_4_ =
               (float)local_c0._0_4_ * fVar137 +
               (float)local_420._0_4_ * fVar240 +
               fVar211 * fVar183 + (float)local_400._0_4_ * fVar216;
          auVar338._4_4_ =
               (float)local_c0._4_4_ * fVar154 +
               (float)local_420._4_4_ * fVar241 +
               fVar213 * fVar269 + (float)local_400._4_4_ * fVar301;
          auVar338._8_4_ =
               fStack_b8 * fVar195 + fStack_418 * fVar242 + fVar215 * fVar210 + fStack_3f8 * fVar135
          ;
          auVar338._12_4_ =
               fStack_b4 * fVar207 + fStack_414 * fVar291 + fVar267 * fVar264 + fStack_3f4 * fVar152
          ;
          auVar338._16_4_ =
               fStack_b0 * fVar217 + fStack_410 * fVar292 + fVar134 * fVar277 + fStack_3f0 * fVar155
          ;
          auVar338._20_4_ =
               fStack_ac * fVar228 + fStack_40c * fVar293 + fVar151 * fVar278 + fStack_3ec * fVar156
          ;
          auVar338._24_4_ =
               fStack_a8 * fVar235 + fStack_408 * fVar294 + fVar158 * fVar212 + fStack_3e8 * fVar157
          ;
          auVar338._28_4_ = fVar254 + fVar234;
          local_480._0_4_ =
               fVar137 * (float)local_a0._0_4_ +
               fVar304 * fVar240 + fVar268 * fVar183 + auVar263._0_4_ * fVar216;
          local_480._4_4_ =
               fVar154 * (float)local_a0._4_4_ +
               fVar306 * fVar241 + fVar275 * fVar269 + auVar263._4_4_ * fVar301;
          local_480._8_4_ =
               fVar195 * fStack_98 +
               fVar307 * fVar242 + fVar276 * fVar210 + auVar263._8_4_ * fVar135;
          local_480._12_4_ =
               fVar207 * fStack_94 +
               fVar308 * fVar291 + fVar279 * fVar264 + auVar263._12_4_ * fVar152;
          local_480._16_4_ =
               fVar217 * fStack_90 +
               fVar209 * fVar292 + fVar173 * fVar277 + auVar263._16_4_ * fVar155;
          local_480._20_4_ =
               fVar228 * fStack_8c +
               fVar230 * fVar293 + fVar175 * fVar278 + auVar263._20_4_ * fVar156;
          local_480._24_4_ =
               fVar235 * fStack_88 +
               fVar232 * fVar294 + fVar208 * fVar212 + auVar263._24_4_ * fVar157;
          local_480._28_4_ = fVar234 + fVar194;
          auVar319._0_4_ =
               fVar240 * (float)local_100._0_4_ +
               (float)local_80._0_4_ * fVar183 + fVar216 * (float)local_e0._0_4_ +
               fVar137 * (float)local_120._0_4_;
          auVar319._4_4_ =
               fVar241 * (float)local_100._4_4_ +
               (float)local_80._4_4_ * fVar269 + fVar301 * (float)local_e0._4_4_ +
               fVar154 * (float)local_120._4_4_;
          auVar319._8_4_ =
               fVar242 * fStack_f8 + fStack_78 * fVar210 + fVar135 * fStack_d8 +
               fVar195 * fStack_118;
          auVar319._12_4_ =
               fVar291 * fStack_f4 + fStack_74 * fVar264 + fVar152 * fStack_d4 +
               fVar207 * fStack_114;
          auVar319._16_4_ =
               fVar292 * fStack_f0 + fStack_70 * fVar277 + fVar155 * fStack_d0 +
               fVar217 * fStack_110;
          auVar319._20_4_ =
               fVar293 * fStack_ec + fStack_6c * fVar278 + fVar156 * fStack_cc +
               fVar228 * fStack_10c;
          auVar319._24_4_ =
               fVar294 * fStack_e8 + fStack_68 * fVar212 + fVar157 * fStack_c8 +
               fVar235 * fStack_108;
          auVar319._28_4_ = fVar172 + fVar254 + fVar234;
          auVar23 = vsubps_avx(auVar338,auVar288);
          auVar33 = vsubps_avx(local_480,local_7a0._0_32_);
          fVar209 = auVar23._0_4_;
          fVar217 = auVar23._4_4_;
          auVar69._4_4_ = fVar217 * local_7a0._4_4_;
          auVar69._0_4_ = fVar209 * local_7a0._0_4_;
          fVar228 = auVar23._8_4_;
          auVar69._8_4_ = fVar228 * local_7a0._8_4_;
          fVar230 = auVar23._12_4_;
          auVar69._12_4_ = fVar230 * local_7a0._12_4_;
          fVar232 = auVar23._16_4_;
          auVar69._16_4_ = fVar232 * local_7a0._16_4_;
          fVar235 = auVar23._20_4_;
          auVar69._20_4_ = fVar235 * local_7a0._20_4_;
          fVar240 = auVar23._24_4_;
          auVar69._24_4_ = fVar240 * local_7a0._24_4_;
          auVar69._28_4_ = fVar234;
          fVar137 = auVar33._0_4_;
          fVar154 = auVar33._4_4_;
          auVar70._4_4_ = auVar288._4_4_ * fVar154;
          auVar70._0_4_ = auVar288._0_4_ * fVar137;
          fVar173 = auVar33._8_4_;
          auVar70._8_4_ = auVar288._8_4_ * fVar173;
          fVar175 = auVar33._12_4_;
          auVar70._12_4_ = auVar288._12_4_ * fVar175;
          fVar195 = auVar33._16_4_;
          auVar70._16_4_ = auVar288._16_4_ * fVar195;
          fVar207 = auVar33._20_4_;
          auVar70._20_4_ = auVar288._20_4_ * fVar207;
          fVar208 = auVar33._24_4_;
          auVar70._24_4_ = auVar288._24_4_ * fVar208;
          auVar70._28_4_ = fVar194;
          auVar32 = vsubps_avx(auVar69,auVar70);
          auVar112._4_4_ = fVar153;
          auVar112._0_4_ = fVar136;
          auVar112._8_4_ = fStack_7b8;
          auVar112._12_4_ = fStack_7b4;
          auVar112._16_4_ = fStack_7b0;
          auVar112._20_4_ = fStack_7ac;
          auVar112._24_4_ = fStack_7a8;
          auVar112._28_4_ = fStack_7a4;
          auVar150 = ZEXT3264(auVar112);
          auVar170 = vmaxps_avx(auVar112,auVar319);
          auVar71._4_4_ = auVar170._4_4_ * auVar170._4_4_ * (fVar217 * fVar217 + fVar154 * fVar154);
          auVar71._0_4_ = auVar170._0_4_ * auVar170._0_4_ * (fVar209 * fVar209 + fVar137 * fVar137);
          auVar71._8_4_ = auVar170._8_4_ * auVar170._8_4_ * (fVar228 * fVar228 + fVar173 * fVar173);
          auVar71._12_4_ =
               auVar170._12_4_ * auVar170._12_4_ * (fVar230 * fVar230 + fVar175 * fVar175);
          auVar71._16_4_ =
               auVar170._16_4_ * auVar170._16_4_ * (fVar232 * fVar232 + fVar195 * fVar195);
          auVar71._20_4_ =
               auVar170._20_4_ * auVar170._20_4_ * (fVar235 * fVar235 + fVar207 * fVar207);
          auVar71._24_4_ =
               auVar170._24_4_ * auVar170._24_4_ * (fVar240 * fVar240 + fVar208 * fVar208);
          auVar71._28_4_ = fVar254 + fVar194;
          auVar72._4_4_ = auVar32._4_4_ * auVar32._4_4_;
          auVar72._0_4_ = auVar32._0_4_ * auVar32._0_4_;
          auVar72._8_4_ = auVar32._8_4_ * auVar32._8_4_;
          auVar72._12_4_ = auVar32._12_4_ * auVar32._12_4_;
          auVar72._16_4_ = auVar32._16_4_ * auVar32._16_4_;
          auVar72._20_4_ = auVar32._20_4_ * auVar32._20_4_;
          auVar72._24_4_ = auVar32._24_4_ * auVar32._24_4_;
          auVar72._28_4_ = auVar32._28_4_;
          auVar170 = vcmpps_avx(auVar72,auVar71,2);
          auVar171 = ZEXT3264(auVar170);
          local_240 = (uint)lVar131;
          auVar190 = vpshufd_avx(ZEXT416(local_240),0);
          auVar343 = vpor_avx(auVar190,_DAT_01f7fcf0);
          auVar190 = vpor_avx(auVar190,_DAT_01fafea0);
          auVar343 = vpcmpgtd_avx(_local_320,auVar343);
          auVar190 = vpcmpgtd_avx(_local_320,auVar190);
          auVar193._16_16_ = auVar190;
          auVar193._0_16_ = auVar343;
          auVar32 = auVar193 & auVar170;
          fVar268 = (float)local_700._0_4_;
          fVar275 = (float)local_700._4_4_;
          fVar276 = fStack_6f8;
          fVar279 = fStack_6f4;
          fVar173 = fStack_6f0;
          fVar175 = fStack_6ec;
          fVar208 = fStack_6e8;
          fVar304 = (float)local_720._0_4_;
          fVar306 = (float)local_720._4_4_;
          fVar307 = fStack_718;
          fVar308 = fStack_714;
          fVar209 = fStack_710;
          fVar230 = fStack_70c;
          fVar232 = fStack_708;
          if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar32 >> 0x7f,0) == '\0') &&
                (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar32 >> 0xbf,0) == '\0') &&
              (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar32[0x1f]) {
            auVar322 = ZEXT3264(auVar322._0_32_);
            auVar263 = ZEXT3264(_local_760);
          }
          else {
            local_600._0_4_ = auVar123._0_4_;
            local_600._4_4_ = auVar123._4_4_;
            fStack_5f8 = auVar123._8_4_;
            fStack_5f4 = auVar123._12_4_;
            fStack_5f0 = auVar123._16_4_;
            fStack_5ec = auVar123._20_4_;
            fStack_5e8 = auVar123._24_4_;
            local_460 = (float)local_680._0_4_ * (float)local_600._0_4_;
            fStack_45c = (float)local_680._4_4_ * (float)local_600._4_4_;
            fStack_458 = fStack_678 * fStack_5f8;
            fStack_454 = fStack_674 * fStack_5f4;
            fStack_450 = fStack_670 * fStack_5f0;
            fStack_44c = fStack_66c * fStack_5ec;
            fStack_448 = fStack_668 * fStack_5e8;
            local_560._0_4_ = auVar122._0_4_;
            local_560._4_4_ = auVar122._4_4_;
            fStack_558 = auVar122._8_4_;
            fStack_554 = auVar122._12_4_;
            fStack_550 = auVar122._16_4_;
            fStack_54c = auVar122._20_4_;
            fStack_548 = auVar122._24_4_;
            fVar240 = (float)local_2e0._0_4_ * (float)local_560._0_4_;
            fVar241 = (float)local_2e0._4_4_ * (float)local_560._4_4_;
            fVar242 = fStack_2d8 * fStack_558;
            fVar291 = fStack_2d4 * fStack_554;
            fVar292 = fStack_2d0 * fStack_550;
            fVar293 = fStack_2cc * fStack_54c;
            fVar294 = fStack_2c8 * fStack_548;
            _local_560 = auVar193;
            local_440._0_4_ = auVar121._0_4_;
            local_440._4_4_ = auVar121._4_4_;
            fStack_438 = auVar121._8_4_;
            fStack_434 = auVar121._12_4_;
            fStack_430 = auVar121._16_4_;
            fStack_42c = auVar121._20_4_;
            fStack_428 = auVar121._24_4_;
            fVar137 = (float)local_300._0_4_ * (float)local_440._0_4_;
            fVar154 = (float)local_300._4_4_ * (float)local_440._4_4_;
            fVar195 = fStack_2f8 * fStack_438;
            fVar207 = fStack_2f4 * fStack_434;
            fVar217 = fStack_2f0 * fStack_430;
            fVar228 = fStack_2ec * fStack_42c;
            fVar235 = fStack_2e8 * fStack_428;
            _local_600 = auVar319;
            _local_440 = auVar170;
            local_460 = local_460 + fVar240 + fVar137 + (float)local_5e0._0_4_ * fVar216;
            fStack_45c = fStack_45c + fVar241 + fVar154 + (float)local_5e0._4_4_ * fVar301;
            fStack_458 = fStack_458 + fVar242 + fVar195 + fStack_5d8 * fVar135;
            fStack_454 = fStack_454 + fVar291 + fVar207 + fStack_5d4 * fVar152;
            fStack_450 = fStack_450 + fVar292 + fVar217 + fStack_5d0 * fVar155;
            fStack_44c = fStack_44c + fVar293 + fVar228 + fStack_5cc * fVar156;
            fStack_448 = fStack_448 + fVar294 + fVar235 + fStack_5c8 * fVar157;
            fStack_444 = auVar288._28_4_ + fStack_664 + auVar170._28_4_ + 0.0;
            local_5c0._0_4_ = auVar119._0_4_;
            local_5c0._4_4_ = auVar119._4_4_;
            fStack_5b8 = auVar119._8_4_;
            fStack_5b4 = auVar119._12_4_;
            fStack_5b0 = auVar119._16_4_;
            fStack_5ac = auVar119._20_4_;
            fStack_5a8 = auVar119._24_4_;
            local_520._0_4_ = auVar117._0_4_;
            local_520._4_4_ = auVar117._4_4_;
            fStack_518 = auVar117._8_4_;
            fStack_514 = auVar117._12_4_;
            fStack_510 = auVar117._16_4_;
            fStack_50c = auVar117._20_4_;
            fStack_508 = auVar117._24_4_;
            fVar254 = (float)local_300._0_4_ * (float)local_520._0_4_;
            fVar172 = (float)local_300._4_4_ * (float)local_520._4_4_;
            fVar174 = fStack_2f8 * fStack_518;
            fVar176 = fStack_2f4 * fStack_514;
            fVar178 = fStack_2f0 * fStack_510;
            fVar180 = fStack_2ec * fStack_50c;
            fVar182 = fStack_2e8 * fStack_508;
            pfVar1 = (float *)(lVar20 + 0x21abdfc + lVar131 * 4);
            fVar137 = *pfVar1;
            fVar195 = pfVar1[1];
            fVar207 = pfVar1[2];
            fVar217 = pfVar1[3];
            fVar228 = pfVar1[4];
            fVar235 = pfVar1[5];
            fVar240 = pfVar1[6];
            pfVar2 = (float *)(lVar20 + 0x21ac280 + lVar131 * 4);
            fVar241 = *pfVar2;
            fVar242 = pfVar2[1];
            fVar291 = pfVar2[2];
            fVar292 = pfVar2[3];
            fVar293 = pfVar2[4];
            fVar294 = pfVar2[5];
            fVar183 = pfVar2[6];
            _local_520 = auVar338;
            local_3e0 = auVar33;
            fVar154 = auVar322._28_4_;
            pfVar3 = (float *)(lVar20 + 0x21ab978 + lVar131 * 4);
            fVar269 = *pfVar3;
            fVar210 = pfVar3[1];
            fVar264 = pfVar3[2];
            fVar277 = pfVar3[3];
            fVar278 = pfVar3[4];
            fVar212 = pfVar3[5];
            fVar216 = pfVar3[6];
            fVar194 = pfVar1[7] + pfVar2[7];
            fVar184 = pfVar2[7] + fVar154 + 0.0;
            fVar255 = fVar154 + auVar319._28_4_ + fVar154 + 0.0;
            pfVar1 = (float *)(lVar20 + 0x21ab4f4 + lVar131 * 4);
            fVar301 = *pfVar1;
            fVar135 = pfVar1[1];
            fVar152 = pfVar1[2];
            fVar155 = pfVar1[3];
            fVar156 = pfVar1[4];
            fVar157 = pfVar1[5];
            fVar234 = pfVar1[6];
            local_540 = (float)local_c0._0_4_ * fVar301 +
                        fVar269 * (float)local_420._0_4_ +
                        fVar211 * fVar137 + (float)local_400._0_4_ * fVar241;
            fStack_53c = (float)local_c0._4_4_ * fVar135 +
                         fVar210 * (float)local_420._4_4_ +
                         fVar213 * fVar195 + (float)local_400._4_4_ * fVar242;
            fStack_538 = fStack_b8 * fVar152 +
                         fVar264 * fStack_418 + fVar215 * fVar207 + fStack_3f8 * fVar291;
            fStack_534 = fStack_b4 * fVar155 +
                         fVar277 * fStack_414 + fVar267 * fVar217 + fStack_3f4 * fVar292;
            fStack_530 = fStack_b0 * fVar156 +
                         fVar278 * fStack_410 + fVar134 * fVar228 + fStack_3f0 * fVar293;
            fStack_52c = fStack_ac * fVar157 +
                         fVar212 * fStack_40c + fVar151 * fVar235 + fStack_3ec * fVar294;
            fStack_528 = fStack_a8 * fVar234 +
                         fVar216 * fStack_408 + fVar158 * fVar240 + fStack_3e8 * fVar183;
            fStack_524 = fVar194 + fVar184;
            auVar167._0_4_ =
                 (float)local_a0._0_4_ * fVar301 +
                 (float)local_700._0_4_ * fVar137 + (float)local_760._0_4_ * fVar241 +
                 fVar269 * (float)local_720._0_4_;
            auVar167._4_4_ =
                 (float)local_a0._4_4_ * fVar135 +
                 (float)local_700._4_4_ * fVar195 + (float)local_760._4_4_ * fVar242 +
                 fVar210 * (float)local_720._4_4_;
            auVar167._8_4_ =
                 fStack_98 * fVar152 +
                 fStack_6f8 * fVar207 + fStack_758 * fVar291 + fVar264 * fStack_718;
            auVar167._12_4_ =
                 fStack_94 * fVar155 +
                 fStack_6f4 * fVar217 + fStack_754 * fVar292 + fVar277 * fStack_714;
            auVar167._16_4_ =
                 fStack_90 * fVar156 +
                 fStack_6f0 * fVar228 + fStack_750 * fVar293 + fVar278 * fStack_710;
            auVar167._20_4_ =
                 fStack_8c * fVar157 +
                 fStack_6ec * fVar235 + fStack_74c * fVar294 + fVar212 * fStack_70c;
            auVar167._24_4_ =
                 fStack_88 * fVar234 +
                 fStack_6e8 * fVar240 + fStack_748 * fVar183 + fVar216 * fStack_708;
            auVar167._28_4_ = fVar184 + fVar255;
            auVar320._0_4_ =
                 fVar269 * (float)local_2e0._0_4_ +
                 (float)local_300._0_4_ * fVar137 + (float)local_5e0._0_4_ * fVar241 +
                 fVar301 * (float)local_680._0_4_;
            auVar320._4_4_ =
                 fVar210 * (float)local_2e0._4_4_ +
                 (float)local_300._4_4_ * fVar195 + (float)local_5e0._4_4_ * fVar242 +
                 fVar135 * (float)local_680._4_4_;
            auVar320._8_4_ =
                 fVar264 * fStack_2d8 + fStack_2f8 * fVar207 + fStack_5d8 * fVar291 +
                 fVar152 * fStack_678;
            auVar320._12_4_ =
                 fVar277 * fStack_2d4 + fStack_2f4 * fVar217 + fStack_5d4 * fVar292 +
                 fVar155 * fStack_674;
            auVar320._16_4_ =
                 fVar278 * fStack_2d0 + fStack_2f0 * fVar228 + fStack_5d0 * fVar293 +
                 fVar156 * fStack_670;
            auVar320._20_4_ =
                 fVar212 * fStack_2cc + fStack_2ec * fVar235 + fStack_5cc * fVar294 +
                 fVar157 * fStack_66c;
            auVar320._24_4_ =
                 fVar216 * fStack_2c8 + fStack_2e8 * fVar240 + fStack_5c8 * fVar183 +
                 fVar234 * fStack_668;
            auVar320._28_4_ = pfVar3[7] + fVar194 + fVar255;
            pfVar1 = (float *)(lVar20 + 0x21ae21c + lVar131 * 4);
            fVar137 = *pfVar1;
            fVar195 = pfVar1[1];
            fVar207 = pfVar1[2];
            fVar217 = pfVar1[3];
            fVar228 = pfVar1[4];
            fVar235 = pfVar1[5];
            fVar240 = pfVar1[6];
            pfVar2 = (float *)(lVar20 + 0x21ae6a0 + lVar131 * 4);
            fVar241 = *pfVar2;
            fVar242 = pfVar2[1];
            fVar291 = pfVar2[2];
            fVar292 = pfVar2[3];
            fVar293 = pfVar2[4];
            fVar294 = pfVar2[5];
            fVar183 = pfVar2[6];
            pfVar3 = (float *)(lVar20 + 0x21add98 + lVar131 * 4);
            fVar269 = *pfVar3;
            fVar210 = pfVar3[1];
            fVar264 = pfVar3[2];
            fVar277 = pfVar3[3];
            fVar278 = pfVar3[4];
            fVar212 = pfVar3[5];
            fVar216 = pfVar3[6];
            pfVar4 = (float *)(lVar20 + 0x21ad914 + lVar131 * 4);
            fVar301 = *pfVar4;
            fVar135 = pfVar4[1];
            fVar152 = pfVar4[2];
            fVar155 = pfVar4[3];
            fVar156 = pfVar4[4];
            fVar157 = pfVar4[5];
            fVar234 = pfVar4[6];
            auVar289._0_4_ =
                 fVar301 * (float)local_c0._0_4_ +
                 fVar269 * (float)local_420._0_4_ +
                 fVar211 * fVar137 + fVar241 * (float)local_400._0_4_;
            auVar289._4_4_ =
                 fVar135 * (float)local_c0._4_4_ +
                 fVar210 * (float)local_420._4_4_ +
                 fVar213 * fVar195 + fVar242 * (float)local_400._4_4_;
            auVar289._8_4_ =
                 fVar152 * fStack_b8 +
                 fVar264 * fStack_418 + fVar215 * fVar207 + fVar291 * fStack_3f8;
            auVar289._12_4_ =
                 fVar155 * fStack_b4 +
                 fVar277 * fStack_414 + fVar267 * fVar217 + fVar292 * fStack_3f4;
            auVar289._16_4_ =
                 fVar156 * fStack_b0 +
                 fVar278 * fStack_410 + fVar134 * fVar228 + fVar293 * fStack_3f0;
            auVar289._20_4_ =
                 fVar157 * fStack_ac +
                 fVar212 * fStack_40c + fVar151 * fVar235 + fVar294 * fStack_3ec;
            auVar289._24_4_ =
                 fVar234 * fStack_a8 +
                 fVar216 * fStack_408 + fVar158 * fVar240 + fVar183 * fStack_3e8;
            auVar289._28_4_ = fStack_744 + fStack_744 + auVar288._28_4_ + fStack_3e4;
            auVar313._0_4_ =
                 (float)local_a0._0_4_ * fVar301 +
                 fVar269 * (float)local_720._0_4_ +
                 (float)local_700._0_4_ * fVar137 + (float)local_760._0_4_ * fVar241;
            auVar313._4_4_ =
                 (float)local_a0._4_4_ * fVar135 +
                 fVar210 * (float)local_720._4_4_ +
                 (float)local_700._4_4_ * fVar195 + (float)local_760._4_4_ * fVar242;
            auVar313._8_4_ =
                 fStack_98 * fVar152 +
                 fVar264 * fStack_718 + fStack_6f8 * fVar207 + fStack_758 * fVar291;
            auVar313._12_4_ =
                 fStack_94 * fVar155 +
                 fVar277 * fStack_714 + fStack_6f4 * fVar217 + fStack_754 * fVar292;
            auVar313._16_4_ =
                 fStack_90 * fVar156 +
                 fVar278 * fStack_710 + fStack_6f0 * fVar228 + fStack_750 * fVar293;
            auVar313._20_4_ =
                 fStack_8c * fVar157 +
                 fVar212 * fStack_70c + fStack_6ec * fVar235 + fStack_74c * fVar294;
            auVar313._24_4_ =
                 fStack_88 * fVar234 +
                 fVar216 * fStack_708 + fStack_6e8 * fVar240 + fStack_748 * fVar183;
            auVar313._28_4_ = fStack_744 + fStack_744 + fStack_a4 + fStack_744;
            auVar239._8_4_ = 0x7fffffff;
            auVar239._0_8_ = 0x7fffffff7fffffff;
            auVar239._12_4_ = 0x7fffffff;
            auVar239._16_4_ = 0x7fffffff;
            auVar239._20_4_ = 0x7fffffff;
            auVar239._24_4_ = 0x7fffffff;
            auVar239._28_4_ = 0x7fffffff;
            auVar115._4_4_ = fStack_53c;
            auVar115._0_4_ = local_540;
            auVar115._8_4_ = fStack_538;
            auVar115._12_4_ = fStack_534;
            auVar115._16_4_ = fStack_530;
            auVar115._20_4_ = fStack_52c;
            auVar115._24_4_ = fStack_528;
            auVar115._28_4_ = fStack_524;
            auVar32 = vandps_avx(auVar115,auVar239);
            auVar37 = vandps_avx(auVar167,auVar239);
            auVar37 = vmaxps_avx(auVar32,auVar37);
            auVar32 = vandps_avx(auVar320,auVar239);
            auVar37 = vmaxps_avx(auVar37,auVar32);
            auVar37 = vcmpps_avx(auVar37,local_340,1);
            auVar21 = vblendvps_avx(auVar115,auVar23,auVar37);
            auVar147._0_4_ =
                 fVar301 * (float)local_680._0_4_ +
                 fVar269 * (float)local_2e0._0_4_ +
                 fVar241 * (float)local_5e0._0_4_ + (float)local_300._0_4_ * fVar137;
            auVar147._4_4_ =
                 fVar135 * (float)local_680._4_4_ +
                 fVar210 * (float)local_2e0._4_4_ +
                 fVar242 * (float)local_5e0._4_4_ + (float)local_300._4_4_ * fVar195;
            auVar147._8_4_ =
                 fVar152 * fStack_678 +
                 fVar264 * fStack_2d8 + fVar291 * fStack_5d8 + fStack_2f8 * fVar207;
            auVar147._12_4_ =
                 fVar155 * fStack_674 +
                 fVar277 * fStack_2d4 + fVar292 * fStack_5d4 + fStack_2f4 * fVar217;
            auVar147._16_4_ =
                 fVar156 * fStack_670 +
                 fVar278 * fStack_2d0 + fVar293 * fStack_5d0 + fStack_2f0 * fVar228;
            auVar147._20_4_ =
                 fVar157 * fStack_66c +
                 fVar212 * fStack_2cc + fVar294 * fStack_5cc + fStack_2ec * fVar235;
            auVar147._24_4_ =
                 fVar234 * fStack_668 +
                 fVar216 * fStack_2c8 + fVar183 * fStack_5c8 + fStack_2e8 * fVar240;
            auVar147._28_4_ = auVar32._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar22 = vblendvps_avx(auVar167,auVar33,auVar37);
            auVar32 = vandps_avx(auVar289,auVar239);
            auVar37 = vandps_avx(auVar313,auVar239);
            auVar200 = vmaxps_avx(auVar32,auVar37);
            auVar32 = vandps_avx(auVar147,auVar239);
            auVar32 = vmaxps_avx(auVar200,auVar32);
            local_500._0_4_ = auVar120._0_4_;
            local_500._4_4_ = auVar120._4_4_;
            fStack_4f8 = auVar120._8_4_;
            fStack_4f4 = auVar120._12_4_;
            auStack_4f0._0_4_ = auVar120._16_4_;
            auStack_4f0._4_4_ = auVar120._20_4_;
            fStack_4e8 = auVar120._24_4_;
            auVar37 = vcmpps_avx(auVar32,local_340,1);
            auVar32 = vblendvps_avx(auVar289,auVar23,auVar37);
            auVar148._0_4_ =
                 (float)local_680._0_4_ * (float)local_500._0_4_ +
                 (float)local_2e0._0_4_ * (float)local_5c0._0_4_ +
                 fVar254 + (float)local_5e0._0_4_ * fVar265;
            auVar148._4_4_ =
                 (float)local_680._4_4_ * (float)local_500._4_4_ +
                 (float)local_2e0._4_4_ * (float)local_5c0._4_4_ +
                 fVar172 + (float)local_5e0._4_4_ * fVar280;
            auVar148._8_4_ =
                 fStack_678 * fStack_4f8 + fStack_2d8 * fStack_5b8 + fVar174 + fStack_5d8 * fVar281;
            auVar148._12_4_ =
                 fStack_674 * fStack_4f4 + fStack_2d4 * fStack_5b4 + fVar176 + fStack_5d4 * fVar214;
            auVar148._16_4_ =
                 fStack_670 * (float)auStack_4f0._0_4_ +
                 fStack_2d0 * fStack_5b0 + fVar178 + fStack_5d0 * fVar266;
            auVar148._20_4_ =
                 fStack_66c * (float)auStack_4f0._4_4_ +
                 fStack_2cc * fStack_5ac + fVar180 + fStack_5cc * fVar282;
            auVar148._24_4_ =
                 fStack_668 * fStack_4e8 + fStack_2c8 * fStack_5a8 + fVar182 + fStack_5c8 * fVar283;
            auVar148._28_4_ = auVar200._28_4_ + fStack_444 + auVar170._28_4_ + 0.0;
            auVar33 = vblendvps_avx(auVar313,auVar33,auVar37);
            fVar234 = auVar21._0_4_;
            fVar194 = auVar21._4_4_;
            fVar254 = auVar21._8_4_;
            fVar172 = auVar21._12_4_;
            fVar211 = auVar21._16_4_;
            fVar213 = auVar21._20_4_;
            fVar215 = auVar21._24_4_;
            fVar267 = auVar21._28_4_;
            fVar183 = auVar32._0_4_;
            fVar210 = auVar32._4_4_;
            fVar277 = auVar32._8_4_;
            fVar212 = auVar32._12_4_;
            fVar280 = auVar32._16_4_;
            fVar214 = auVar32._20_4_;
            fVar282 = auVar32._24_4_;
            fVar137 = auVar22._0_4_;
            fVar195 = auVar22._4_4_;
            fVar217 = auVar22._8_4_;
            fVar235 = auVar22._12_4_;
            fVar241 = auVar22._16_4_;
            fVar291 = auVar22._20_4_;
            fVar293 = auVar22._24_4_;
            auVar298._0_4_ = fVar137 * fVar137 + fVar234 * fVar234;
            auVar298._4_4_ = fVar195 * fVar195 + fVar194 * fVar194;
            auVar298._8_4_ = fVar217 * fVar217 + fVar254 * fVar254;
            auVar298._12_4_ = fVar235 * fVar235 + fVar172 * fVar172;
            auVar298._16_4_ = fVar241 * fVar241 + fVar211 * fVar211;
            auVar298._20_4_ = fVar291 * fVar291 + fVar213 * fVar213;
            auVar298._24_4_ = fVar293 * fVar293 + fVar215 * fVar215;
            auVar298._28_4_ = auVar23._28_4_ + fVar154;
            auVar23 = vrsqrtps_avx(auVar298);
            fVar154 = auVar23._0_4_;
            fVar207 = auVar23._4_4_;
            auVar73._4_4_ = fVar207 * 1.5;
            auVar73._0_4_ = fVar154 * 1.5;
            fVar228 = auVar23._8_4_;
            auVar73._8_4_ = fVar228 * 1.5;
            fVar240 = auVar23._12_4_;
            auVar73._12_4_ = fVar240 * 1.5;
            fVar242 = auVar23._16_4_;
            auVar73._16_4_ = fVar242 * 1.5;
            fVar292 = auVar23._20_4_;
            auVar73._20_4_ = fVar292 * 1.5;
            fVar294 = auVar23._24_4_;
            auVar73._24_4_ = fVar294 * 1.5;
            auVar73._28_4_ = auVar313._28_4_;
            auVar74._4_4_ = fVar207 * fVar207 * fVar207 * auVar298._4_4_ * 0.5;
            auVar74._0_4_ = fVar154 * fVar154 * fVar154 * auVar298._0_4_ * 0.5;
            auVar74._8_4_ = fVar228 * fVar228 * fVar228 * auVar298._8_4_ * 0.5;
            auVar74._12_4_ = fVar240 * fVar240 * fVar240 * auVar298._12_4_ * 0.5;
            auVar74._16_4_ = fVar242 * fVar242 * fVar242 * auVar298._16_4_ * 0.5;
            auVar74._20_4_ = fVar292 * fVar292 * fVar292 * auVar298._20_4_ * 0.5;
            auVar74._24_4_ = fVar294 * fVar294 * fVar294 * auVar298._24_4_ * 0.5;
            auVar74._28_4_ = auVar298._28_4_;
            auVar37 = vsubps_avx(auVar73,auVar74);
            fVar216 = auVar37._0_4_;
            fVar301 = auVar37._4_4_;
            fVar135 = auVar37._8_4_;
            fVar152 = auVar37._12_4_;
            fVar155 = auVar37._16_4_;
            fVar156 = auVar37._20_4_;
            fVar157 = auVar37._24_4_;
            fVar154 = auVar33._0_4_;
            fVar207 = auVar33._4_4_;
            fVar228 = auVar33._8_4_;
            fVar240 = auVar33._12_4_;
            fVar242 = auVar33._16_4_;
            fVar292 = auVar33._20_4_;
            fVar294 = auVar33._24_4_;
            auVar274._0_4_ = fVar154 * fVar154 + fVar183 * fVar183;
            auVar274._4_4_ = fVar207 * fVar207 + fVar210 * fVar210;
            auVar274._8_4_ = fVar228 * fVar228 + fVar277 * fVar277;
            auVar274._12_4_ = fVar240 * fVar240 + fVar212 * fVar212;
            auVar274._16_4_ = fVar242 * fVar242 + fVar280 * fVar280;
            auVar274._20_4_ = fVar292 * fVar292 + fVar214 * fVar214;
            auVar274._24_4_ = fVar294 * fVar294 + fVar282 * fVar282;
            auVar274._28_4_ = auVar23._28_4_ + auVar32._28_4_;
            auVar23 = vrsqrtps_avx(auVar274);
            fVar269 = auVar23._0_4_;
            fVar264 = auVar23._4_4_;
            auVar75._4_4_ = fVar264 * 1.5;
            auVar75._0_4_ = fVar269 * 1.5;
            fVar278 = auVar23._8_4_;
            auVar75._8_4_ = fVar278 * 1.5;
            fVar265 = auVar23._12_4_;
            auVar75._12_4_ = fVar265 * 1.5;
            fVar281 = auVar23._16_4_;
            auVar75._16_4_ = fVar281 * 1.5;
            fVar266 = auVar23._20_4_;
            auVar75._20_4_ = fVar266 * 1.5;
            fVar283 = auVar23._24_4_;
            auVar75._24_4_ = fVar283 * 1.5;
            auVar75._28_4_ = auVar313._28_4_;
            auVar76._4_4_ = fVar264 * fVar264 * fVar264 * auVar274._4_4_ * 0.5;
            auVar76._0_4_ = fVar269 * fVar269 * fVar269 * auVar274._0_4_ * 0.5;
            auVar76._8_4_ = fVar278 * fVar278 * fVar278 * auVar274._8_4_ * 0.5;
            auVar76._12_4_ = fVar265 * fVar265 * fVar265 * auVar274._12_4_ * 0.5;
            auVar76._16_4_ = fVar281 * fVar281 * fVar281 * auVar274._16_4_ * 0.5;
            auVar76._20_4_ = fVar266 * fVar266 * fVar266 * auVar274._20_4_ * 0.5;
            auVar76._24_4_ = fVar283 * fVar283 * fVar283 * auVar274._24_4_ * 0.5;
            auVar76._28_4_ = auVar274._28_4_;
            auVar33 = vsubps_avx(auVar75,auVar76);
            fVar269 = auVar33._0_4_;
            fVar264 = auVar33._4_4_;
            fVar278 = auVar33._8_4_;
            fVar265 = auVar33._12_4_;
            fVar281 = auVar33._16_4_;
            fVar266 = auVar33._20_4_;
            fVar283 = auVar33._24_4_;
            fVar137 = fVar136 * fVar216 * fVar137;
            fVar195 = fVar153 * fVar301 * fVar195;
            auVar77._4_4_ = fVar195;
            auVar77._0_4_ = fVar137;
            fVar217 = fStack_7b8 * fVar135 * fVar217;
            auVar77._8_4_ = fVar217;
            fVar235 = fStack_7b4 * fVar152 * fVar235;
            auVar77._12_4_ = fVar235;
            fVar241 = fStack_7b0 * fVar155 * fVar241;
            auVar77._16_4_ = fVar241;
            fVar291 = fStack_7ac * fVar156 * fVar291;
            auVar77._20_4_ = fVar291;
            fVar293 = fStack_7a8 * fVar157 * fVar293;
            auVar77._24_4_ = fVar293;
            auVar77._28_4_ = auVar23._28_4_;
            local_500._4_4_ = fVar195 + auVar288._4_4_;
            local_500._0_4_ = fVar137 + auVar288._0_4_;
            fStack_4f8 = fVar217 + auVar288._8_4_;
            fStack_4f4 = fVar235 + auVar288._12_4_;
            auStack_4f0._0_4_ = fVar241 + auVar288._16_4_;
            auStack_4f0._4_4_ = fVar291 + auVar288._20_4_;
            fStack_4e8 = fVar293 + auVar288._24_4_;
            fStack_4e4 = auVar23._28_4_ + auVar288._28_4_;
            fVar137 = fVar136 * fVar216 * -fVar234;
            fVar195 = fVar153 * fVar301 * -fVar194;
            auVar78._4_4_ = fVar195;
            auVar78._0_4_ = fVar137;
            fVar217 = fStack_7b8 * fVar135 * -fVar254;
            auVar78._8_4_ = fVar217;
            fVar235 = fStack_7b4 * fVar152 * -fVar172;
            auVar78._12_4_ = fVar235;
            fVar241 = fStack_7b0 * fVar155 * -fVar211;
            auVar78._16_4_ = fVar241;
            fVar291 = fStack_7ac * fVar156 * -fVar213;
            auVar78._20_4_ = fVar291;
            fVar293 = fStack_7a8 * fVar157 * -fVar215;
            auVar78._24_4_ = fVar293;
            auVar78._28_4_ = -fVar267;
            local_5c0._4_4_ = local_7a0._4_4_ + fVar195;
            local_5c0._0_4_ = local_7a0._0_4_ + fVar137;
            fStack_5b8 = local_7a0._8_4_ + fVar217;
            fStack_5b4 = local_7a0._12_4_ + fVar235;
            fStack_5b0 = local_7a0._16_4_ + fVar241;
            fStack_5ac = local_7a0._20_4_ + fVar291;
            fStack_5a8 = local_7a0._24_4_ + fVar293;
            fStack_5a4 = local_7a0._28_4_ + -fVar267;
            fVar137 = fVar216 * 0.0 * fVar136;
            fVar195 = fVar301 * 0.0 * fVar153;
            auVar79._4_4_ = fVar195;
            auVar79._0_4_ = fVar137;
            fVar217 = fVar135 * 0.0 * fStack_7b8;
            auVar79._8_4_ = fVar217;
            fVar235 = fVar152 * 0.0 * fStack_7b4;
            auVar79._12_4_ = fVar235;
            fVar241 = fVar155 * 0.0 * fStack_7b0;
            auVar79._16_4_ = fVar241;
            fVar291 = fVar156 * 0.0 * fStack_7ac;
            auVar79._20_4_ = fVar291;
            fVar293 = fVar157 * 0.0 * fStack_7a8;
            auVar79._24_4_ = fVar293;
            auVar79._28_4_ = fVar267;
            auVar200 = vsubps_avx(auVar288,auVar77);
            auVar339._0_4_ = fVar137 + auVar148._0_4_;
            auVar339._4_4_ = fVar195 + auVar148._4_4_;
            auVar339._8_4_ = fVar217 + auVar148._8_4_;
            auVar339._12_4_ = fVar235 + auVar148._12_4_;
            auVar339._16_4_ = fVar241 + auVar148._16_4_;
            auVar339._20_4_ = fVar291 + auVar148._20_4_;
            auVar339._24_4_ = fVar293 + auVar148._24_4_;
            auVar339._28_4_ = fVar267 + auVar148._28_4_;
            fVar137 = auVar319._0_4_ * fVar269 * fVar154;
            fVar154 = auVar319._4_4_ * fVar264 * fVar207;
            auVar80._4_4_ = fVar154;
            auVar80._0_4_ = fVar137;
            fVar195 = auVar319._8_4_ * fVar278 * fVar228;
            auVar80._8_4_ = fVar195;
            fVar207 = auVar319._12_4_ * fVar265 * fVar240;
            auVar80._12_4_ = fVar207;
            fVar217 = auVar319._16_4_ * fVar281 * fVar242;
            auVar80._16_4_ = fVar217;
            fVar228 = auVar319._20_4_ * fVar266 * fVar292;
            auVar80._20_4_ = fVar228;
            fVar235 = auVar319._24_4_ * fVar283 * fVar294;
            auVar80._24_4_ = fVar235;
            auVar80._28_4_ = fStack_7a4;
            auVar310 = vsubps_avx(local_7a0._0_32_,auVar78);
            auVar321._0_4_ = auVar338._0_4_ + fVar137;
            auVar321._4_4_ = auVar338._4_4_ + fVar154;
            auVar321._8_4_ = auVar338._8_4_ + fVar195;
            auVar321._12_4_ = auVar338._12_4_ + fVar207;
            auVar321._16_4_ = auVar338._16_4_ + fVar217;
            auVar321._20_4_ = auVar338._20_4_ + fVar228;
            auVar321._24_4_ = auVar338._24_4_ + fVar235;
            auVar321._28_4_ = auVar338._28_4_ + fStack_7a4;
            fVar137 = fVar269 * -fVar183 * auVar319._0_4_;
            fVar154 = fVar264 * -fVar210 * auVar319._4_4_;
            auVar81._4_4_ = fVar154;
            auVar81._0_4_ = fVar137;
            fVar195 = fVar278 * -fVar277 * auVar319._8_4_;
            auVar81._8_4_ = fVar195;
            fVar207 = fVar265 * -fVar212 * auVar319._12_4_;
            auVar81._12_4_ = fVar207;
            fVar217 = fVar281 * -fVar280 * auVar319._16_4_;
            auVar81._16_4_ = fVar217;
            fVar228 = fVar266 * -fVar214 * auVar319._20_4_;
            auVar81._20_4_ = fVar228;
            fVar235 = fVar283 * -fVar282 * auVar319._24_4_;
            auVar81._24_4_ = fVar235;
            auVar81._28_4_ = auVar288._28_4_;
            auVar34 = vsubps_avx(auVar148,auVar79);
            auVar226._0_4_ = (float)local_480._0_4_ + fVar137;
            auVar226._4_4_ = local_480._4_4_ + fVar154;
            auVar226._8_4_ = local_480._8_4_ + fVar195;
            auVar226._12_4_ = local_480._12_4_ + fVar207;
            auVar226._16_4_ = local_480._16_4_ + fVar217;
            auVar226._20_4_ = local_480._20_4_ + fVar228;
            auVar226._24_4_ = local_480._24_4_ + fVar235;
            auVar226._28_4_ = local_480._28_4_ + auVar288._28_4_;
            fVar137 = fVar269 * 0.0 * auVar319._0_4_;
            fVar154 = fVar264 * 0.0 * auVar319._4_4_;
            auVar82._4_4_ = fVar154;
            auVar82._0_4_ = fVar137;
            fVar195 = fVar278 * 0.0 * auVar319._8_4_;
            auVar82._8_4_ = fVar195;
            fVar207 = fVar265 * 0.0 * auVar319._12_4_;
            auVar82._12_4_ = fVar207;
            fVar217 = fVar281 * 0.0 * auVar319._16_4_;
            auVar82._16_4_ = fVar217;
            fVar228 = fVar266 * 0.0 * auVar319._20_4_;
            auVar82._20_4_ = fVar228;
            fVar235 = fVar283 * 0.0 * auVar319._24_4_;
            auVar82._24_4_ = fVar235;
            auVar82._28_4_ = auVar148._28_4_;
            auVar23 = vsubps_avx(auVar338,auVar80);
            auVar116._4_4_ = fStack_45c;
            auVar116._0_4_ = local_460;
            auVar116._8_4_ = fStack_458;
            auVar116._12_4_ = fStack_454;
            auVar116._16_4_ = fStack_450;
            auVar116._20_4_ = fStack_44c;
            auVar116._24_4_ = fStack_448;
            auVar116._28_4_ = fStack_444;
            auVar290._0_4_ = local_460 + fVar137;
            auVar290._4_4_ = fStack_45c + fVar154;
            auVar290._8_4_ = fStack_458 + fVar195;
            auVar290._12_4_ = fStack_454 + fVar207;
            auVar290._16_4_ = fStack_450 + fVar217;
            auVar290._20_4_ = fStack_44c + fVar228;
            auVar290._24_4_ = fStack_448 + fVar235;
            auVar290._28_4_ = fStack_444 + auVar148._28_4_;
            auVar32 = vsubps_avx(local_480,auVar81);
            auVar37 = vsubps_avx(auVar116,auVar82);
            auVar21 = vsubps_avx(auVar226,auVar310);
            auVar22 = vsubps_avx(auVar290,auVar34);
            auVar83._4_4_ = auVar34._4_4_ * auVar21._4_4_;
            auVar83._0_4_ = auVar34._0_4_ * auVar21._0_4_;
            auVar83._8_4_ = auVar34._8_4_ * auVar21._8_4_;
            auVar83._12_4_ = auVar34._12_4_ * auVar21._12_4_;
            auVar83._16_4_ = auVar34._16_4_ * auVar21._16_4_;
            auVar83._20_4_ = auVar34._20_4_ * auVar21._20_4_;
            auVar83._24_4_ = auVar34._24_4_ * auVar21._24_4_;
            auVar83._28_4_ = auVar313._28_4_;
            auVar84._4_4_ = auVar310._4_4_ * auVar22._4_4_;
            auVar84._0_4_ = auVar310._0_4_ * auVar22._0_4_;
            auVar84._8_4_ = auVar310._8_4_ * auVar22._8_4_;
            auVar84._12_4_ = auVar310._12_4_ * auVar22._12_4_;
            auVar84._16_4_ = auVar310._16_4_ * auVar22._16_4_;
            auVar84._20_4_ = auVar310._20_4_ * auVar22._20_4_;
            auVar84._24_4_ = auVar310._24_4_ * auVar22._24_4_;
            auVar84._28_4_ = local_480._28_4_;
            auVar201 = vsubps_avx(auVar84,auVar83);
            auVar85._4_4_ = auVar200._4_4_ * auVar22._4_4_;
            auVar85._0_4_ = auVar200._0_4_ * auVar22._0_4_;
            auVar85._8_4_ = auVar200._8_4_ * auVar22._8_4_;
            auVar85._12_4_ = auVar200._12_4_ * auVar22._12_4_;
            auVar85._16_4_ = auVar200._16_4_ * auVar22._16_4_;
            auVar85._20_4_ = auVar200._20_4_ * auVar22._20_4_;
            auVar85._24_4_ = auVar200._24_4_ * auVar22._24_4_;
            auVar85._28_4_ = auVar22._28_4_;
            auVar22 = vsubps_avx(auVar321,auVar200);
            auVar86._4_4_ = auVar34._4_4_ * auVar22._4_4_;
            auVar86._0_4_ = auVar34._0_4_ * auVar22._0_4_;
            auVar86._8_4_ = auVar34._8_4_ * auVar22._8_4_;
            auVar86._12_4_ = auVar34._12_4_ * auVar22._12_4_;
            auVar86._16_4_ = auVar34._16_4_ * auVar22._16_4_;
            auVar86._20_4_ = auVar34._20_4_ * auVar22._20_4_;
            auVar86._24_4_ = auVar34._24_4_ * auVar22._24_4_;
            auVar86._28_4_ = auVar33._28_4_;
            auVar273 = vsubps_avx(auVar86,auVar85);
            auVar87._4_4_ = auVar310._4_4_ * auVar22._4_4_;
            auVar87._0_4_ = auVar310._0_4_ * auVar22._0_4_;
            auVar87._8_4_ = auVar310._8_4_ * auVar22._8_4_;
            auVar87._12_4_ = auVar310._12_4_ * auVar22._12_4_;
            auVar87._16_4_ = auVar310._16_4_ * auVar22._16_4_;
            auVar87._20_4_ = auVar310._20_4_ * auVar22._20_4_;
            auVar87._24_4_ = auVar310._24_4_ * auVar22._24_4_;
            auVar87._28_4_ = auVar33._28_4_;
            auVar88._4_4_ = auVar200._4_4_ * auVar21._4_4_;
            auVar88._0_4_ = auVar200._0_4_ * auVar21._0_4_;
            auVar88._8_4_ = auVar200._8_4_ * auVar21._8_4_;
            auVar88._12_4_ = auVar200._12_4_ * auVar21._12_4_;
            auVar88._16_4_ = auVar200._16_4_ * auVar21._16_4_;
            auVar88._20_4_ = auVar200._20_4_ * auVar21._20_4_;
            auVar88._24_4_ = auVar200._24_4_ * auVar21._24_4_;
            auVar88._28_4_ = auVar21._28_4_;
            auVar33 = vsubps_avx(auVar88,auVar87);
            auVar168._0_4_ = auVar201._0_4_ * 0.0 + auVar33._0_4_ + auVar273._0_4_ * 0.0;
            auVar168._4_4_ = auVar201._4_4_ * 0.0 + auVar33._4_4_ + auVar273._4_4_ * 0.0;
            auVar168._8_4_ = auVar201._8_4_ * 0.0 + auVar33._8_4_ + auVar273._8_4_ * 0.0;
            auVar168._12_4_ = auVar201._12_4_ * 0.0 + auVar33._12_4_ + auVar273._12_4_ * 0.0;
            auVar168._16_4_ = auVar201._16_4_ * 0.0 + auVar33._16_4_ + auVar273._16_4_ * 0.0;
            auVar168._20_4_ = auVar201._20_4_ * 0.0 + auVar33._20_4_ + auVar273._20_4_ * 0.0;
            auVar168._24_4_ = auVar201._24_4_ * 0.0 + auVar33._24_4_ + auVar273._24_4_ * 0.0;
            auVar168._28_4_ = auVar201._28_4_ + auVar33._28_4_ + auVar273._28_4_;
            auVar285 = vcmpps_avx(auVar168,ZEXT832(0) << 0x20,2);
            auVar23 = vblendvps_avx(auVar23,_local_500,auVar285);
            auVar206 = ZEXT3264(auVar23);
            auVar33 = vblendvps_avx(auVar32,_local_5c0,auVar285);
            auVar32 = vblendvps_avx(auVar37,auVar339,auVar285);
            auVar37 = vblendvps_avx(auVar200,auVar321,auVar285);
            auVar21 = vblendvps_avx(auVar310,auVar226,auVar285);
            auVar22 = vblendvps_avx(auVar34,auVar290,auVar285);
            auVar200 = vblendvps_avx(auVar321,auVar200,auVar285);
            auVar201 = vblendvps_avx(auVar226,auVar310,auVar285);
            auVar273 = vblendvps_avx(auVar290,auVar34,auVar285);
            local_7a0._0_32_ = vandps_avx(auVar170,auVar193);
            auVar200 = vsubps_avx(auVar200,auVar23);
            auVar35 = vsubps_avx(auVar201,auVar33);
            auVar273 = vsubps_avx(auVar273,auVar32);
            auVar170 = vsubps_avx(auVar33,auVar21);
            fVar137 = auVar35._0_4_;
            fVar180 = auVar32._0_4_;
            fVar240 = auVar35._4_4_;
            fVar182 = auVar32._4_4_;
            auVar89._4_4_ = fVar182 * fVar240;
            auVar89._0_4_ = fVar180 * fVar137;
            fVar183 = auVar35._8_4_;
            fVar184 = auVar32._8_4_;
            auVar89._8_4_ = fVar184 * fVar183;
            fVar265 = auVar35._12_4_;
            fVar255 = auVar32._12_4_;
            auVar89._12_4_ = fVar255 * fVar265;
            fVar216 = auVar35._16_4_;
            fVar177 = auVar32._16_4_;
            auVar89._16_4_ = fVar177 * fVar216;
            fVar234 = auVar35._20_4_;
            fVar179 = auVar32._20_4_;
            auVar89._20_4_ = fVar179 * fVar234;
            fVar267 = auVar35._24_4_;
            fVar181 = auVar32._24_4_;
            auVar89._24_4_ = fVar181 * fVar267;
            auVar89._28_4_ = auVar201._28_4_;
            fVar154 = auVar33._0_4_;
            fVar218 = auVar273._0_4_;
            fVar241 = auVar33._4_4_;
            fVar229 = auVar273._4_4_;
            auVar90._4_4_ = fVar229 * fVar241;
            auVar90._0_4_ = fVar218 * fVar154;
            fVar269 = auVar33._8_4_;
            fVar231 = auVar273._8_4_;
            auVar90._8_4_ = fVar231 * fVar269;
            fVar280 = auVar33._12_4_;
            fVar233 = auVar273._12_4_;
            auVar90._12_4_ = fVar233 * fVar280;
            fVar301 = auVar33._16_4_;
            fVar243 = auVar273._16_4_;
            auVar90._16_4_ = fVar243 * fVar301;
            fVar194 = auVar33._20_4_;
            fVar251 = auVar273._20_4_;
            auVar90._20_4_ = fVar251 * fVar194;
            fVar134 = auVar33._24_4_;
            fVar252 = auVar273._24_4_;
            uVar12 = auVar310._28_4_;
            auVar90._24_4_ = fVar252 * fVar134;
            auVar90._28_4_ = uVar12;
            auVar201 = vsubps_avx(auVar90,auVar89);
            fVar195 = auVar23._0_4_;
            fVar242 = auVar23._4_4_;
            auVar91._4_4_ = fVar229 * fVar242;
            auVar91._0_4_ = fVar218 * fVar195;
            fVar210 = auVar23._8_4_;
            auVar91._8_4_ = fVar231 * fVar210;
            fVar281 = auVar23._12_4_;
            auVar91._12_4_ = fVar233 * fVar281;
            fVar135 = auVar23._16_4_;
            auVar91._16_4_ = fVar243 * fVar135;
            fVar254 = auVar23._20_4_;
            auVar91._20_4_ = fVar251 * fVar254;
            fVar151 = auVar23._24_4_;
            auVar91._24_4_ = fVar252 * fVar151;
            auVar91._28_4_ = uVar12;
            fVar207 = auVar200._0_4_;
            fVar291 = auVar200._4_4_;
            auVar92._4_4_ = fVar182 * fVar291;
            auVar92._0_4_ = fVar180 * fVar207;
            fVar264 = auVar200._8_4_;
            auVar92._8_4_ = fVar184 * fVar264;
            fVar214 = auVar200._12_4_;
            auVar92._12_4_ = fVar255 * fVar214;
            fVar152 = auVar200._16_4_;
            auVar92._16_4_ = fVar177 * fVar152;
            fVar172 = auVar200._20_4_;
            auVar92._20_4_ = fVar179 * fVar172;
            fVar158 = auVar200._24_4_;
            auVar92._24_4_ = fVar181 * fVar158;
            auVar92._28_4_ = auVar321._28_4_;
            auVar310 = vsubps_avx(auVar92,auVar91);
            auVar93._4_4_ = fVar241 * fVar291;
            auVar93._0_4_ = fVar154 * fVar207;
            auVar93._8_4_ = fVar269 * fVar264;
            auVar93._12_4_ = fVar280 * fVar214;
            auVar93._16_4_ = fVar301 * fVar152;
            auVar93._20_4_ = fVar194 * fVar172;
            auVar93._24_4_ = fVar134 * fVar158;
            auVar93._28_4_ = uVar12;
            auVar94._4_4_ = fVar242 * fVar240;
            auVar94._0_4_ = fVar195 * fVar137;
            auVar94._8_4_ = fVar210 * fVar183;
            auVar94._12_4_ = fVar281 * fVar265;
            auVar94._16_4_ = fVar135 * fVar216;
            auVar94._20_4_ = fVar254 * fVar234;
            auVar94._24_4_ = fVar151 * fVar267;
            auVar94._28_4_ = auVar34._28_4_;
            auVar34 = vsubps_avx(auVar94,auVar93);
            auVar36 = vsubps_avx(auVar32,auVar22);
            fVar228 = auVar34._28_4_ + auVar310._28_4_;
            auVar299._0_4_ = auVar34._0_4_ + auVar310._0_4_ * 0.0 + auVar201._0_4_ * 0.0;
            auVar299._4_4_ = auVar34._4_4_ + auVar310._4_4_ * 0.0 + auVar201._4_4_ * 0.0;
            auVar299._8_4_ = auVar34._8_4_ + auVar310._8_4_ * 0.0 + auVar201._8_4_ * 0.0;
            auVar299._12_4_ = auVar34._12_4_ + auVar310._12_4_ * 0.0 + auVar201._12_4_ * 0.0;
            auVar299._16_4_ = auVar34._16_4_ + auVar310._16_4_ * 0.0 + auVar201._16_4_ * 0.0;
            auVar299._20_4_ = auVar34._20_4_ + auVar310._20_4_ * 0.0 + auVar201._20_4_ * 0.0;
            auVar299._24_4_ = auVar34._24_4_ + auVar310._24_4_ * 0.0 + auVar201._24_4_ * 0.0;
            auVar299._28_4_ = fVar228 + auVar201._28_4_;
            fVar217 = auVar170._0_4_;
            fVar292 = auVar170._4_4_;
            auVar95._4_4_ = auVar22._4_4_ * fVar292;
            auVar95._0_4_ = auVar22._0_4_ * fVar217;
            fVar277 = auVar170._8_4_;
            auVar95._8_4_ = auVar22._8_4_ * fVar277;
            fVar266 = auVar170._12_4_;
            auVar95._12_4_ = auVar22._12_4_ * fVar266;
            fVar155 = auVar170._16_4_;
            auVar95._16_4_ = auVar22._16_4_ * fVar155;
            fVar211 = auVar170._20_4_;
            auVar95._20_4_ = auVar22._20_4_ * fVar211;
            fVar174 = auVar170._24_4_;
            auVar95._24_4_ = auVar22._24_4_ * fVar174;
            auVar95._28_4_ = fVar228;
            fVar228 = auVar36._0_4_;
            fVar293 = auVar36._4_4_;
            auVar96._4_4_ = auVar21._4_4_ * fVar293;
            auVar96._0_4_ = auVar21._0_4_ * fVar228;
            fVar278 = auVar36._8_4_;
            auVar96._8_4_ = auVar21._8_4_ * fVar278;
            fVar282 = auVar36._12_4_;
            auVar96._12_4_ = auVar21._12_4_ * fVar282;
            fVar156 = auVar36._16_4_;
            auVar96._16_4_ = auVar21._16_4_ * fVar156;
            fVar213 = auVar36._20_4_;
            auVar96._20_4_ = auVar21._20_4_ * fVar213;
            fVar176 = auVar36._24_4_;
            auVar96._24_4_ = auVar21._24_4_ * fVar176;
            auVar96._28_4_ = auVar34._28_4_;
            auVar170 = vsubps_avx(auVar96,auVar95);
            auVar310 = vsubps_avx(auVar23,auVar37);
            fVar235 = auVar310._0_4_;
            fVar294 = auVar310._4_4_;
            auVar97._4_4_ = auVar22._4_4_ * fVar294;
            auVar97._0_4_ = auVar22._0_4_ * fVar235;
            fVar212 = auVar310._8_4_;
            auVar97._8_4_ = auVar22._8_4_ * fVar212;
            fVar283 = auVar310._12_4_;
            auVar97._12_4_ = auVar22._12_4_ * fVar283;
            fVar157 = auVar310._16_4_;
            auVar97._16_4_ = auVar22._16_4_ * fVar157;
            fVar215 = auVar310._20_4_;
            auVar97._20_4_ = auVar22._20_4_ * fVar215;
            fVar178 = auVar310._24_4_;
            auVar97._24_4_ = auVar22._24_4_ * fVar178;
            auVar97._28_4_ = auVar22._28_4_;
            auVar98._4_4_ = fVar293 * auVar37._4_4_;
            auVar98._0_4_ = fVar228 * auVar37._0_4_;
            auVar98._8_4_ = fVar278 * auVar37._8_4_;
            auVar98._12_4_ = fVar282 * auVar37._12_4_;
            auVar98._16_4_ = fVar156 * auVar37._16_4_;
            auVar98._20_4_ = fVar213 * auVar37._20_4_;
            auVar98._24_4_ = fVar176 * auVar37._24_4_;
            auVar98._28_4_ = auVar201._28_4_;
            auVar22 = vsubps_avx(auVar97,auVar98);
            auVar99._4_4_ = auVar21._4_4_ * fVar294;
            auVar99._0_4_ = auVar21._0_4_ * fVar235;
            auVar99._8_4_ = auVar21._8_4_ * fVar212;
            auVar99._12_4_ = auVar21._12_4_ * fVar283;
            auVar99._16_4_ = auVar21._16_4_ * fVar157;
            auVar99._20_4_ = auVar21._20_4_ * fVar215;
            auVar99._24_4_ = auVar21._24_4_ * fVar178;
            auVar99._28_4_ = auVar21._28_4_;
            auVar100._4_4_ = fVar292 * auVar37._4_4_;
            auVar100._0_4_ = fVar217 * auVar37._0_4_;
            auVar100._8_4_ = fVar277 * auVar37._8_4_;
            auVar100._12_4_ = fVar266 * auVar37._12_4_;
            auVar100._16_4_ = fVar155 * auVar37._16_4_;
            auVar100._20_4_ = fVar211 * auVar37._20_4_;
            auVar100._24_4_ = fVar174 * auVar37._24_4_;
            auVar100._28_4_ = auVar37._28_4_;
            auVar37 = vsubps_avx(auVar100,auVar99);
            auVar149._0_4_ = auVar170._0_4_ * 0.0 + auVar37._0_4_ + auVar22._0_4_ * 0.0;
            auVar149._4_4_ = auVar170._4_4_ * 0.0 + auVar37._4_4_ + auVar22._4_4_ * 0.0;
            auVar149._8_4_ = auVar170._8_4_ * 0.0 + auVar37._8_4_ + auVar22._8_4_ * 0.0;
            auVar149._12_4_ = auVar170._12_4_ * 0.0 + auVar37._12_4_ + auVar22._12_4_ * 0.0;
            auVar149._16_4_ = auVar170._16_4_ * 0.0 + auVar37._16_4_ + auVar22._16_4_ * 0.0;
            auVar149._20_4_ = auVar170._20_4_ * 0.0 + auVar37._20_4_ + auVar22._20_4_ * 0.0;
            auVar149._24_4_ = auVar170._24_4_ * 0.0 + auVar37._24_4_ + auVar22._24_4_ * 0.0;
            auVar149._28_4_ = auVar22._28_4_ + auVar37._28_4_ + auVar22._28_4_;
            auVar150 = ZEXT3264(auVar149);
            auVar170 = vmaxps_avx(auVar299,auVar149);
            auVar170 = vcmpps_avx(auVar170,ZEXT432(0) << 0x20,2);
            auVar37 = local_7a0._0_32_ & auVar170;
            if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar37 >> 0x7f,0) == '\0') &&
                  (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar37 >> 0xbf,0) == '\0') &&
                (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar37[0x1f]) {
LAB_00f75e9e:
              auVar171 = ZEXT3264(CONCAT824(uStack_488,
                                            CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
            }
            else {
              auVar37 = vandps_avx(auVar170,local_7a0._0_32_);
              auVar101._4_4_ = fVar293 * fVar240;
              auVar101._0_4_ = fVar228 * fVar137;
              auVar101._8_4_ = fVar278 * fVar183;
              auVar101._12_4_ = fVar282 * fVar265;
              auVar101._16_4_ = fVar156 * fVar216;
              auVar101._20_4_ = fVar213 * fVar234;
              auVar101._24_4_ = fVar176 * fVar267;
              auVar101._28_4_ = local_7a0._28_4_;
              auVar102._4_4_ = fVar292 * fVar229;
              auVar102._0_4_ = fVar217 * fVar218;
              auVar102._8_4_ = fVar277 * fVar231;
              auVar102._12_4_ = fVar266 * fVar233;
              auVar102._16_4_ = fVar155 * fVar243;
              auVar102._20_4_ = fVar211 * fVar251;
              auVar102._24_4_ = fVar174 * fVar252;
              auVar102._28_4_ = auVar170._28_4_;
              auVar21 = vsubps_avx(auVar102,auVar101);
              auVar103._4_4_ = fVar294 * fVar229;
              auVar103._0_4_ = fVar235 * fVar218;
              auVar103._8_4_ = fVar212 * fVar231;
              auVar103._12_4_ = fVar283 * fVar233;
              auVar103._16_4_ = fVar157 * fVar243;
              auVar103._20_4_ = fVar215 * fVar251;
              auVar103._24_4_ = fVar178 * fVar252;
              auVar103._28_4_ = auVar273._28_4_;
              auVar104._4_4_ = fVar293 * fVar291;
              auVar104._0_4_ = fVar228 * fVar207;
              auVar104._8_4_ = fVar278 * fVar264;
              auVar104._12_4_ = fVar282 * fVar214;
              auVar104._16_4_ = fVar156 * fVar152;
              auVar104._20_4_ = fVar213 * fVar172;
              auVar104._24_4_ = fVar176 * fVar158;
              auVar104._28_4_ = auVar36._28_4_;
              auVar22 = vsubps_avx(auVar104,auVar103);
              auVar105._4_4_ = fVar292 * fVar291;
              auVar105._0_4_ = fVar217 * fVar207;
              auVar105._8_4_ = fVar277 * fVar264;
              auVar105._12_4_ = fVar266 * fVar214;
              auVar105._16_4_ = fVar155 * fVar152;
              auVar105._20_4_ = fVar211 * fVar172;
              auVar105._24_4_ = fVar174 * fVar158;
              auVar105._28_4_ = auVar200._28_4_;
              auVar106._4_4_ = fVar294 * fVar240;
              auVar106._0_4_ = fVar235 * fVar137;
              auVar106._8_4_ = fVar212 * fVar183;
              auVar106._12_4_ = fVar283 * fVar265;
              auVar106._16_4_ = fVar157 * fVar216;
              auVar106._20_4_ = fVar215 * fVar234;
              auVar106._24_4_ = fVar178 * fVar267;
              auVar106._28_4_ = auVar35._28_4_;
              auVar201 = vsubps_avx(auVar106,auVar105);
              auVar169._0_4_ = auVar21._0_4_ * 0.0 + auVar201._0_4_ + auVar22._0_4_ * 0.0;
              auVar169._4_4_ = auVar21._4_4_ * 0.0 + auVar201._4_4_ + auVar22._4_4_ * 0.0;
              auVar169._8_4_ = auVar21._8_4_ * 0.0 + auVar201._8_4_ + auVar22._8_4_ * 0.0;
              auVar169._12_4_ = auVar21._12_4_ * 0.0 + auVar201._12_4_ + auVar22._12_4_ * 0.0;
              auVar169._16_4_ = auVar21._16_4_ * 0.0 + auVar201._16_4_ + auVar22._16_4_ * 0.0;
              auVar169._20_4_ = auVar21._20_4_ * 0.0 + auVar201._20_4_ + auVar22._20_4_ * 0.0;
              auVar169._24_4_ = auVar21._24_4_ * 0.0 + auVar201._24_4_ + auVar22._24_4_ * 0.0;
              auVar169._28_4_ = auVar35._28_4_ + auVar201._28_4_ + auVar200._28_4_;
              auVar170 = vrcpps_avx(auVar169);
              fVar207 = auVar170._0_4_;
              fVar217 = auVar170._4_4_;
              auVar107._4_4_ = auVar169._4_4_ * fVar217;
              auVar107._0_4_ = auVar169._0_4_ * fVar207;
              fVar228 = auVar170._8_4_;
              auVar107._8_4_ = auVar169._8_4_ * fVar228;
              fVar235 = auVar170._12_4_;
              auVar107._12_4_ = auVar169._12_4_ * fVar235;
              fVar240 = auVar170._16_4_;
              auVar107._16_4_ = auVar169._16_4_ * fVar240;
              fVar291 = auVar170._20_4_;
              auVar107._20_4_ = auVar169._20_4_ * fVar291;
              fVar292 = auVar170._24_4_;
              auVar107._24_4_ = auVar169._24_4_ * fVar292;
              auVar107._28_4_ = auVar36._28_4_;
              auVar314._8_4_ = 0x3f800000;
              auVar314._0_8_ = 0x3f8000003f800000;
              auVar314._12_4_ = 0x3f800000;
              auVar314._16_4_ = 0x3f800000;
              auVar314._20_4_ = 0x3f800000;
              auVar314._24_4_ = 0x3f800000;
              auVar314._28_4_ = 0x3f800000;
              auVar170 = vsubps_avx(auVar314,auVar107);
              fVar207 = auVar170._0_4_ * fVar207 + fVar207;
              fVar217 = auVar170._4_4_ * fVar217 + fVar217;
              fVar228 = auVar170._8_4_ * fVar228 + fVar228;
              fVar235 = auVar170._12_4_ * fVar235 + fVar235;
              fVar240 = auVar170._16_4_ * fVar240 + fVar240;
              fVar291 = auVar170._20_4_ * fVar291 + fVar291;
              fVar292 = auVar170._24_4_ * fVar292 + fVar292;
              auVar108._4_4_ =
                   (fVar242 * auVar21._4_4_ + auVar22._4_4_ * fVar241 + auVar201._4_4_ * fVar182) *
                   fVar217;
              auVar108._0_4_ =
                   (fVar195 * auVar21._0_4_ + auVar22._0_4_ * fVar154 + auVar201._0_4_ * fVar180) *
                   fVar207;
              auVar108._8_4_ =
                   (fVar210 * auVar21._8_4_ + auVar22._8_4_ * fVar269 + auVar201._8_4_ * fVar184) *
                   fVar228;
              auVar108._12_4_ =
                   (fVar281 * auVar21._12_4_ + auVar22._12_4_ * fVar280 + auVar201._12_4_ * fVar255)
                   * fVar235;
              auVar108._16_4_ =
                   (fVar135 * auVar21._16_4_ + auVar22._16_4_ * fVar301 + auVar201._16_4_ * fVar177)
                   * fVar240;
              auVar108._20_4_ =
                   (fVar254 * auVar21._20_4_ + auVar22._20_4_ * fVar194 + auVar201._20_4_ * fVar179)
                   * fVar291;
              auVar108._24_4_ =
                   (fVar151 * auVar21._24_4_ + auVar22._24_4_ * fVar134 + auVar201._24_4_ * fVar181)
                   * fVar292;
              auVar108._28_4_ = auVar23._28_4_ + auVar33._28_4_ + auVar32._28_4_;
              auVar206 = ZEXT3264(auVar108);
              fVar137 = ray->tfar;
              auVar227._4_4_ = fVar137;
              auVar227._0_4_ = fVar137;
              auVar227._8_4_ = fVar137;
              auVar227._12_4_ = fVar137;
              auVar227._16_4_ = fVar137;
              auVar227._20_4_ = fVar137;
              auVar227._24_4_ = fVar137;
              auVar227._28_4_ = fVar137;
              auVar170 = vcmpps_avx(_local_360,auVar108,2);
              auVar23 = vcmpps_avx(auVar108,auVar227,2);
              auVar170 = vandps_avx(auVar170,auVar23);
              auVar33 = auVar37 & auVar170;
              if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar33 >> 0x7f,0) == '\0') &&
                    (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar33 >> 0xbf,0) == '\0') &&
                  (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar33[0x1f]) goto LAB_00f75e9e;
              auVar170 = vandps_avx(auVar37,auVar170);
              auVar33 = vcmpps_avx(ZEXT432(0) << 0x20,auVar169,4);
              auVar32 = auVar170 & auVar33;
              auVar171 = ZEXT3264(CONCAT824(uStack_488,
                                            CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
              if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar32 >> 0x7f,0) != '\0') ||
                    (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar32 >> 0xbf,0) != '\0') ||
                  (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar32[0x1f] < '\0') {
                auVar170 = vandps_avx(auVar33,auVar170);
                auVar171 = ZEXT3264(auVar170);
                auVar109._4_4_ = fVar217 * auVar299._4_4_;
                auVar109._0_4_ = fVar207 * auVar299._0_4_;
                auVar109._8_4_ = fVar228 * auVar299._8_4_;
                auVar109._12_4_ = fVar235 * auVar299._12_4_;
                auVar109._16_4_ = fVar240 * auVar299._16_4_;
                auVar109._20_4_ = fVar291 * auVar299._20_4_;
                auVar109._24_4_ = fVar292 * auVar299._24_4_;
                auVar109._28_4_ = auVar23._28_4_;
                auVar110._4_4_ = auVar149._4_4_ * fVar217;
                auVar110._0_4_ = auVar149._0_4_ * fVar207;
                auVar110._8_4_ = auVar149._8_4_ * fVar228;
                auVar110._12_4_ = auVar149._12_4_ * fVar235;
                auVar110._16_4_ = auVar149._16_4_ * fVar240;
                auVar110._20_4_ = auVar149._20_4_ * fVar291;
                auVar110._24_4_ = auVar149._24_4_ * fVar292;
                auVar110._28_4_ = auVar149._28_4_;
                auVar250._8_4_ = 0x3f800000;
                auVar250._0_8_ = 0x3f8000003f800000;
                auVar250._12_4_ = 0x3f800000;
                auVar250._16_4_ = 0x3f800000;
                auVar250._20_4_ = 0x3f800000;
                auVar250._24_4_ = 0x3f800000;
                auVar250._28_4_ = 0x3f800000;
                auVar170 = vsubps_avx(auVar250,auVar109);
                local_140 = vblendvps_avx(auVar170,auVar109,auVar285);
                auVar170 = vsubps_avx(auVar250,auVar110);
                _local_3c0 = vblendvps_avx(auVar170,auVar110,auVar285);
                auVar150 = ZEXT3264(_local_3c0);
                local_160 = auVar108;
              }
            }
            auVar322 = ZEXT3264(local_740);
            auVar170 = auVar171._0_32_;
            auVar113._4_4_ = fVar153;
            auVar113._0_4_ = fVar136;
            auVar113._8_4_ = fStack_7b8;
            auVar113._12_4_ = fStack_7b4;
            auVar113._16_4_ = fStack_7b0;
            auVar113._20_4_ = fStack_7ac;
            auVar113._24_4_ = fStack_7a8;
            auVar113._28_4_ = fStack_7a4;
            if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar170 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar170 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar170 >> 0x7f,0) == '\0') &&
                  (auVar171 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar170 >> 0xbf,0) == '\0') &&
                (auVar171 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar171[0x1f]) {
              auVar263 = ZEXT3264(_local_760);
            }
            else {
              auVar23 = vsubps_avx(auVar319,auVar113);
              auVar206 = ZEXT3264(local_140);
              fVar136 = fVar136 + auVar23._0_4_ * local_140._0_4_;
              fVar153 = fVar153 + auVar23._4_4_ * local_140._4_4_;
              fVar154 = fStack_7b8 + auVar23._8_4_ * local_140._8_4_;
              fVar195 = fStack_7b4 + auVar23._12_4_ * local_140._12_4_;
              fVar207 = fStack_7b0 + auVar23._16_4_ * local_140._16_4_;
              fVar217 = fStack_7ac + auVar23._20_4_ * local_140._20_4_;
              fVar228 = fStack_7a8 + auVar23._24_4_ * local_140._24_4_;
              fVar235 = fStack_7a4 + auVar23._28_4_;
              fVar137 = local_768->depth_scale;
              auVar111._4_4_ = (fVar153 + fVar153) * fVar137;
              auVar111._0_4_ = (fVar136 + fVar136) * fVar137;
              auVar111._8_4_ = (fVar154 + fVar154) * fVar137;
              auVar111._12_4_ = (fVar195 + fVar195) * fVar137;
              auVar111._16_4_ = (fVar207 + fVar207) * fVar137;
              auVar111._20_4_ = (fVar217 + fVar217) * fVar137;
              auVar111._24_4_ = (fVar228 + fVar228) * fVar137;
              auVar111._28_4_ = fVar235 + fVar235;
              auVar23 = vcmpps_avx(local_160,auVar111,6);
              auVar150 = ZEXT3264(auVar23);
              auVar33 = auVar170 & auVar23;
              auVar263 = ZEXT3264(_local_760);
              if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar33 >> 0x7f,0) != '\0') ||
                    (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar33 >> 0xbf,0) != '\0') ||
                  (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar33[0x1f] < '\0') {
                local_1e0 = vandps_avx(auVar23,auVar170);
                auVar150 = ZEXT3264(local_1e0);
                local_1a0._0_4_ = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
                local_1a0._4_4_ = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
                local_1a0._8_4_ = fStack_3b8 + fStack_3b8 + -1.0;
                local_1a0._12_4_ = fStack_3b4 + fStack_3b4 + -1.0;
                auVar164._16_4_ = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
                auVar164._0_16_ = local_1a0._0_16_;
                auVar164._20_4_ = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
                fStack_268 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
                _local_280 = auVar164;
                fStack_264 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
                auVar171 = ZEXT3264(_local_280);
                local_2a0 = local_140;
                local_260 = local_160;
                local_23c = uVar128;
                local_230 = local_650;
                uStack_228 = uStack_648;
                local_220 = local_580;
                uStack_218 = uStack_578;
                local_210 = local_590;
                uStack_208 = uStack_588;
                local_200 = _local_570;
                local_6a0 = (undefined1  [8])(context->scene->geometries).items[local_770].ptr;
                _local_3c0 = _local_280;
                auVar170 = _local_3c0;
                if ((((Geometry *)local_6a0)->mask & ray->mask) == 0) {
                  pRVar127 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar127 = context->args;
                  if ((pRVar127->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar127 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar127 >> 8),1),
                     ((Geometry *)local_6a0)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auStack_698 = auVar299._8_24_;
                    auVar163._0_4_ = (float)(int)local_240;
                    auVar163._4_8_ = SUB128(ZEXT812(0),4);
                    auVar163._12_4_ = 0;
                    auVar343 = vshufps_avx(auVar163,auVar163,0);
                    local_1c0[0] = (auVar343._0_4_ + local_140._0_4_ + 0.0) * (float)local_380._0_4_
                    ;
                    local_1c0[1] = (auVar343._4_4_ + local_140._4_4_ + 1.0) * (float)local_380._4_4_
                    ;
                    local_1c0[2] = (auVar343._8_4_ + local_140._8_4_ + 2.0) * fStack_378;
                    local_1c0[3] = (auVar343._12_4_ + local_140._12_4_ + 3.0) * fStack_374;
                    fStack_1b0 = (auVar343._0_4_ + local_140._16_4_ + 4.0) * fStack_370;
                    fStack_1ac = (auVar343._4_4_ + local_140._20_4_ + 5.0) * fStack_36c;
                    fStack_1a8 = (auVar343._8_4_ + local_140._24_4_ + 6.0) * fStack_368;
                    fStack_1a4 = auVar343._12_4_ + (float)local_140._28_4_ + 7.0;
                    uStack_3b0 = auVar164._16_8_;
                    uStack_3a8 = local_280._24_8_;
                    local_1a0._16_8_ = uStack_3b0;
                    local_1a0._24_8_ = uStack_3a8;
                    auVar171 = ZEXT3264(local_160);
                    local_180 = local_160;
                    iVar125 = vmovmskps_avx(local_1e0);
                    uVar130 = CONCAT44((int)((ulong)pRVar127 >> 0x20),iVar125);
                    lVar17 = 0;
                    if (uVar130 != 0) {
                      for (; (uVar130 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                      }
                    }
                    local_7c0 = (uint)lVar17;
                    uStack_7bc = (undefined4)((ulong)lVar17 >> 0x20);
                    local_7a0._0_8_ = uVar130;
                    _local_3c0 = auVar170;
                    if (iVar125 == 0) {
                      pRVar127 = (RTCIntersectArguments *)0x0;
LAB_00f75ebb:
                      auVar322 = ZEXT3264(local_740);
                      auVar263 = ZEXT3264(_local_760);
                      fVar268 = (float)local_700._0_4_;
                      fVar275 = (float)local_700._4_4_;
                      fVar276 = fStack_6f8;
                      fVar279 = fStack_6f4;
                      fVar173 = fStack_6f0;
                      fVar175 = fStack_6ec;
                      fVar208 = fStack_6e8;
                      fVar304 = (float)local_720._0_4_;
                      fVar306 = (float)local_720._4_4_;
                      fVar307 = fStack_718;
                      fVar308 = fStack_714;
                      fVar209 = fStack_710;
                      fVar230 = fStack_70c;
                      fVar232 = fStack_708;
                    }
                    else {
                      local_480._0_4_ = ray->tfar;
                      auVar132 = local_6a0;
                      do {
                        lVar17 = CONCAT44(uStack_7bc,local_7c0);
                        local_634 = local_1c0[lVar17];
                        auVar150 = ZEXT464((uint)local_634);
                        local_630 = *(uint *)(local_1a0 + lVar17 * 4);
                        auVar171 = ZEXT464(local_630);
                        ray->tfar = *(float *)(local_180 + lVar17 * 4);
                        local_6d0.context = context->user;
                        fVar154 = 1.0 - local_634;
                        fVar137 = local_634 * fVar154 + local_634 * fVar154;
                        auVar343 = ZEXT416((uint)(local_634 * local_634 * 3.0));
                        auVar343 = vshufps_avx(auVar343,auVar343,0);
                        auVar190 = ZEXT416((uint)((fVar137 - local_634 * local_634) * 3.0));
                        auVar190 = vshufps_avx(auVar190,auVar190,0);
                        auVar223 = ZEXT416((uint)((fVar154 * fVar154 - fVar137) * 3.0));
                        auVar223 = vshufps_avx(auVar223,auVar223,0);
                        auVar198 = ZEXT416((uint)(fVar154 * fVar154 * -3.0));
                        auVar198 = vshufps_avx(auVar198,auVar198,0);
                        auVar199._0_4_ = auVar198._0_4_ * (float)local_650._0_4_;
                        auVar199._4_4_ = auVar198._4_4_ * (float)local_650._4_4_;
                        auVar199._8_4_ = auVar198._8_4_ * (float)uStack_648;
                        auVar199._12_4_ = auVar198._12_4_ * uStack_648._4_4_;
                        auVar206 = ZEXT1664(auVar199);
                        auVar191._0_4_ =
                             auVar199._0_4_ +
                             auVar223._0_4_ * (float)local_580._0_4_ +
                             auVar343._0_4_ * (float)local_570._0_4_ +
                             auVar190._0_4_ * (float)local_590._0_4_;
                        auVar191._4_4_ =
                             auVar199._4_4_ +
                             auVar223._4_4_ * (float)local_580._4_4_ +
                             auVar343._4_4_ * (float)local_570._4_4_ +
                             auVar190._4_4_ * (float)local_590._4_4_;
                        auVar191._8_4_ =
                             auVar199._8_4_ +
                             auVar223._8_4_ * (float)uStack_578 +
                             auVar343._8_4_ * fStack_568 + auVar190._8_4_ * (float)uStack_588;
                        auVar191._12_4_ =
                             auVar199._12_4_ +
                             auVar223._12_4_ * uStack_578._4_4_ +
                             auVar343._12_4_ * fStack_564 + auVar190._12_4_ * uStack_588._4_4_;
                        local_640 = vmovlps_avx(auVar191);
                        local_638 = vextractps_avx(auVar191,2);
                        local_62c = (int)local_608;
                        local_628 = (int)local_770;
                        local_624 = (local_6d0.context)->instID[0];
                        local_620 = (local_6d0.context)->instPrimID[0];
                        local_7cc = -1;
                        local_6d0.valid = &local_7cc;
                        local_6d0.geometryUserPtr = ((Geometry *)auVar132)->userPtr;
                        local_6d0.ray = (RTCRayN *)ray;
                        local_6d0.hit = (RTCHitN *)&local_640;
                        local_6d0.N = 1;
                        if (((Geometry *)auVar132)->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f75db5:
                          p_Var19 = context->args->filter;
                          if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)((long)local_6a0 + 0x3e) & 0x40) != 0)))) {
                            auVar206 = ZEXT1664(auVar206._0_16_);
                            auVar343 = (*p_Var19)(&local_6d0);
                            auVar171._0_8_ = auVar343._8_8_;
                            auVar150._0_8_ = auVar343._0_8_;
                            auVar171._8_56_ = extraout_var_04;
                            auVar150._8_56_ = extraout_var_00;
                            if (*local_6d0.valid == 0) goto LAB_00f75dff;
                          }
                          pRVar127 = (RTCIntersectArguments *)0x1;
                          goto LAB_00f75ebb;
                        }
                        auVar206 = ZEXT1664(auVar199);
                        auVar343 = (*((Geometry *)auVar132)->occlusionFilterN)(&local_6d0);
                        auVar171._0_8_ = auVar343._8_8_;
                        auVar150._0_8_ = auVar343._0_8_;
                        auVar171._8_56_ = extraout_var_03;
                        auVar150._8_56_ = extraout_var;
                        if (*local_6d0.valid != 0) goto LAB_00f75db5;
LAB_00f75dff:
                        auVar150 = ZEXT464((uint)local_480._0_4_);
                        ray->tfar = (float)local_480._0_4_;
                        uVar130 = local_7a0._0_8_ ^ 1L << ((ulong)local_7c0 & 0x3f);
                        lVar17 = 0;
                        if (uVar130 != 0) {
                          for (; (uVar130 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                          }
                        }
                        local_7c0 = (uint)lVar17;
                        uStack_7bc = (undefined4)((ulong)lVar17 >> 0x20);
                        pRVar127 = (RTCIntersectArguments *)0x0;
                        local_7a0._0_8_ = uVar130;
                        auVar322 = ZEXT3264(local_740);
                        auVar263 = ZEXT3264(_local_760);
                        auVar132 = local_6a0;
                        fVar268 = (float)local_700._0_4_;
                        fVar275 = (float)local_700._4_4_;
                        fVar276 = fStack_6f8;
                        fVar279 = fStack_6f4;
                        fVar173 = fStack_6f0;
                        fVar175 = fStack_6ec;
                        fVar208 = fStack_6e8;
                        fVar304 = (float)local_720._0_4_;
                        fVar306 = (float)local_720._4_4_;
                        fVar307 = fStack_718;
                        fVar308 = fStack_714;
                        fVar209 = fStack_710;
                        fVar230 = fStack_70c;
                        fVar232 = fStack_708;
                      } while (uVar130 != 0);
                    }
                  }
                }
                bVar133 = (bool)(bVar133 | (byte)pRVar127);
              }
            }
          }
          lVar131 = lVar131 + 8;
        } while ((int)lVar131 < (int)uVar128);
      }
      if (bVar133 != false) {
        return bVar133;
      }
      fVar137 = ray->tfar;
      auVar142._4_4_ = fVar137;
      auVar142._0_4_ = fVar137;
      auVar142._8_4_ = fVar137;
      auVar142._12_4_ = fVar137;
      auVar343 = vcmpps_avx(local_2b0,auVar142,2);
      uVar128 = vmovmskps_avx(auVar343);
      uVar124 = uVar124 & uVar124 + 0xf & uVar128;
    } while (uVar124 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }